

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  uint uVar20;
  undefined4 uVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  long lVar25;
  RTCFilterFunctionN p_Var26;
  uint uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [28];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [24];
  uint uVar141;
  uint uVar142;
  uint uVar143;
  ulong uVar144;
  long lVar145;
  long lVar146;
  uint uVar147;
  undefined1 auVar148 [8];
  long lVar149;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar150;
  float fVar170;
  float fVar172;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar178;
  float fVar179;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar198;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  float fVar199;
  float fVar219;
  undefined1 auVar201 [16];
  float fVar200;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar224 [16];
  undefined1 auVar210 [16];
  float fVar218;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar220;
  float fVar235;
  float fVar236;
  float fVar239;
  float fVar240;
  float fVar242;
  undefined1 auVar225 [32];
  float fVar244;
  undefined1 auVar226 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar227 [32];
  float fVar238;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar237;
  float fVar241;
  float fVar243;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar245;
  float fVar264;
  undefined1 auVar247 [16];
  float fVar246;
  float fVar261;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar260;
  float fVar262;
  float fVar266;
  float fVar267;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar263;
  float fVar265;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar268;
  undefined1 auVar259 [32];
  float fVar269;
  float fVar277;
  undefined1 auVar270 [16];
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [64];
  float fVar281;
  float fVar282;
  float fVar290;
  float fVar292;
  float fVar295;
  float fVar298;
  float fVar301;
  float fVar304;
  undefined1 auVar283 [32];
  float fVar306;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar291;
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar299;
  float fVar300;
  float fVar302;
  float fVar303;
  float fVar305;
  float fVar307;
  undefined1 auVar288 [32];
  undefined1 auVar289 [64];
  float fVar308;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar325;
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  float fVar326;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar340;
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  float fVar344;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [64];
  float fVar359;
  float fVar369;
  float fVar370;
  undefined1 auVar360 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float fVar371;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  float fVar377;
  undefined1 auVar372 [16];
  float fVar378;
  float fVar379;
  float fVar380;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  float fVar381;
  float fVar392;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [64];
  float fVar400;
  float fVar405;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined8 uStack_928;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8a8;
  undefined8 uStack_898;
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  ulong local_770;
  undefined8 uStack_768;
  undefined1 *local_760;
  undefined1 (*local_758) [16];
  undefined1 (*local_750) [32];
  Precalculations *local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  ulong local_690;
  undefined8 uStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5f0;
  ulong local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  RTCHitN local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar248 [16];
  undefined1 auVar382 [16];
  undefined1 auVar401 [16];
  
  PVar19 = prim[1];
  uVar144 = (ulong)(byte)PVar19;
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 4 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 4 + 10)));
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 5 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 5 + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 6 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 6 + 10)));
  lVar149 = uVar144 * 0x25;
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0xf + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0xf + 10)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 10)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x11 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x11 + 10)));
  fVar245 = *(float *)(prim + lVar149 + 0x12);
  auVar252 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar252 = vinsertps_avx(auVar252,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar205 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar205 = vinsertps_avx(auVar205,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar252 = vsubps_avx(auVar252,*(undefined1 (*) [16])(prim + lVar149 + 6));
  auVar360._0_4_ = fVar245 * auVar252._0_4_;
  auVar360._4_4_ = fVar245 * auVar252._4_4_;
  auVar360._8_4_ = fVar245 * auVar252._8_4_;
  auVar360._12_4_ = fVar245 * auVar252._12_4_;
  auVar372._0_4_ = fVar245 * auVar205._0_4_;
  auVar372._4_4_ = fVar245 * auVar205._4_4_;
  auVar372._8_4_ = fVar245 * auVar205._8_4_;
  auVar372._12_4_ = fVar245 * auVar205._12_4_;
  auVar271._16_16_ = auVar209;
  auVar271._0_16_ = auVar224;
  auVar253._16_16_ = auVar34;
  auVar253._0_16_ = auVar207;
  auVar252 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1a + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1a + 10)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1b + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1b + 10)));
  auVar161 = vcvtdq2ps_avx(auVar253);
  auVar185._16_16_ = auVar36;
  auVar185._0_16_ = auVar35;
  auVar330 = vcvtdq2ps_avx(auVar185);
  auVar283._16_16_ = auVar38;
  auVar283._0_16_ = auVar37;
  auVar211._16_16_ = auVar40;
  auVar211._0_16_ = auVar39;
  auVar28 = vcvtdq2ps_avx(auVar211);
  auVar225._16_16_ = auVar42;
  auVar225._0_16_ = auVar41;
  auVar333 = vcvtdq2ps_avx(auVar225);
  auVar309._16_16_ = auVar205;
  auVar309._0_16_ = auVar252;
  auVar327._16_16_ = auVar209;
  auVar327._0_16_ = auVar224;
  auVar252 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1c + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1c + 10)));
  auVar393._16_16_ = auVar205;
  auVar393._0_16_ = auVar252;
  auVar252 = vshufps_avx(auVar372,auVar372,0x55);
  auVar205 = vshufps_avx(auVar372,auVar372,0xaa);
  fVar245 = auVar205._0_4_;
  fVar281 = auVar205._4_4_;
  fVar260 = auVar205._8_4_;
  fVar290 = auVar205._12_4_;
  fVar262 = auVar252._0_4_;
  fVar292 = auVar252._4_4_;
  fVar264 = auVar252._8_4_;
  fVar295 = auVar252._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar271);
  auVar30 = vcvtdq2ps_avx(auVar283);
  auVar31 = vcvtdq2ps_avx(auVar309);
  auVar32 = vcvtdq2ps_avx(auVar327);
  auVar33 = vcvtdq2ps_avx(auVar393);
  auVar252 = vshufps_avx(auVar372,auVar372,0);
  fVar244 = auVar252._0_4_;
  fVar298 = auVar252._4_4_;
  fVar266 = auVar252._8_4_;
  fVar301 = auVar252._12_4_;
  auVar406._0_4_ = fVar244 * auVar29._0_4_ + fVar262 * auVar161._0_4_ + fVar245 * auVar330._0_4_;
  auVar406._4_4_ = fVar298 * auVar29._4_4_ + fVar292 * auVar161._4_4_ + fVar281 * auVar330._4_4_;
  auVar406._8_4_ = fVar266 * auVar29._8_4_ + fVar264 * auVar161._8_4_ + fVar260 * auVar330._8_4_;
  auVar406._12_4_ = fVar301 * auVar29._12_4_ + fVar295 * auVar161._12_4_ + fVar290 * auVar330._12_4_
  ;
  auVar406._16_4_ = fVar244 * auVar29._16_4_ + fVar262 * auVar161._16_4_ + fVar245 * auVar330._16_4_
  ;
  auVar406._20_4_ = fVar298 * auVar29._20_4_ + fVar292 * auVar161._20_4_ + fVar281 * auVar330._20_4_
  ;
  auVar406._24_4_ = fVar266 * auVar29._24_4_ + fVar264 * auVar161._24_4_ + fVar260 * auVar330._24_4_
  ;
  auVar406._28_4_ = fVar295 + 0.0;
  auVar402._0_4_ = fVar244 * auVar30._0_4_ + fVar262 * auVar28._0_4_ + fVar245 * auVar333._0_4_;
  auVar402._4_4_ = fVar298 * auVar30._4_4_ + fVar292 * auVar28._4_4_ + fVar281 * auVar333._4_4_;
  auVar402._8_4_ = fVar266 * auVar30._8_4_ + fVar264 * auVar28._8_4_ + fVar260 * auVar333._8_4_;
  auVar402._12_4_ = fVar301 * auVar30._12_4_ + fVar295 * auVar28._12_4_ + fVar290 * auVar333._12_4_;
  auVar402._16_4_ = fVar244 * auVar30._16_4_ + fVar262 * auVar28._16_4_ + fVar245 * auVar333._16_4_;
  auVar402._20_4_ = fVar298 * auVar30._20_4_ + fVar292 * auVar28._20_4_ + fVar281 * auVar333._20_4_;
  auVar402._24_4_ = fVar266 * auVar30._24_4_ + fVar264 * auVar28._24_4_ + fVar260 * auVar333._24_4_;
  auVar402._28_4_ = fVar295 + 0.0;
  auVar394._0_4_ = fVar244 * auVar31._0_4_ + fVar262 * auVar32._0_4_ + fVar245 * auVar33._0_4_;
  auVar394._4_4_ = fVar298 * auVar31._4_4_ + fVar292 * auVar32._4_4_ + fVar281 * auVar33._4_4_;
  auVar394._8_4_ = fVar266 * auVar31._8_4_ + fVar264 * auVar32._8_4_ + fVar260 * auVar33._8_4_;
  auVar394._12_4_ = fVar301 * auVar31._12_4_ + fVar295 * auVar32._12_4_ + fVar290 * auVar33._12_4_;
  auVar394._16_4_ = fVar244 * auVar31._16_4_ + fVar262 * auVar32._16_4_ + fVar245 * auVar33._16_4_;
  auVar394._20_4_ = fVar298 * auVar31._20_4_ + fVar292 * auVar32._20_4_ + fVar281 * auVar33._20_4_;
  auVar394._24_4_ = fVar266 * auVar31._24_4_ + fVar264 * auVar32._24_4_ + fVar260 * auVar33._24_4_;
  auVar394._28_4_ = fVar295 + fVar295 + fVar290;
  auVar252 = vshufps_avx(auVar360,auVar360,0x55);
  auVar205 = vshufps_avx(auVar360,auVar360,0xaa);
  fVar298 = auVar205._0_4_;
  fVar266 = auVar205._4_4_;
  fVar301 = auVar205._8_4_;
  fVar267 = auVar205._12_4_;
  fVar262 = auVar252._0_4_;
  fVar292 = auVar252._4_4_;
  fVar264 = auVar252._8_4_;
  fVar295 = auVar252._12_4_;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar144 * 7 + 6);
  auVar252 = vpmovsxwd_avx(auVar252);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar144 * 7 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar205);
  fVar244 = auVar161._28_4_ + auVar333._28_4_;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = *(ulong *)(prim + uVar144 * 0xb + 6);
  auVar224 = vpmovsxwd_avx(auVar224);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar144 * 0xb + 0xe);
  auVar209 = vpmovsxwd_avx(auVar209);
  auVar207 = vshufps_avx(auVar360,auVar360,0);
  fVar245 = auVar207._0_4_;
  fVar281 = auVar207._4_4_;
  fVar260 = auVar207._8_4_;
  fVar290 = auVar207._12_4_;
  auVar186._0_4_ = auVar29._0_4_ * fVar245 + fVar262 * auVar161._0_4_ + fVar298 * auVar330._0_4_;
  auVar186._4_4_ = auVar29._4_4_ * fVar281 + fVar292 * auVar161._4_4_ + fVar266 * auVar330._4_4_;
  auVar186._8_4_ = auVar29._8_4_ * fVar260 + fVar264 * auVar161._8_4_ + fVar301 * auVar330._8_4_;
  auVar186._12_4_ = auVar29._12_4_ * fVar290 + fVar295 * auVar161._12_4_ + fVar267 * auVar330._12_4_
  ;
  auVar186._16_4_ = auVar29._16_4_ * fVar245 + fVar262 * auVar161._16_4_ + fVar298 * auVar330._16_4_
  ;
  auVar186._20_4_ = auVar29._20_4_ * fVar281 + fVar292 * auVar161._20_4_ + fVar266 * auVar330._20_4_
  ;
  auVar186._24_4_ = auVar29._24_4_ * fVar260 + fVar264 * auVar161._24_4_ + fVar301 * auVar330._24_4_
  ;
  auVar186._28_4_ = fVar295 + auVar161._28_4_ + auVar330._28_4_;
  auVar155._0_4_ = fVar245 * auVar30._0_4_ + fVar262 * auVar28._0_4_ + fVar298 * auVar333._0_4_;
  auVar155._4_4_ = fVar281 * auVar30._4_4_ + fVar292 * auVar28._4_4_ + fVar266 * auVar333._4_4_;
  auVar155._8_4_ = fVar260 * auVar30._8_4_ + fVar264 * auVar28._8_4_ + fVar301 * auVar333._8_4_;
  auVar155._12_4_ = fVar290 * auVar30._12_4_ + fVar295 * auVar28._12_4_ + fVar267 * auVar333._12_4_;
  auVar155._16_4_ = fVar245 * auVar30._16_4_ + fVar262 * auVar28._16_4_ + fVar298 * auVar333._16_4_;
  auVar155._20_4_ = fVar281 * auVar30._20_4_ + fVar292 * auVar28._20_4_ + fVar266 * auVar333._20_4_;
  auVar155._24_4_ = fVar260 * auVar30._24_4_ + fVar264 * auVar28._24_4_ + fVar301 * auVar333._24_4_;
  auVar155._28_4_ = fVar295 + fVar244;
  auVar361._8_4_ = 0x7fffffff;
  auVar361._0_8_ = 0x7fffffff7fffffff;
  auVar361._12_4_ = 0x7fffffff;
  auVar361._16_4_ = 0x7fffffff;
  auVar361._20_4_ = 0x7fffffff;
  auVar361._24_4_ = 0x7fffffff;
  auVar361._28_4_ = 0x7fffffff;
  auVar254._8_4_ = 0x219392ef;
  auVar254._0_8_ = 0x219392ef219392ef;
  auVar254._12_4_ = 0x219392ef;
  auVar254._16_4_ = 0x219392ef;
  auVar254._20_4_ = 0x219392ef;
  auVar254._24_4_ = 0x219392ef;
  auVar254._28_4_ = 0x219392ef;
  auVar161 = vandps_avx(auVar406,auVar361);
  auVar161 = vcmpps_avx(auVar161,auVar254,1);
  auVar330 = vblendvps_avx(auVar406,auVar254,auVar161);
  auVar161 = vandps_avx(auVar402,auVar361);
  auVar161 = vcmpps_avx(auVar161,auVar254,1);
  auVar28 = vblendvps_avx(auVar402,auVar254,auVar161);
  auVar161 = vandps_avx(auVar394,auVar361);
  auVar161 = vcmpps_avx(auVar161,auVar254,1);
  auVar161 = vblendvps_avx(auVar394,auVar254,auVar161);
  auVar226._0_4_ = fVar245 * auVar31._0_4_ + auVar32._0_4_ * fVar262 + fVar298 * auVar33._0_4_;
  auVar226._4_4_ = fVar281 * auVar31._4_4_ + auVar32._4_4_ * fVar292 + fVar266 * auVar33._4_4_;
  auVar226._8_4_ = fVar260 * auVar31._8_4_ + auVar32._8_4_ * fVar264 + fVar301 * auVar33._8_4_;
  auVar226._12_4_ = fVar290 * auVar31._12_4_ + auVar32._12_4_ * fVar295 + fVar267 * auVar33._12_4_;
  auVar226._16_4_ = fVar245 * auVar31._16_4_ + auVar32._16_4_ * fVar262 + fVar298 * auVar33._16_4_;
  auVar226._20_4_ = fVar281 * auVar31._20_4_ + auVar32._20_4_ * fVar292 + fVar266 * auVar33._20_4_;
  auVar226._24_4_ = fVar260 * auVar31._24_4_ + auVar32._24_4_ * fVar264 + fVar301 * auVar33._24_4_;
  auVar226._28_4_ = fVar244 + fVar295 + 0.0;
  auVar333 = vrcpps_avx(auVar330);
  fVar245 = auVar333._0_4_;
  fVar260 = auVar333._4_4_;
  auVar29._4_4_ = auVar330._4_4_ * fVar260;
  auVar29._0_4_ = auVar330._0_4_ * fVar245;
  fVar262 = auVar333._8_4_;
  auVar29._8_4_ = auVar330._8_4_ * fVar262;
  fVar264 = auVar333._12_4_;
  auVar29._12_4_ = auVar330._12_4_ * fVar264;
  fVar244 = auVar333._16_4_;
  auVar29._16_4_ = auVar330._16_4_ * fVar244;
  fVar266 = auVar333._20_4_;
  auVar29._20_4_ = auVar330._20_4_ * fVar266;
  fVar267 = auVar333._24_4_;
  auVar29._24_4_ = auVar330._24_4_ * fVar267;
  auVar29._28_4_ = 0x219392ef;
  auVar403._8_4_ = 0x3f800000;
  auVar403._0_8_ = 0x3f8000003f800000;
  auVar403._12_4_ = 0x3f800000;
  auVar403._16_4_ = 0x3f800000;
  auVar403._20_4_ = 0x3f800000;
  auVar403._24_4_ = 0x3f800000;
  auVar403._28_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar403,auVar29);
  auVar29 = vrcpps_avx(auVar28);
  fVar245 = fVar245 + fVar245 * auVar30._0_4_;
  fVar260 = fVar260 + fVar260 * auVar30._4_4_;
  fVar262 = fVar262 + fVar262 * auVar30._8_4_;
  fVar264 = fVar264 + fVar264 * auVar30._12_4_;
  fVar244 = fVar244 + fVar244 * auVar30._16_4_;
  fVar266 = fVar266 + fVar266 * auVar30._20_4_;
  fVar267 = fVar267 + fVar267 * auVar30._24_4_;
  fVar269 = auVar29._0_4_;
  fVar275 = auVar29._4_4_;
  auVar330._4_4_ = fVar275 * auVar28._4_4_;
  auVar330._0_4_ = fVar269 * auVar28._0_4_;
  fVar276 = auVar29._8_4_;
  auVar330._8_4_ = fVar276 * auVar28._8_4_;
  fVar277 = auVar29._12_4_;
  auVar330._12_4_ = fVar277 * auVar28._12_4_;
  fVar278 = auVar29._16_4_;
  auVar330._16_4_ = fVar278 * auVar28._16_4_;
  fVar279 = auVar29._20_4_;
  auVar330._20_4_ = fVar279 * auVar28._20_4_;
  fVar280 = auVar29._24_4_;
  auVar330._24_4_ = fVar280 * auVar28._24_4_;
  auVar330._28_4_ = auVar333._28_4_;
  auVar31 = vsubps_avx(auVar403,auVar330);
  fVar269 = fVar269 + fVar269 * auVar31._0_4_;
  fVar275 = fVar275 + fVar275 * auVar31._4_4_;
  fVar276 = fVar276 + fVar276 * auVar31._8_4_;
  fVar277 = fVar277 + fVar277 * auVar31._12_4_;
  fVar278 = fVar278 + fVar278 * auVar31._16_4_;
  fVar279 = fVar279 + fVar279 * auVar31._20_4_;
  fVar280 = fVar280 + fVar280 * auVar31._24_4_;
  auVar330 = vrcpps_avx(auVar161);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar144 * 9 + 6);
  auVar207 = vpmovsxwd_avx(auVar207);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar144 * 9 + 0xe);
  auVar34 = vpmovsxwd_avx(auVar34);
  fVar281 = auVar330._0_4_;
  fVar290 = auVar330._4_4_;
  auVar32._4_4_ = auVar161._4_4_ * fVar290;
  auVar32._0_4_ = auVar161._0_4_ * fVar281;
  fVar292 = auVar330._8_4_;
  auVar32._8_4_ = auVar161._8_4_ * fVar292;
  fVar295 = auVar330._12_4_;
  auVar32._12_4_ = auVar161._12_4_ * fVar295;
  fVar298 = auVar330._16_4_;
  auVar32._16_4_ = auVar161._16_4_ * fVar298;
  fVar301 = auVar330._20_4_;
  auVar32._20_4_ = auVar161._20_4_ * fVar301;
  fVar304 = auVar330._24_4_;
  auVar32._24_4_ = auVar161._24_4_ * fVar304;
  auVar32._28_4_ = auVar28._28_4_;
  auVar161 = vsubps_avx(auVar403,auVar32);
  fVar281 = fVar281 + fVar281 * auVar161._0_4_;
  fVar290 = fVar290 + fVar290 * auVar161._4_4_;
  fVar292 = fVar292 + fVar292 * auVar161._8_4_;
  fVar295 = fVar295 + fVar295 * auVar161._12_4_;
  fVar298 = fVar298 + fVar298 * auVar161._16_4_;
  fVar301 = fVar301 + fVar301 * auVar161._20_4_;
  fVar304 = fVar304 + fVar304 * auVar161._24_4_;
  auVar345._16_16_ = auVar205;
  auVar345._0_16_ = auVar252;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar144 * 0xd + 6);
  auVar252 = vpmovsxwd_avx(auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar144 * 0xd + 0xe);
  auVar205 = vpmovsxwd_avx(auVar36);
  auVar35 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                         *(float *)(prim + lVar149 + 0x16)) *
                                        *(float *)(prim + lVar149 + 0x1a))),0);
  auVar161 = vcvtdq2ps_avx(auVar345);
  auVar310._16_16_ = auVar209;
  auVar310._0_16_ = auVar224;
  auVar330 = vcvtdq2ps_avx(auVar310);
  auVar330 = vsubps_avx(auVar330,auVar161);
  fVar199 = auVar35._0_4_;
  fVar218 = auVar35._4_4_;
  fVar377 = auVar35._8_4_;
  fVar219 = auVar35._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar144 * 0x12 + 6);
  auVar224 = vpmovsxwd_avx(auVar37);
  auVar311._0_4_ = auVar161._0_4_ + fVar199 * auVar330._0_4_;
  auVar311._4_4_ = auVar161._4_4_ + fVar218 * auVar330._4_4_;
  auVar311._8_4_ = auVar161._8_4_ + fVar377 * auVar330._8_4_;
  auVar311._12_4_ = auVar161._12_4_ + fVar219 * auVar330._12_4_;
  auVar311._16_4_ = auVar161._16_4_ + fVar199 * auVar330._16_4_;
  auVar311._20_4_ = auVar161._20_4_ + fVar218 * auVar330._20_4_;
  auVar311._24_4_ = auVar161._24_4_ + fVar377 * auVar330._24_4_;
  auVar311._28_4_ = auVar161._28_4_ + auVar330._28_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar144 * 0x12 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar38);
  auVar328._16_16_ = auVar34;
  auVar328._0_16_ = auVar207;
  auVar161 = vcvtdq2ps_avx(auVar328);
  auVar362._16_16_ = auVar205;
  auVar362._0_16_ = auVar252;
  auVar330 = vcvtdq2ps_avx(auVar362);
  auVar330 = vsubps_avx(auVar330,auVar161);
  auVar329._0_4_ = auVar161._0_4_ + auVar330._0_4_ * fVar199;
  auVar329._4_4_ = auVar161._4_4_ + auVar330._4_4_ * fVar218;
  auVar329._8_4_ = auVar161._8_4_ + auVar330._8_4_ * fVar377;
  auVar329._12_4_ = auVar161._12_4_ + auVar330._12_4_ * fVar219;
  auVar329._16_4_ = auVar161._16_4_ + auVar330._16_4_ * fVar199;
  auVar329._20_4_ = auVar161._20_4_ + auVar330._20_4_ * fVar218;
  auVar329._24_4_ = auVar161._24_4_ + auVar330._24_4_ * fVar377;
  auVar329._28_4_ = auVar161._28_4_ + auVar330._28_4_;
  auVar346._16_16_ = auVar209;
  auVar346._0_16_ = auVar224;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar144 * 0x16 + 6);
  auVar252 = vpmovsxwd_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar144 * 0x16 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar40);
  auVar161 = vcvtdq2ps_avx(auVar346);
  auVar363._16_16_ = auVar205;
  auVar363._0_16_ = auVar252;
  auVar330 = vcvtdq2ps_avx(auVar363);
  auVar330 = vsubps_avx(auVar330,auVar161);
  auVar347._0_4_ = auVar161._0_4_ + auVar330._0_4_ * fVar199;
  auVar347._4_4_ = auVar161._4_4_ + auVar330._4_4_ * fVar218;
  auVar347._8_4_ = auVar161._8_4_ + auVar330._8_4_ * fVar377;
  auVar347._12_4_ = auVar161._12_4_ + auVar330._12_4_ * fVar219;
  auVar347._16_4_ = auVar161._16_4_ + auVar330._16_4_ * fVar199;
  auVar347._20_4_ = auVar161._20_4_ + auVar330._20_4_ * fVar218;
  auVar347._24_4_ = auVar161._24_4_ + auVar330._24_4_ * fVar377;
  auVar347._28_4_ = auVar161._28_4_ + auVar330._28_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar144 * 0x14 + 6);
  auVar252 = vpmovsxwd_avx(auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar144 * 0x14 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar42);
  auVar364._16_16_ = auVar205;
  auVar364._0_16_ = auVar252;
  auVar161 = vcvtdq2ps_avx(auVar364);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar144 * 0x18 + 6);
  auVar252 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar144 * 0x18 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar10);
  auVar373._16_16_ = auVar205;
  auVar373._0_16_ = auVar252;
  auVar330 = vcvtdq2ps_avx(auVar373);
  auVar330 = vsubps_avx(auVar330,auVar161);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar144 * 0x1d + 6);
  auVar252 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar144 * 0x1d + 0xe);
  auVar205 = vpmovsxwd_avx(auVar12);
  auVar365._0_4_ = auVar161._0_4_ + auVar330._0_4_ * fVar199;
  auVar365._4_4_ = auVar161._4_4_ + auVar330._4_4_ * fVar218;
  auVar365._8_4_ = auVar161._8_4_ + auVar330._8_4_ * fVar377;
  auVar365._12_4_ = auVar161._12_4_ + auVar330._12_4_ * fVar219;
  auVar365._16_4_ = auVar161._16_4_ + auVar330._16_4_ * fVar199;
  auVar365._20_4_ = auVar161._20_4_ + auVar330._20_4_ * fVar218;
  auVar365._24_4_ = auVar161._24_4_ + auVar330._24_4_ * fVar377;
  auVar365._28_4_ = auVar161._28_4_ + auVar330._28_4_;
  auVar374._16_16_ = auVar205;
  auVar374._0_16_ = auVar252;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar144 * 0x21 + 6);
  auVar252 = vpmovsxwd_avx(auVar13);
  auVar161 = vcvtdq2ps_avx(auVar374);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar144 * 0x21 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar14);
  auVar383._16_16_ = auVar205;
  auVar383._0_16_ = auVar252;
  auVar330 = vcvtdq2ps_avx(auVar383);
  auVar330 = vsubps_avx(auVar330,auVar161);
  auVar375._0_4_ = auVar161._0_4_ + auVar330._0_4_ * fVar199;
  auVar375._4_4_ = auVar161._4_4_ + auVar330._4_4_ * fVar218;
  auVar375._8_4_ = auVar161._8_4_ + auVar330._8_4_ * fVar377;
  auVar375._12_4_ = auVar161._12_4_ + auVar330._12_4_ * fVar219;
  auVar375._16_4_ = auVar161._16_4_ + auVar330._16_4_ * fVar199;
  auVar375._20_4_ = auVar161._20_4_ + auVar330._20_4_ * fVar218;
  auVar375._24_4_ = auVar161._24_4_ + auVar330._24_4_ * fVar377;
  auVar375._28_4_ = auVar161._28_4_ + auVar330._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar144 * 0x1f + 6);
  auVar252 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar144 * 0x1f + 0xe);
  auVar205 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar144 * 0x23 + 6);
  auVar224 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar144 * 0x23 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar18);
  auVar384._16_16_ = auVar205;
  auVar384._0_16_ = auVar252;
  auVar395._16_16_ = auVar209;
  auVar395._0_16_ = auVar224;
  auVar161 = vcvtdq2ps_avx(auVar384);
  auVar330 = vcvtdq2ps_avx(auVar395);
  auVar330 = vsubps_avx(auVar330,auVar161);
  auVar385._0_4_ = auVar161._0_4_ + auVar330._0_4_ * fVar199;
  auVar385._4_4_ = auVar161._4_4_ + auVar330._4_4_ * fVar218;
  auVar385._8_4_ = auVar161._8_4_ + auVar330._8_4_ * fVar377;
  auVar385._12_4_ = auVar161._12_4_ + auVar330._12_4_ * fVar219;
  auVar385._16_4_ = auVar161._16_4_ + auVar330._16_4_ * fVar199;
  auVar385._20_4_ = auVar161._20_4_ + auVar330._20_4_ * fVar218;
  auVar385._24_4_ = auVar161._24_4_ + auVar330._24_4_ * fVar377;
  auVar385._28_4_ = auVar161._28_4_ + fVar219;
  auVar161 = vsubps_avx(auVar311,auVar186);
  auVar201._0_4_ = fVar245 * auVar161._0_4_;
  auVar201._4_4_ = fVar260 * auVar161._4_4_;
  auVar201._8_4_ = fVar262 * auVar161._8_4_;
  auVar201._12_4_ = fVar264 * auVar161._12_4_;
  auVar28._16_4_ = fVar244 * auVar161._16_4_;
  auVar28._0_16_ = auVar201;
  auVar28._20_4_ = fVar266 * auVar161._20_4_;
  auVar28._24_4_ = fVar267 * auVar161._24_4_;
  auVar28._28_4_ = auVar161._28_4_;
  auVar161 = vsubps_avx(auVar329,auVar186);
  auVar247._0_4_ = fVar245 * auVar161._0_4_;
  auVar247._4_4_ = fVar260 * auVar161._4_4_;
  auVar247._8_4_ = fVar262 * auVar161._8_4_;
  auVar247._12_4_ = fVar264 * auVar161._12_4_;
  auVar33._16_4_ = fVar244 * auVar161._16_4_;
  auVar33._0_16_ = auVar247;
  auVar33._20_4_ = fVar266 * auVar161._20_4_;
  auVar33._24_4_ = fVar267 * auVar161._24_4_;
  auVar33._28_4_ = auVar333._28_4_ + auVar30._28_4_;
  auVar161 = vsubps_avx(auVar347,auVar155);
  auVar180._0_4_ = fVar269 * auVar161._0_4_;
  auVar180._4_4_ = fVar275 * auVar161._4_4_;
  auVar180._8_4_ = fVar276 * auVar161._8_4_;
  auVar180._12_4_ = fVar277 * auVar161._12_4_;
  auVar333._16_4_ = fVar278 * auVar161._16_4_;
  auVar333._0_16_ = auVar180;
  auVar333._20_4_ = fVar279 * auVar161._20_4_;
  auVar333._24_4_ = fVar280 * auVar161._24_4_;
  auVar333._28_4_ = auVar161._28_4_;
  auVar161 = vsubps_avx(auVar365,auVar155);
  auVar270._0_4_ = fVar269 * auVar161._0_4_;
  auVar270._4_4_ = fVar275 * auVar161._4_4_;
  auVar270._8_4_ = fVar276 * auVar161._8_4_;
  auVar270._12_4_ = fVar277 * auVar161._12_4_;
  auVar30._16_4_ = fVar278 * auVar161._16_4_;
  auVar30._0_16_ = auVar270;
  auVar30._20_4_ = fVar279 * auVar161._20_4_;
  auVar30._24_4_ = fVar280 * auVar161._24_4_;
  auVar30._28_4_ = auVar29._28_4_ + auVar31._28_4_;
  auVar161 = vsubps_avx(auVar375,auVar226);
  auVar151._0_4_ = fVar281 * auVar161._0_4_;
  auVar151._4_4_ = fVar290 * auVar161._4_4_;
  auVar151._8_4_ = fVar292 * auVar161._8_4_;
  auVar151._12_4_ = fVar295 * auVar161._12_4_;
  auVar31._16_4_ = fVar298 * auVar161._16_4_;
  auVar31._0_16_ = auVar151;
  auVar31._20_4_ = fVar301 * auVar161._20_4_;
  auVar31._24_4_ = fVar304 * auVar161._24_4_;
  auVar31._28_4_ = auVar161._28_4_;
  auVar161 = vsubps_avx(auVar385,auVar226);
  auVar221._0_4_ = fVar281 * auVar161._0_4_;
  auVar221._4_4_ = fVar290 * auVar161._4_4_;
  auVar221._8_4_ = fVar292 * auVar161._8_4_;
  auVar221._12_4_ = fVar295 * auVar161._12_4_;
  auVar43._16_4_ = fVar298 * auVar161._16_4_;
  auVar43._0_16_ = auVar221;
  auVar43._20_4_ = fVar301 * auVar161._20_4_;
  auVar43._24_4_ = fVar304 * auVar161._24_4_;
  auVar43._28_4_ = auVar161._28_4_;
  auVar252 = vpminsd_avx(auVar28._16_16_,auVar33._16_16_);
  auVar205 = vpminsd_avx(auVar201,auVar247);
  auVar366._16_16_ = auVar252;
  auVar366._0_16_ = auVar205;
  auVar224 = auVar30._16_16_;
  auVar336 = ZEXT1664(auVar224);
  auVar252 = vpminsd_avx(auVar333._16_16_,auVar224);
  auVar205 = vpminsd_avx(auVar180,auVar270);
  auVar376._16_16_ = auVar252;
  auVar376._0_16_ = auVar205;
  auVar161 = vmaxps_avx(auVar366,auVar376);
  auVar252 = vpminsd_avx(auVar31._16_16_,auVar43._16_16_);
  auVar205 = vpminsd_avx(auVar151,auVar221);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar407._4_4_ = uVar8;
  auVar407._0_4_ = uVar8;
  auVar407._8_4_ = uVar8;
  auVar407._12_4_ = uVar8;
  auVar407._16_4_ = uVar8;
  auVar407._20_4_ = uVar8;
  auVar407._24_4_ = uVar8;
  auVar407._28_4_ = uVar8;
  auVar396._16_16_ = auVar252;
  auVar396._0_16_ = auVar205;
  auVar330 = vmaxps_avx(auVar396,auVar407);
  auVar161 = vmaxps_avx(auVar161,auVar330);
  local_80._4_4_ = auVar161._4_4_ * 0.99999964;
  local_80._0_4_ = auVar161._0_4_ * 0.99999964;
  local_80._8_4_ = auVar161._8_4_ * 0.99999964;
  local_80._12_4_ = auVar161._12_4_ * 0.99999964;
  local_80._16_4_ = auVar161._16_4_ * 0.99999964;
  local_80._20_4_ = auVar161._20_4_ * 0.99999964;
  local_80._24_4_ = auVar161._24_4_ * 0.99999964;
  local_80._28_4_ = auVar330._28_4_;
  auVar252 = vpmaxsd_avx(auVar28._16_16_,auVar33._16_16_);
  auVar205 = vpmaxsd_avx(auVar201,auVar247);
  auVar212._16_16_ = auVar252;
  auVar212._0_16_ = auVar205;
  auVar252 = vpmaxsd_avx(auVar333._16_16_,auVar224);
  auVar205 = vpmaxsd_avx(auVar180,auVar270);
  auVar161._16_16_ = auVar252;
  auVar161._0_16_ = auVar205;
  auVar161 = vminps_avx(auVar212,auVar161);
  auVar252 = vpmaxsd_avx(auVar31._16_16_,auVar43._16_16_);
  auVar205 = vpmaxsd_avx(auVar151,auVar221);
  auVar156._16_16_ = auVar252;
  auVar156._0_16_ = auVar205;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar213._4_4_ = uVar8;
  auVar213._0_4_ = uVar8;
  auVar213._8_4_ = uVar8;
  auVar213._12_4_ = uVar8;
  auVar213._16_4_ = uVar8;
  auVar213._20_4_ = uVar8;
  auVar213._24_4_ = uVar8;
  auVar213._28_4_ = uVar8;
  auVar330 = vminps_avx(auVar156,auVar213);
  auVar161 = vminps_avx(auVar161,auVar330);
  auVar44._4_4_ = auVar161._4_4_ * 1.0000004;
  auVar44._0_4_ = auVar161._0_4_ * 1.0000004;
  auVar44._8_4_ = auVar161._8_4_ * 1.0000004;
  auVar44._12_4_ = auVar161._12_4_ * 1.0000004;
  auVar44._16_4_ = auVar161._16_4_ * 1.0000004;
  auVar44._20_4_ = auVar161._20_4_ * 1.0000004;
  auVar44._24_4_ = auVar161._24_4_ * 1.0000004;
  auVar44._28_4_ = auVar161._28_4_;
  auVar161 = vcmpps_avx(local_80,auVar44,2);
  auVar252 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar187._16_16_ = auVar252;
  auVar187._0_16_ = auVar252;
  auVar330 = vcvtdq2ps_avx(auVar187);
  auVar330 = vcmpps_avx(_DAT_01f7b060,auVar330,1);
  auVar161 = vandps_avx(auVar161,auVar330);
  uVar147 = vmovmskps_avx(auVar161);
  local_5e0 = mm_lookupmask_ps._16_8_;
  uStack_5d8 = mm_lookupmask_ps._24_8_;
  uStack_5d0 = mm_lookupmask_ps._16_8_;
  uStack_5c8 = mm_lookupmask_ps._24_8_;
  local_5f0 = pre->ray_space + k;
  local_750 = (undefined1 (*) [32])&local_1a0;
  uVar141 = 1 << ((byte)k & 0x1f);
  local_758 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar141 & 0xf) << 4));
  local_760 = mm_lookupmask_ps + (long)((int)uVar141 >> 4) * 0x10;
  local_748 = pre;
  do {
    auVar161 = local_840;
    local_5e8 = (ulong)uVar147;
    if (local_5e8 == 0) {
      return;
    }
    auVar330 = auVar336._0_32_;
    lVar149 = 0;
    if (local_5e8 != 0) {
      for (; (uVar147 >> lVar149 & 1) == 0; lVar149 = lVar149 + 1) {
      }
    }
    uVar147 = *(uint *)(prim + 2);
    uVar143 = *(uint *)(prim + lVar149 * 4 + 6);
    pGVar22 = (context->scene->geometries).items[CONCAT44(0,uVar147)].ptr;
    uVar144 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                              CONCAT44(0,uVar143) *
                              pGVar22[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar245 = (pGVar22->time_range).lower;
    fVar245 = pGVar22->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar245) / ((pGVar22->time_range).upper - fVar245))
    ;
    auVar252 = vroundss_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),9);
    auVar252 = vminss_avx(auVar252,ZEXT416((uint)(pGVar22->fnumTimeSegments + -1.0)));
    auVar252 = vmaxss_avx(ZEXT816(0) << 0x20,auVar252);
    fVar245 = fVar245 - auVar252._0_4_;
    _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar145 = (long)(int)auVar252._0_4_ * 0x38;
    lVar146 = *(long *)(_Var23 + 0x10 + lVar145);
    lVar24 = *(long *)(_Var23 + 0x38 + lVar145);
    lVar25 = *(long *)(_Var23 + 0x48 + lVar145);
    auVar252 = vshufps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),0);
    pfVar1 = (float *)(lVar24 + lVar25 * uVar144);
    fVar262 = auVar252._0_4_;
    fVar292 = auVar252._4_4_;
    fVar264 = auVar252._8_4_;
    fVar295 = auVar252._12_4_;
    lVar149 = uVar144 + 1;
    pfVar2 = (float *)(lVar24 + lVar25 * lVar149);
    p_Var26 = pGVar22[4].occlusionFilterN;
    auVar252 = vshufps_avx(ZEXT416((uint)(1.0 - fVar245)),ZEXT416((uint)(1.0 - fVar245)),0);
    pfVar3 = (float *)(*(long *)(_Var23 + lVar145) + lVar146 * uVar144);
    fVar245 = auVar252._0_4_;
    fVar281 = auVar252._4_4_;
    fVar260 = auVar252._8_4_;
    fVar290 = auVar252._12_4_;
    pfVar4 = (float *)(*(long *)(_Var23 + lVar145) + lVar146 * lVar149);
    pfVar5 = (float *)(*(long *)(p_Var26 + lVar145 + 0x38) +
                      uVar144 * *(long *)(p_Var26 + lVar145 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var26 + lVar145 + 0x38) +
                      *(long *)(p_Var26 + lVar145 + 0x48) * lVar149);
    fVar246 = fVar245 * *pfVar3 + fVar262 * *pfVar1;
    fVar261 = fVar281 * pfVar3[1] + fVar292 * pfVar1[1];
    auVar248._0_8_ = CONCAT44(fVar261,fVar246);
    auVar248._8_4_ = fVar260 * pfVar3[2] + fVar264 * pfVar1[2];
    auVar248._12_4_ = fVar290 * pfVar3[3] + fVar295 * pfVar1[3];
    pfVar1 = (float *)(*(long *)(p_Var26 + lVar145) + *(long *)(p_Var26 + lVar145 + 0x10) * uVar144)
    ;
    fVar400 = fVar245 * *pfVar4 + fVar262 * *pfVar2;
    fVar405 = fVar281 * pfVar4[1] + fVar292 * pfVar2[1];
    auVar401._0_8_ = CONCAT44(fVar405,fVar400);
    auVar401._8_4_ = fVar260 * pfVar4[2] + fVar264 * pfVar2[2];
    auVar401._12_4_ = fVar290 * pfVar4[3] + fVar295 * pfVar2[3];
    pfVar2 = (float *)(*(long *)(p_Var26 + lVar145) + *(long *)(p_Var26 + lVar145 + 0x10) * lVar149)
    ;
    uVar20 = (uint)pGVar22[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar252 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar209 = vinsertps_avx(auVar252,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    fVar381 = fVar246 + (fVar245 * *pfVar1 + fVar262 * *pfVar5) * 0.33333334;
    fVar392 = fVar261 + (fVar281 * pfVar1[1] + fVar292 * pfVar5[1]) * 0.33333334;
    auVar382._0_8_ = CONCAT44(fVar392,fVar381);
    auVar382._8_4_ = auVar248._8_4_ + (fVar260 * pfVar1[2] + fVar264 * pfVar5[2]) * 0.33333334;
    auVar382._12_4_ = auVar248._12_4_ + (fVar290 * pfVar1[3] + fVar295 * pfVar5[3]) * 0.33333334;
    auVar181._0_4_ = (fVar245 * *pfVar2 + fVar262 * *pfVar6) * 0.33333334;
    auVar181._4_4_ = (fVar281 * pfVar2[1] + fVar292 * pfVar6[1]) * 0.33333334;
    auVar181._8_4_ = (fVar260 * pfVar2[2] + fVar264 * pfVar6[2]) * 0.33333334;
    auVar181._12_4_ = (fVar290 * pfVar2[3] + fVar295 * pfVar6[3]) * 0.33333334;
    auVar35 = vsubps_avx(auVar401,auVar181);
    auVar224 = vsubps_avx(auVar248,auVar209);
    auVar252 = vshufps_avx(auVar224,auVar224,0);
    auVar205 = vshufps_avx(auVar224,auVar224,0x55);
    auVar224 = vshufps_avx(auVar224,auVar224,0xaa);
    fVar245 = (local_5f0->vx).field_0.m128[0];
    fVar281 = (local_5f0->vx).field_0.m128[1];
    fVar260 = (local_5f0->vx).field_0.m128[2];
    fVar290 = (local_5f0->vx).field_0.m128[3];
    fVar262 = (local_5f0->vy).field_0.m128[0];
    fVar292 = (local_5f0->vy).field_0.m128[1];
    fVar264 = (local_5f0->vy).field_0.m128[2];
    fVar295 = (local_5f0->vy).field_0.m128[3];
    fVar244 = (local_5f0->vz).field_0.m128[0];
    fVar298 = (local_5f0->vz).field_0.m128[1];
    fVar266 = (local_5f0->vz).field_0.m128[2];
    fVar301 = (local_5f0->vz).field_0.m128[3];
    auVar249._0_4_ = auVar252._0_4_ * fVar245 + auVar205._0_4_ * fVar262 + fVar244 * auVar224._0_4_;
    auVar249._4_4_ = auVar252._4_4_ * fVar281 + auVar205._4_4_ * fVar292 + fVar298 * auVar224._4_4_;
    auVar249._8_4_ = auVar252._8_4_ * fVar260 + auVar205._8_4_ * fVar264 + fVar266 * auVar224._8_4_;
    auVar249._12_4_ =
         auVar252._12_4_ * fVar290 + auVar205._12_4_ * fVar295 + fVar301 * auVar224._12_4_;
    auVar252 = vblendps_avx(auVar249,auVar248,8);
    auVar207 = vsubps_avx(auVar382,auVar209);
    auVar205 = vshufps_avx(auVar207,auVar207,0);
    auVar224 = vshufps_avx(auVar207,auVar207,0x55);
    auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
    auVar250._0_8_ =
         CONCAT44(auVar205._4_4_ * fVar281 + auVar224._4_4_ * fVar292 + fVar298 * auVar207._4_4_,
                  auVar205._0_4_ * fVar245 + auVar224._0_4_ * fVar262 + fVar244 * auVar207._0_4_);
    auVar250._8_4_ = auVar205._8_4_ * fVar260 + auVar224._8_4_ * fVar264 + fVar266 * auVar207._8_4_;
    auVar250._12_4_ =
         auVar205._12_4_ * fVar290 + auVar224._12_4_ * fVar295 + fVar301 * auVar207._12_4_;
    auVar205 = vblendps_avx(auVar250,auVar382,8);
    auVar34 = vsubps_avx(auVar35,auVar209);
    auVar224 = vshufps_avx(auVar34,auVar34,0);
    auVar207 = vshufps_avx(auVar34,auVar34,0x55);
    auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
    auVar251._0_4_ = auVar224._0_4_ * fVar245 + auVar207._0_4_ * fVar262 + auVar34._0_4_ * fVar244;
    auVar251._4_4_ = auVar224._4_4_ * fVar281 + auVar207._4_4_ * fVar292 + auVar34._4_4_ * fVar298;
    auVar251._8_4_ = auVar224._8_4_ * fVar260 + auVar207._8_4_ * fVar264 + auVar34._8_4_ * fVar266;
    auVar251._12_4_ =
         auVar224._12_4_ * fVar290 + auVar207._12_4_ * fVar295 + auVar34._12_4_ * fVar301;
    auVar224 = vblendps_avx(auVar251,auVar35,8);
    auVar34 = vsubps_avx(auVar401,auVar209);
    auVar209 = vshufps_avx(auVar34,auVar34,0);
    auVar207 = vshufps_avx(auVar34,auVar34,0x55);
    auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
    auVar182._0_4_ = auVar209._0_4_ * fVar245 + auVar207._0_4_ * fVar262 + fVar244 * auVar34._0_4_;
    auVar182._4_4_ = auVar209._4_4_ * fVar281 + auVar207._4_4_ * fVar292 + fVar298 * auVar34._4_4_;
    auVar182._8_4_ = auVar209._8_4_ * fVar260 + auVar207._8_4_ * fVar264 + fVar266 * auVar34._8_4_;
    auVar182._12_4_ =
         auVar209._12_4_ * fVar290 + auVar207._12_4_ * fVar295 + fVar301 * auVar34._12_4_;
    auVar209 = vblendps_avx(auVar182,auVar401,8);
    auVar222._8_4_ = 0x7fffffff;
    auVar222._0_8_ = 0x7fffffff7fffffff;
    auVar222._12_4_ = 0x7fffffff;
    auVar252 = vandps_avx(auVar252,auVar222);
    auVar205 = vandps_avx(auVar205,auVar222);
    auVar207 = vmaxps_avx(auVar252,auVar205);
    auVar252 = vandps_avx(auVar224,auVar222);
    auVar205 = vandps_avx(auVar209,auVar222);
    auVar252 = vmaxps_avx(auVar252,auVar205);
    auVar252 = vmaxps_avx(auVar207,auVar252);
    auVar205 = vmovshdup_avx(auVar252);
    auVar205 = vmaxss_avx(auVar205,auVar252);
    auVar252 = vshufpd_avx(auVar252,auVar252,1);
    auVar252 = vmaxss_avx(auVar252,auVar205);
    local_840._0_4_ = auVar252._0_4_;
    auVar148 = (undefined1  [8])(long)(int)uVar20;
    lVar149 = (long)auVar148 * 0x44;
    fVar260 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar149 + 0x908);
    fVar292 = *(float *)(bezier_basis0 + lVar149 + 0x90c);
    fVar295 = *(float *)(bezier_basis0 + lVar149 + 0x910);
    fVar298 = *(float *)(bezier_basis0 + lVar149 + 0x914);
    fVar266 = *(float *)(bezier_basis0 + lVar149 + 0x918);
    fVar301 = *(float *)(bezier_basis0 + lVar149 + 0x91c);
    fVar304 = *(float *)(bezier_basis0 + lVar149 + 0x920);
    auVar136 = *(undefined1 (*) [28])(bezier_basis0 + lVar149 + 0x908);
    auVar205 = vshufps_avx(auVar251,auVar251,0);
    auVar224 = vshufps_avx(auVar251,auVar251,0x55);
    register0x00001290 = auVar224;
    _local_820 = auVar224;
    fVar199 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar149 + 0xd8c);
    fVar218 = *(float *)(bezier_basis0 + lVar149 + 0xd90);
    fVar377 = *(float *)(bezier_basis0 + lVar149 + 0xd94);
    fVar219 = *(float *)(bezier_basis0 + lVar149 + 0xd98);
    fVar269 = *(float *)(bezier_basis0 + lVar149 + 0xd9c);
    fVar275 = *(float *)(bezier_basis0 + lVar149 + 0xda0);
    fVar276 = *(float *)(bezier_basis0 + lVar149 + 0xda4);
    auVar135 = *(undefined1 (*) [28])(bezier_basis0 + lVar149 + 0xd8c);
    fVar277 = *(float *)(bezier_basis0 + lVar149 + 0xda8);
    auVar209 = vshufps_avx(auVar182,auVar182,0);
    register0x00001550 = auVar209;
    _local_4c0 = auVar209;
    fVar325 = auVar209._0_4_;
    fVar303 = auVar209._4_4_;
    fVar339 = auVar209._8_4_;
    fVar341 = auVar209._12_4_;
    fVar308 = auVar205._0_4_;
    fVar315 = auVar205._4_4_;
    fVar316 = auVar205._8_4_;
    fVar317 = auVar205._12_4_;
    auVar205 = vshufps_avx(auVar182,auVar182,0x55);
    register0x00001490 = auVar205;
    _local_740 = auVar205;
    fVar359 = auVar205._0_4_;
    fVar369 = auVar205._4_4_;
    fVar370 = auVar205._8_4_;
    fVar371 = auVar205._12_4_;
    fVar200 = auVar224._0_4_;
    fVar300 = auVar224._4_4_;
    fVar170 = auVar224._8_4_;
    fVar172 = auVar224._12_4_;
    auVar205 = vshufps_avx(auVar35,auVar35,0xff);
    register0x000015d0 = auVar205;
    _local_a0 = auVar205;
    auVar224 = vshufps_avx(auVar401,auVar401,0xff);
    register0x00001590 = auVar224;
    _local_c0 = auVar224;
    fVar263 = auVar224._0_4_;
    fVar265 = auVar224._4_4_;
    fVar306 = auVar224._8_4_;
    fVar179 = auVar224._12_4_;
    fVar198 = auVar205._0_4_;
    fVar282 = auVar205._4_4_;
    fVar291 = auVar205._8_4_;
    auVar130._8_4_ = auVar250._8_4_;
    auVar130._0_8_ = auVar250._0_8_;
    auVar130._12_4_ = auVar250._12_4_;
    auVar224 = vshufps_avx(auVar130,auVar130,0);
    local_7e0._16_16_ = auVar224;
    local_7e0._0_16_ = auVar224;
    fVar378 = *(float *)(bezier_basis0 + lVar149 + 0x484);
    fVar237 = *(float *)(bezier_basis0 + lVar149 + 0x488);
    fVar380 = *(float *)(bezier_basis0 + lVar149 + 0x48c);
    fVar379 = *(float *)(bezier_basis0 + lVar149 + 0x490);
    fStack_530 = *(float *)(bezier_basis0 + lVar149 + 0x494);
    fStack_52c = *(float *)(bezier_basis0 + lVar149 + 0x498);
    fStack_528 = *(float *)(bezier_basis0 + lVar149 + 0x49c);
    fStack_524 = *(float *)(bezier_basis0 + lVar149 + 0x4a0);
    fVar178 = auVar224._0_4_;
    fVar268 = auVar224._4_4_;
    fVar240 = auVar224._8_4_;
    fVar242 = auVar224._12_4_;
    auVar224 = vshufps_avx(auVar130,auVar130,0x55);
    register0x00001210 = auVar224;
    _local_7c0 = auVar224;
    fVar245 = auVar224._0_4_;
    fVar262 = auVar224._4_4_;
    fVar244 = auVar224._8_4_;
    fVar267 = auVar224._12_4_;
    auVar224 = vshufps_avx(auVar382,auVar382,0xff);
    register0x00001350 = auVar224;
    _local_2a0 = auVar224;
    fVar281 = auVar224._0_4_;
    fVar290 = auVar224._4_4_;
    fVar264 = auVar224._8_4_;
    auVar209 = vshufps_avx(auVar249,auVar249,0);
    register0x00001310 = auVar209;
    _local_420 = auVar209;
    fVar278 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar149);
    fVar279 = *(float *)(bezier_basis0 + lVar149 + 4);
    fVar280 = *(float *)(bezier_basis0 + lVar149 + 8);
    fVar326 = *(float *)(bezier_basis0 + lVar149 + 0xc);
    fVar294 = *(float *)(bezier_basis0 + lVar149 + 0x10);
    fVar319 = *(float *)(bezier_basis0 + lVar149 + 0x14);
    fVar337 = *(float *)(bezier_basis0 + lVar149 + 0x18);
    auVar137 = *(undefined1 (*) [28])(bezier_basis0 + lVar149);
    fVar175 = auVar209._0_4_;
    fVar176 = auVar209._4_4_;
    fVar177 = auVar209._8_4_;
    fVar150 = auVar209._12_4_;
    auVar331._0_4_ = fVar175 * fVar278 + fVar178 * fVar378 + fVar308 * fVar260 + fVar325 * fVar199;
    auVar331._4_4_ = fVar176 * fVar279 + fVar268 * fVar237 + fVar315 * fVar292 + fVar303 * fVar218;
    auVar331._8_4_ = fVar177 * fVar280 + fVar240 * fVar380 + fVar316 * fVar295 + fVar339 * fVar377;
    auVar331._12_4_ = fVar150 * fVar326 + fVar242 * fVar379 + fVar317 * fVar298 + fVar341 * fVar219;
    auVar331._16_4_ =
         fVar175 * fVar294 + fVar178 * fStack_530 + fVar308 * fVar266 + fVar325 * fVar269;
    auVar331._20_4_ =
         fVar176 * fVar319 + fVar268 * fStack_52c + fVar315 * fVar301 + fVar303 * fVar275;
    auVar331._24_4_ =
         fVar177 * fVar337 + fVar240 * fStack_528 + fVar316 * fVar304 + fVar339 * fVar276;
    auVar331._28_4_ = fVar277 + 0.0;
    auVar209 = vshufps_avx(auVar249,auVar249,0x55);
    auVar227._16_16_ = auVar209;
    auVar227._0_16_ = auVar209;
    fVar220 = auVar209._0_4_;
    fVar235 = auVar209._4_4_;
    fVar236 = auVar209._8_4_;
    fVar238 = auVar209._12_4_;
    auVar386._0_4_ = fVar220 * fVar278 + fVar378 * fVar245 + fVar200 * fVar260 + fVar359 * fVar199;
    auVar386._4_4_ = fVar235 * fVar279 + fVar237 * fVar262 + fVar300 * fVar292 + fVar369 * fVar218;
    auVar386._8_4_ = fVar236 * fVar280 + fVar380 * fVar244 + fVar170 * fVar295 + fVar370 * fVar377;
    auVar386._12_4_ = fVar238 * fVar326 + fVar379 * fVar267 + fVar172 * fVar298 + fVar371 * fVar219;
    auVar386._16_4_ =
         fVar220 * fVar294 + fStack_530 * fVar245 + fVar200 * fVar266 + fVar359 * fVar269;
    auVar386._20_4_ =
         fVar235 * fVar319 + fStack_52c * fVar262 + fVar300 * fVar301 + fVar369 * fVar275;
    auVar386._24_4_ =
         fVar236 * fVar337 + fStack_528 * fVar244 + fVar170 * fVar304 + fVar370 * fVar276;
    auVar386._28_4_ = fVar238 + fVar267 + fVar172 + 0.0;
    auVar209 = vpermilps_avx(auVar248,0xff);
    register0x00001450 = auVar209;
    _local_2c0 = auVar209;
    fVar171 = auVar209._0_4_;
    fVar173 = auVar209._4_4_;
    fVar174 = auVar209._8_4_;
    local_980._0_4_ = fVar171 * fVar278 + fVar378 * fVar281 + fVar198 * fVar260 + fVar263 * fVar199;
    local_980._4_4_ = fVar173 * fVar279 + fVar237 * fVar290 + fVar282 * fVar292 + fVar265 * fVar218;
    fStack_978 = fVar174 * fVar280 + fVar380 * fVar264 + fVar291 * fVar295 + fVar306 * fVar377;
    fStack_974 = auVar209._12_4_ * fVar326 +
                 fVar379 * auVar224._12_4_ + auVar205._12_4_ * fVar298 + fVar179 * fVar219;
    fStack_970 = fVar171 * fVar294 + fStack_530 * fVar281 + fVar198 * fVar266 + fVar263 * fVar269;
    fStack_96c = fVar173 * fVar319 + fStack_52c * fVar290 + fVar282 * fVar301 + fVar265 * fVar275;
    fStack_968 = fVar174 * fVar337 + fStack_528 * fVar264 + fVar291 * fVar304 + fVar306 * fVar276;
    fStack_964 = *(float *)(bezier_basis0 + lVar149 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar326 = *(float *)(bezier_basis1 + lVar149 + 0x908);
    fVar294 = *(float *)(bezier_basis1 + lVar149 + 0x90c);
    fVar319 = *(float *)(bezier_basis1 + lVar149 + 0x910);
    fVar337 = *(float *)(bezier_basis1 + lVar149 + 0x914);
    fVar338 = *(float *)(bezier_basis1 + lVar149 + 0x918);
    fVar239 = *(float *)(bezier_basis1 + lVar149 + 0x91c);
    fVar321 = *(float *)(bezier_basis1 + lVar149 + 0x920);
    fVar295 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar149 + 0xd8c);
    fVar266 = *(float *)(bezier_basis1 + lVar149 + 0xd90);
    fVar301 = *(float *)(bezier_basis1 + lVar149 + 0xd94);
    fVar199 = *(float *)(bezier_basis1 + lVar149 + 0xd98);
    fVar218 = *(float *)(bezier_basis1 + lVar149 + 0xd9c);
    fVar219 = *(float *)(bezier_basis1 + lVar149 + 0xda0);
    fVar269 = *(float *)(bezier_basis1 + lVar149 + 0xda4);
    auVar138 = *(undefined1 (*) [28])(bezier_basis1 + lVar149 + 0xd8c);
    auVar28 = *(undefined1 (*) [32])(bezier_basis1 + lVar149 + 0x484);
    auVar289 = ZEXT3264(auVar28);
    fVar260 = auVar28._0_4_;
    fVar292 = auVar28._4_4_;
    fVar298 = auVar28._8_4_;
    fVar304 = auVar28._12_4_;
    fVar377 = auVar28._16_4_;
    fVar275 = auVar28._20_4_;
    fVar278 = auVar28._24_4_;
    fVar280 = fVar371 + fVar238 + fStack_964;
    fVar340 = *(float *)(bezier_basis1 + lVar149);
    fVar297 = *(float *)(bezier_basis1 + lVar149 + 4);
    fVar241 = *(float *)(bezier_basis1 + lVar149 + 8);
    fVar323 = *(float *)(bezier_basis1 + lVar149 + 0xc);
    fVar342 = *(float *)(bezier_basis1 + lVar149 + 0x10);
    fVar343 = *(float *)(bezier_basis1 + lVar149 + 0x14);
    fVar243 = *(float *)(bezier_basis1 + lVar149 + 0x18);
    auVar255._0_4_ = fVar175 * fVar340 + fVar178 * fVar260 + fVar308 * fVar326 + fVar325 * fVar295;
    auVar255._4_4_ = fVar176 * fVar297 + fVar268 * fVar292 + fVar315 * fVar294 + fVar303 * fVar266;
    auVar255._8_4_ = fVar177 * fVar241 + fVar240 * fVar298 + fVar316 * fVar319 + fVar339 * fVar301;
    auVar255._12_4_ = fVar150 * fVar323 + fVar242 * fVar304 + fVar317 * fVar337 + fVar341 * fVar199;
    auVar255._16_4_ = fVar175 * fVar342 + fVar178 * fVar377 + fVar308 * fVar338 + fVar325 * fVar218;
    auVar255._20_4_ = fVar176 * fVar343 + fVar268 * fVar275 + fVar315 * fVar239 + fVar303 * fVar219;
    auVar255._24_4_ = fVar177 * fVar243 + fVar240 * fVar278 + fVar316 * fVar321 + fVar339 * fVar269;
    auVar255._28_4_ = fVar179 + fVar280;
    local_6e0._0_4_ = fVar220 * fVar340 + fVar245 * fVar260 + fVar326 * fVar200 + fVar359 * fVar295;
    local_6e0._4_4_ = fVar235 * fVar297 + fVar262 * fVar292 + fVar294 * fVar300 + fVar369 * fVar266;
    fStack_6d8 = fVar236 * fVar241 + fVar244 * fVar298 + fVar319 * fVar170 + fVar370 * fVar301;
    fStack_6d4 = fVar238 * fVar323 + fVar267 * fVar304 + fVar337 * fVar172 + fVar371 * fVar199;
    auVar228._16_4_ = fVar220 * fVar342 + fVar245 * fVar377 + fVar338 * fVar200 + fVar359 * fVar218;
    auVar228._0_16_ = _local_6e0;
    auVar228._20_4_ = fVar235 * fVar343 + fVar262 * fVar275 + fVar239 * fVar300 + fVar369 * fVar219;
    auVar228._24_4_ = fVar236 * fVar243 + fVar244 * fVar278 + fVar321 * fVar170 + fVar370 * fVar269;
    auVar228._28_4_ = fVar280 + fVar371 + fVar277 + fVar238;
    local_860._0_4_ = fVar281 * fVar260 + fVar198 * fVar326 + fVar263 * fVar295 + fVar171 * fVar340;
    local_860._4_4_ = fVar290 * fVar292 + fVar282 * fVar294 + fVar265 * fVar266 + fVar173 * fVar297;
    local_860._8_4_ = fVar264 * fVar298 + fVar291 * fVar319 + fVar306 * fVar301 + fVar174 * fVar241;
    local_860._12_4_ =
         auVar224._12_4_ * fVar304 + auVar205._12_4_ * fVar337 + fVar179 * fVar199 +
         auVar209._12_4_ * fVar323;
    local_860._16_4_ = fVar281 * fVar377 + fVar198 * fVar338 + fVar263 * fVar218 + fVar171 * fVar342
    ;
    local_860._20_4_ = fVar290 * fVar275 + fVar282 * fVar239 + fVar265 * fVar219 + fVar173 * fVar343
    ;
    local_860._24_4_ = fVar264 * fVar278 + fVar291 * fVar321 + fVar306 * fVar269 + fVar174 * fVar243
    ;
    local_860._28_4_ = fVar371 + fVar317 + fVar277 + fVar280;
    auVar30 = vsubps_avx(auVar255,auVar331);
    auVar31 = vsubps_avx(auVar228,auVar386);
    fVar281 = auVar30._0_4_;
    fVar264 = auVar30._4_4_;
    auVar45._4_4_ = auVar386._4_4_ * fVar264;
    auVar45._0_4_ = auVar386._0_4_ * fVar281;
    fVar266 = auVar30._8_4_;
    auVar45._8_4_ = auVar386._8_4_ * fVar266;
    fVar199 = auVar30._12_4_;
    auVar45._12_4_ = auVar386._12_4_ * fVar199;
    fVar219 = auVar30._16_4_;
    auVar45._16_4_ = auVar386._16_4_ * fVar219;
    fVar276 = auVar30._20_4_;
    auVar45._20_4_ = auVar386._20_4_ * fVar276;
    fVar279 = auVar30._24_4_;
    auVar45._24_4_ = auVar386._24_4_ * fVar279;
    auVar45._28_4_ = fVar280;
    fVar290 = auVar31._0_4_;
    fVar295 = auVar31._4_4_;
    auVar46._4_4_ = auVar331._4_4_ * fVar295;
    auVar46._0_4_ = auVar331._0_4_ * fVar290;
    fVar301 = auVar31._8_4_;
    auVar46._8_4_ = auVar331._8_4_ * fVar301;
    fVar218 = auVar31._12_4_;
    auVar46._12_4_ = auVar331._12_4_ * fVar218;
    fVar269 = auVar31._16_4_;
    auVar46._16_4_ = auVar331._16_4_ * fVar269;
    fVar277 = auVar31._20_4_;
    auVar46._20_4_ = auVar331._20_4_ * fVar277;
    fVar280 = auVar31._24_4_;
    auVar46._24_4_ = auVar331._24_4_ * fVar280;
    auVar46._28_4_ = auVar228._28_4_;
    auVar29 = vsubps_avx(auVar45,auVar46);
    auVar333 = vmaxps_avx(_local_980,local_860);
    auVar47._4_4_ = auVar333._4_4_ * auVar333._4_4_ * (fVar264 * fVar264 + fVar295 * fVar295);
    auVar47._0_4_ = auVar333._0_4_ * auVar333._0_4_ * (fVar281 * fVar281 + fVar290 * fVar290);
    auVar47._8_4_ = auVar333._8_4_ * auVar333._8_4_ * (fVar266 * fVar266 + fVar301 * fVar301);
    auVar47._12_4_ = auVar333._12_4_ * auVar333._12_4_ * (fVar199 * fVar199 + fVar218 * fVar218);
    auVar47._16_4_ = auVar333._16_4_ * auVar333._16_4_ * (fVar219 * fVar219 + fVar269 * fVar269);
    auVar47._20_4_ = auVar333._20_4_ * auVar333._20_4_ * (fVar276 * fVar276 + fVar277 * fVar277);
    auVar47._24_4_ = auVar333._24_4_ * auVar333._24_4_ * (fVar279 * fVar279 + fVar280 * fVar280);
    auVar47._28_4_ = auVar31._28_4_ + auVar228._28_4_;
    auVar48._4_4_ = auVar29._4_4_ * auVar29._4_4_;
    auVar48._0_4_ = auVar29._0_4_ * auVar29._0_4_;
    auVar48._8_4_ = auVar29._8_4_ * auVar29._8_4_;
    auVar48._12_4_ = auVar29._12_4_ * auVar29._12_4_;
    auVar48._16_4_ = auVar29._16_4_ * auVar29._16_4_;
    auVar48._20_4_ = auVar29._20_4_ * auVar29._20_4_;
    auVar48._24_4_ = auVar29._24_4_ * auVar29._24_4_;
    auVar48._28_4_ = auVar29._28_4_;
    auVar333 = vcmpps_avx(auVar48,auVar47,2);
    auVar223._0_4_ = (float)(int)uVar20;
    auVar223._4_12_ = auVar224._4_12_;
    local_4e0._0_16_ = auVar223;
    auVar205 = vshufps_avx(auVar223,auVar223,0);
    auVar229._16_16_ = auVar205;
    auVar229._0_16_ = auVar205;
    auVar29 = vcmpps_avx(_DAT_01f7b060,auVar229,1);
    auVar205 = vpermilps_avx(auVar249,0xaa);
    register0x00001450 = auVar205;
    _local_680 = auVar205;
    auVar131._8_4_ = auVar250._8_4_;
    auVar131._0_8_ = auVar250._0_8_;
    auVar131._12_4_ = auVar250._12_4_;
    auVar224 = vpermilps_avx(auVar131,0xaa);
    register0x00001550 = auVar224;
    _local_e0 = auVar224;
    auVar399 = ZEXT3264(_local_e0);
    auVar209 = vpermilps_avx(auVar251,0xaa);
    register0x00001590 = auVar209;
    _local_100 = auVar209;
    auVar207 = vpermilps_avx(auVar182,0xaa);
    register0x00001310 = auVar207;
    _local_120 = auVar207;
    auVar32 = auVar29 & auVar333;
    uVar141 = *(uint *)(ray + k * 4 + 0x60);
    uStack_768 = auVar251._8_8_;
    local_770 = CONCAT44(0,uVar147);
    local_510 = ZEXT416(uVar147);
    uStack_688 = auVar182._8_8_;
    local_690 = CONCAT44(0,uVar143);
    local_500._0_16_ = ZEXT416(uVar143);
    auVar252 = ZEXT416((uint)(auVar252._0_4_ * 4.7683716e-07));
    uStack_928 = auVar248._8_8_;
    uStack_8a8 = auVar382._8_8_;
    local_8c0._0_4_ = auVar35._0_4_;
    fVar266 = (float)local_8c0;
    local_8c0._4_4_ = auVar35._4_4_;
    fVar301 = local_8c0._4_4_;
    uStack_8b8._0_4_ = auVar35._8_4_;
    fVar199 = (float)uStack_8b8;
    uStack_8b8._4_4_ = auVar35._12_4_;
    fVar218 = uStack_8b8._4_4_;
    local_8c0 = auVar35._0_8_;
    uStack_8b8 = auVar35._8_8_;
    uStack_898 = auVar401._8_8_;
    fVar281 = fVar359;
    fVar290 = fVar369;
    fVar264 = fVar370;
    fVar295 = fVar371;
    fVar219 = fVar245;
    fVar269 = fVar262;
    fVar276 = fVar244;
    if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar32 >> 0x7f,0) == '\0') &&
          (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar32 >> 0xbf,0) == '\0') &&
        (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar32[0x1f]) {
      auVar336 = ZEXT3264(auVar330);
      auVar352 = ZEXT3264(local_7e0);
    }
    else {
      local_440 = vandps_avx(auVar333,auVar29);
      fVar179 = auVar205._0_4_;
      fVar198 = auVar205._4_4_;
      fVar282 = auVar205._8_4_;
      fVar291 = auVar205._12_4_;
      fVar296 = auVar224._0_4_;
      fVar299 = auVar224._4_4_;
      fVar302 = auVar224._8_4_;
      fVar305 = auVar224._12_4_;
      fVar307 = auVar209._0_4_;
      fVar318 = auVar209._4_4_;
      fVar320 = auVar209._8_4_;
      fVar322 = auVar209._12_4_;
      local_560._0_4_ = auVar138._0_4_;
      local_560._4_4_ = auVar138._4_4_;
      fStack_558 = auVar138._8_4_;
      fStack_554 = auVar138._12_4_;
      fStack_550 = auVar138._16_4_;
      fStack_54c = auVar138._20_4_;
      fStack_548 = auVar138._24_4_;
      fVar173 = auVar207._0_4_;
      fVar174 = auVar207._4_4_;
      fVar263 = auVar207._8_4_;
      fVar265 = auVar207._12_4_;
      local_560._0_4_ =
           fVar179 * fVar340 +
           fVar296 * fVar260 + fVar307 * fVar326 + fVar173 * (float)local_560._0_4_;
      local_560._4_4_ =
           fVar198 * fVar297 +
           fVar299 * fVar292 + fVar318 * fVar294 + fVar174 * (float)local_560._4_4_;
      fStack_558 = fVar282 * fVar241 + fVar302 * fVar298 + fVar320 * fVar319 + fVar263 * fStack_558;
      fStack_554 = fVar291 * fVar323 + fVar305 * fVar304 + fVar322 * fVar337 + fVar265 * fStack_554;
      fStack_550 = fVar179 * fVar342 + fVar296 * fVar377 + fVar307 * fVar338 + fVar173 * fStack_550;
      fStack_54c = fVar198 * fVar343 + fVar299 * fVar275 + fVar318 * fVar239 + fVar174 * fStack_54c;
      fStack_548 = fVar282 * fVar243 + fVar302 * fVar278 + fVar320 * fVar321 + fVar263 * fStack_548;
      fStack_544 = local_440._28_4_ +
                   auVar29._28_4_ + *(float *)(bezier_basis1 + lVar149 + 0x924) + 0.0;
      local_5a0._0_4_ = auVar137._0_4_;
      local_5a0._4_4_ = auVar137._4_4_;
      fStack_598 = auVar137._8_4_;
      fStack_594 = auVar137._12_4_;
      fStack_590 = auVar137._16_4_;
      fStack_58c = auVar137._20_4_;
      fStack_588 = auVar137._24_4_;
      local_700._0_4_ = auVar136._0_4_;
      local_700._4_4_ = auVar136._4_4_;
      uStack_6f8._0_4_ = auVar136._8_4_;
      uStack_6f8._4_4_ = auVar136._12_4_;
      uStack_6f0._0_4_ = auVar136._16_4_;
      uStack_6f0._4_4_ = auVar136._20_4_;
      uStack_6e8._0_4_ = auVar136._24_4_;
      local_720._0_4_ = auVar135._0_4_;
      local_720._4_4_ = auVar135._4_4_;
      fStack_718 = auVar135._8_4_;
      fStack_714 = auVar135._12_4_;
      fStack_710 = auVar135._16_4_;
      fStack_70c = auVar135._20_4_;
      fStack_708 = auVar135._24_4_;
      local_700._0_4_ =
           fVar179 * (float)local_5a0._0_4_ +
           fVar296 * fVar378 + fVar307 * (float)local_700._0_4_ + fVar173 * (float)local_720._0_4_;
      local_700._4_4_ =
           fVar198 * (float)local_5a0._4_4_ +
           fVar299 * fVar237 + fVar318 * (float)local_700._4_4_ + fVar174 * (float)local_720._4_4_;
      uStack_6f8._0_4_ =
           fVar282 * fStack_598 +
           fVar302 * fVar380 + fVar320 * (float)uStack_6f8 + fVar263 * fStack_718;
      uStack_6f8._4_4_ =
           fVar291 * fStack_594 +
           fVar305 * fVar379 + fVar322 * uStack_6f8._4_4_ + fVar265 * fStack_714;
      uStack_6f0._0_4_ =
           fVar179 * fStack_590 +
           fVar296 * fStack_530 + fVar307 * (float)uStack_6f0 + fVar173 * fStack_710;
      uStack_6f0._4_4_ =
           fVar198 * fStack_58c +
           fVar299 * fStack_52c + fVar318 * uStack_6f0._4_4_ + fVar174 * fStack_70c;
      uStack_6e8._0_4_ =
           fVar282 * fStack_588 +
           fVar302 * fStack_528 + fVar320 * (float)uStack_6e8 + fVar263 * fStack_708;
      uStack_6e8._4_4_ = fVar238 + fStack_544 + local_440._28_4_ + auVar29._28_4_;
      fVar260 = *(float *)(bezier_basis0 + lVar149 + 0x1210);
      fVar292 = *(float *)(bezier_basis0 + lVar149 + 0x1214);
      fVar298 = *(float *)(bezier_basis0 + lVar149 + 0x1218);
      fVar304 = *(float *)(bezier_basis0 + lVar149 + 0x121c);
      fVar377 = *(float *)(bezier_basis0 + lVar149 + 0x1220);
      fVar275 = *(float *)(bezier_basis0 + lVar149 + 0x1224);
      fVar277 = *(float *)(bezier_basis0 + lVar149 + 0x1228);
      fVar278 = *(float *)(bezier_basis0 + lVar149 + 0x1694);
      fVar279 = *(float *)(bezier_basis0 + lVar149 + 0x1698);
      fVar280 = *(float *)(bezier_basis0 + lVar149 + 0x169c);
      fVar378 = *(float *)(bezier_basis0 + lVar149 + 0x16a0);
      fVar237 = *(float *)(bezier_basis0 + lVar149 + 0x16a4);
      fVar380 = *(float *)(bezier_basis0 + lVar149 + 0x16a8);
      fVar379 = *(float *)(bezier_basis0 + lVar149 + 0x16ac);
      fVar326 = *(float *)(bezier_basis0 + lVar149 + 0x1b18);
      fVar294 = *(float *)(bezier_basis0 + lVar149 + 0x1b1c);
      fVar319 = *(float *)(bezier_basis0 + lVar149 + 0x1b20);
      fVar337 = *(float *)(bezier_basis0 + lVar149 + 0x1b24);
      fVar338 = *(float *)(bezier_basis0 + lVar149 + 0x1b28);
      fVar239 = *(float *)(bezier_basis0 + lVar149 + 0x1b2c);
      fVar321 = *(float *)(bezier_basis0 + lVar149 + 0x1b30);
      fVar340 = *(float *)(bezier_basis0 + lVar149 + 0x1f9c);
      fVar297 = *(float *)(bezier_basis0 + lVar149 + 0x1fa0);
      fVar241 = *(float *)(bezier_basis0 + lVar149 + 0x1fa4);
      fVar323 = *(float *)(bezier_basis0 + lVar149 + 0x1fa8);
      fVar342 = *(float *)(bezier_basis0 + lVar149 + 0x1fac);
      fVar343 = *(float *)(bezier_basis0 + lVar149 + 0x1fb0);
      fVar243 = *(float *)(bezier_basis0 + lVar149 + 0x1fb4);
      local_840._16_16_ = auVar161._16_16_;
      local_840._0_16_ = auVar252;
      fVar306 = fVar291 + auVar28._28_4_;
      fVar171 = *(float *)(bezier_basis0 + lVar149 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar149 + 0x1fb8);
      fVar293 = fVar291 + 0.0 + fVar306;
      local_540 = fVar175 * fVar260 + fVar178 * fVar278 + fVar308 * fVar326 + fVar325 * fVar340;
      fStack_53c = fVar176 * fVar292 + fVar268 * fVar279 + fVar315 * fVar294 + fVar303 * fVar297;
      fStack_538 = fVar177 * fVar298 + fVar240 * fVar280 + fVar316 * fVar319 + fVar339 * fVar241;
      fStack_534 = fVar150 * fVar304 + fVar242 * fVar378 + fVar317 * fVar337 + fVar341 * fVar323;
      fStack_530 = fVar175 * fVar377 + fVar178 * fVar237 + fVar308 * fVar338 + fVar325 * fVar342;
      fStack_52c = fVar176 * fVar275 + fVar268 * fVar380 + fVar315 * fVar239 + fVar303 * fVar343;
      fStack_528 = fVar177 * fVar277 + fVar240 * fVar379 + fVar316 * fVar321 + fVar339 * fVar243;
      fStack_524 = *(float *)(bezier_basis0 + lVar149 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar149 + 0x1fb8) + fVar306;
      local_5a0._4_4_ =
           fVar300 * fVar294 + fVar369 * fVar297 + fVar262 * fVar279 + fVar235 * fVar292;
      local_5a0._0_4_ =
           fVar200 * fVar326 + fVar359 * fVar340 + fVar245 * fVar278 + fVar220 * fVar260;
      fStack_598 = fVar170 * fVar319 + fVar370 * fVar241 + fVar244 * fVar280 + fVar236 * fVar298;
      fStack_594 = fVar172 * fVar337 + fVar371 * fVar323 + fVar267 * fVar378 + fVar238 * fVar304;
      fStack_590 = fVar200 * fVar338 + fVar359 * fVar342 + fVar245 * fVar237 + fVar220 * fVar377;
      fStack_58c = fVar300 * fVar239 + fVar369 * fVar343 + fVar262 * fVar380 + fVar235 * fVar275;
      fStack_588 = fVar170 * fVar321 + fVar370 * fVar243 + fVar244 * fVar379 + fVar236 * fVar277;
      fStack_584 = fVar293 + fVar171;
      auVar332._0_4_ = fVar296 * fVar278 + fVar307 * fVar326 + fVar173 * fVar340 + fVar179 * fVar260
      ;
      auVar332._4_4_ = fVar299 * fVar279 + fVar318 * fVar294 + fVar174 * fVar297 + fVar198 * fVar292
      ;
      auVar332._8_4_ = fVar302 * fVar280 + fVar320 * fVar319 + fVar263 * fVar241 + fVar282 * fVar298
      ;
      auVar332._12_4_ =
           fVar305 * fVar378 + fVar322 * fVar337 + fVar265 * fVar323 + fVar291 * fVar304;
      auVar332._16_4_ =
           fVar296 * fVar237 + fVar307 * fVar338 + fVar173 * fVar342 + fVar179 * fVar377;
      auVar332._20_4_ =
           fVar299 * fVar380 + fVar318 * fVar239 + fVar174 * fVar343 + fVar198 * fVar275;
      auVar332._24_4_ =
           fVar302 * fVar379 + fVar320 * fVar321 + fVar263 * fVar243 + fVar282 * fVar277;
      auVar332._28_4_ =
           *(float *)(bezier_basis0 + lVar149 + 0x16b0) + fVar171 +
           *(float *)(bezier_basis0 + lVar149 + 0x122c);
      fVar260 = *(float *)(bezier_basis1 + lVar149 + 0x1b18);
      fVar292 = *(float *)(bezier_basis1 + lVar149 + 0x1b1c);
      fVar298 = *(float *)(bezier_basis1 + lVar149 + 0x1b20);
      fVar304 = *(float *)(bezier_basis1 + lVar149 + 0x1b24);
      fVar377 = *(float *)(bezier_basis1 + lVar149 + 0x1b28);
      fVar275 = *(float *)(bezier_basis1 + lVar149 + 0x1b2c);
      fVar277 = *(float *)(bezier_basis1 + lVar149 + 0x1b30);
      fVar278 = *(float *)(bezier_basis1 + lVar149 + 0x1f9c);
      fVar279 = *(float *)(bezier_basis1 + lVar149 + 0x1fa0);
      fVar280 = *(float *)(bezier_basis1 + lVar149 + 0x1fa4);
      fVar378 = *(float *)(bezier_basis1 + lVar149 + 0x1fa8);
      fVar237 = *(float *)(bezier_basis1 + lVar149 + 0x1fac);
      fVar380 = *(float *)(bezier_basis1 + lVar149 + 0x1fb0);
      fVar379 = *(float *)(bezier_basis1 + lVar149 + 0x1fb4);
      fVar326 = *(float *)(bezier_basis1 + lVar149 + 0x1694);
      fVar294 = *(float *)(bezier_basis1 + lVar149 + 0x1698);
      fVar319 = *(float *)(bezier_basis1 + lVar149 + 0x169c);
      fVar337 = *(float *)(bezier_basis1 + lVar149 + 0x16a0);
      fVar338 = *(float *)(bezier_basis1 + lVar149 + 0x16a4);
      fVar239 = *(float *)(bezier_basis1 + lVar149 + 0x16a8);
      fVar321 = *(float *)(bezier_basis1 + lVar149 + 0x16ac);
      fVar340 = *(float *)(bezier_basis1 + lVar149 + 0x1210);
      fVar297 = *(float *)(bezier_basis1 + lVar149 + 0x1214);
      fVar241 = *(float *)(bezier_basis1 + lVar149 + 0x1218);
      fVar323 = *(float *)(bezier_basis1 + lVar149 + 0x121c);
      fVar342 = *(float *)(bezier_basis1 + lVar149 + 0x1220);
      fVar343 = *(float *)(bezier_basis1 + lVar149 + 0x1224);
      fVar243 = *(float *)(bezier_basis1 + lVar149 + 0x1228);
      auVar312._0_4_ = fVar175 * fVar340 + fVar178 * fVar326 + fVar308 * fVar260 + fVar325 * fVar278
      ;
      auVar312._4_4_ = fVar176 * fVar297 + fVar268 * fVar294 + fVar315 * fVar292 + fVar303 * fVar279
      ;
      auVar312._8_4_ = fVar177 * fVar241 + fVar240 * fVar319 + fVar316 * fVar298 + fVar339 * fVar280
      ;
      auVar312._12_4_ =
           fVar150 * fVar323 + fVar242 * fVar337 + fVar317 * fVar304 + fVar341 * fVar378;
      auVar312._16_4_ =
           fVar175 * fVar342 + fVar178 * fVar338 + fVar308 * fVar377 + fVar325 * fVar237;
      auVar312._20_4_ =
           fVar176 * fVar343 + fVar268 * fVar239 + fVar315 * fVar275 + fVar303 * fVar380;
      auVar312._24_4_ =
           fVar177 * fVar243 + fVar240 * fVar321 + fVar316 * fVar277 + fVar339 * fVar379;
      auVar312._28_4_ = fVar172 + fVar172 + fVar293 + fVar341;
      auVar348._0_4_ = fVar220 * fVar340 + fVar245 * fVar326 + fVar200 * fVar260 + fVar359 * fVar278
      ;
      auVar348._4_4_ = fVar235 * fVar297 + fVar262 * fVar294 + fVar300 * fVar292 + fVar369 * fVar279
      ;
      auVar348._8_4_ = fVar236 * fVar241 + fVar244 * fVar319 + fVar170 * fVar298 + fVar370 * fVar280
      ;
      auVar348._12_4_ =
           fVar238 * fVar323 + fVar267 * fVar337 + fVar172 * fVar304 + fVar371 * fVar378;
      auVar348._16_4_ =
           fVar220 * fVar342 + fVar245 * fVar338 + fVar200 * fVar377 + fVar359 * fVar237;
      auVar348._20_4_ =
           fVar235 * fVar343 + fVar262 * fVar239 + fVar300 * fVar275 + fVar369 * fVar380;
      auVar348._24_4_ =
           fVar236 * fVar243 + fVar244 * fVar321 + fVar170 * fVar277 + fVar370 * fVar379;
      auVar348._28_4_ = fVar172 + fVar172 + fVar172 + fVar293;
      auVar214._0_4_ = fVar179 * fVar340 + fVar296 * fVar326 + fVar307 * fVar260 + fVar173 * fVar278
      ;
      auVar214._4_4_ = fVar198 * fVar297 + fVar299 * fVar294 + fVar318 * fVar292 + fVar174 * fVar279
      ;
      auVar214._8_4_ = fVar282 * fVar241 + fVar302 * fVar319 + fVar320 * fVar298 + fVar263 * fVar280
      ;
      auVar214._12_4_ =
           fVar291 * fVar323 + fVar305 * fVar337 + fVar322 * fVar304 + fVar265 * fVar378;
      auVar214._16_4_ =
           fVar179 * fVar342 + fVar296 * fVar338 + fVar307 * fVar377 + fVar173 * fVar237;
      auVar214._20_4_ =
           fVar198 * fVar343 + fVar299 * fVar239 + fVar318 * fVar275 + fVar174 * fVar380;
      auVar214._24_4_ =
           fVar282 * fVar243 + fVar302 * fVar321 + fVar320 * fVar277 + fVar263 * fVar379;
      auVar214._28_4_ =
           *(float *)(bezier_basis1 + lVar149 + 0x122c) +
           *(float *)(bezier_basis1 + lVar149 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar149 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar149 + 0x1fb8);
      auVar256._8_4_ = 0x7fffffff;
      auVar256._0_8_ = 0x7fffffff7fffffff;
      auVar256._12_4_ = 0x7fffffff;
      auVar256._16_4_ = 0x7fffffff;
      auVar256._20_4_ = 0x7fffffff;
      auVar256._24_4_ = 0x7fffffff;
      auVar256._28_4_ = 0x7fffffff;
      auVar134._4_4_ = fStack_53c;
      auVar134._0_4_ = local_540;
      auVar134._8_4_ = fStack_538;
      auVar134._12_4_ = fStack_534;
      auVar134._16_4_ = fStack_530;
      auVar134._20_4_ = fStack_52c;
      auVar134._24_4_ = fStack_528;
      auVar134._28_4_ = fStack_524;
      auVar161 = vandps_avx(auVar134,auVar256);
      auVar28 = vandps_avx(_local_5a0,auVar256);
      auVar28 = vmaxps_avx(auVar161,auVar28);
      auVar161 = vandps_avx(auVar332,auVar256);
      auVar161 = vmaxps_avx(auVar28,auVar161);
      auVar205 = vpermilps_avx(auVar252,0);
      auVar284._16_16_ = auVar205;
      auVar284._0_16_ = auVar205;
      auVar161 = vcmpps_avx(auVar161,auVar284,1);
      auVar333 = vblendvps_avx(auVar134,auVar30,auVar161);
      auVar29 = vblendvps_avx(_local_5a0,auVar31,auVar161);
      auVar161 = vandps_avx(auVar312,auVar256);
      auVar28 = vandps_avx(auVar348,auVar256);
      auVar32 = vmaxps_avx(auVar161,auVar28);
      auVar161 = vandps_avx(auVar214,auVar256);
      auVar161 = vmaxps_avx(auVar32,auVar161);
      auVar32 = vcmpps_avx(auVar161,auVar284,1);
      auVar161 = vblendvps_avx(auVar312,auVar30,auVar32);
      auVar30 = vblendvps_avx(auVar348,auVar31,auVar32);
      fVar300 = auVar333._0_4_;
      fVar170 = auVar333._4_4_;
      fVar172 = auVar333._8_4_;
      fVar175 = auVar333._12_4_;
      fVar176 = auVar333._16_4_;
      fVar177 = auVar333._20_4_;
      fVar150 = auVar333._24_4_;
      fVar171 = auVar161._0_4_;
      fVar173 = auVar161._4_4_;
      fVar174 = auVar161._8_4_;
      fVar178 = auVar161._12_4_;
      fVar268 = auVar161._16_4_;
      fVar240 = auVar161._20_4_;
      fVar242 = auVar161._24_4_;
      fVar325 = -auVar161._28_4_;
      fVar260 = auVar29._0_4_;
      fVar377 = auVar29._4_4_;
      fVar279 = auVar29._8_4_;
      fVar380 = auVar29._12_4_;
      fVar319 = auVar29._16_4_;
      fVar321 = auVar29._20_4_;
      fVar323 = auVar29._24_4_;
      auVar157._0_4_ = fVar260 * fVar260 + fVar300 * fVar300;
      auVar157._4_4_ = fVar377 * fVar377 + fVar170 * fVar170;
      auVar157._8_4_ = fVar279 * fVar279 + fVar172 * fVar172;
      auVar157._12_4_ = fVar380 * fVar380 + fVar175 * fVar175;
      auVar157._16_4_ = fVar319 * fVar319 + fVar176 * fVar176;
      auVar157._20_4_ = fVar321 * fVar321 + fVar177 * fVar177;
      auVar157._24_4_ = fVar323 * fVar323 + fVar150 * fVar150;
      auVar157._28_4_ = auVar348._28_4_ + auVar333._28_4_;
      auVar333 = vrsqrtps_avx(auVar157);
      fVar292 = auVar333._0_4_;
      fVar298 = auVar333._4_4_;
      auVar49._4_4_ = fVar298 * 1.5;
      auVar49._0_4_ = fVar292 * 1.5;
      fVar304 = auVar333._8_4_;
      auVar49._8_4_ = fVar304 * 1.5;
      fVar275 = auVar333._12_4_;
      auVar49._12_4_ = fVar275 * 1.5;
      fVar277 = auVar333._16_4_;
      auVar49._16_4_ = fVar277 * 1.5;
      fVar278 = auVar333._20_4_;
      auVar49._20_4_ = fVar278 * 1.5;
      fVar280 = auVar333._24_4_;
      fVar200 = auVar28._28_4_;
      auVar49._24_4_ = fVar280 * 1.5;
      auVar49._28_4_ = fVar200;
      auVar50._4_4_ = fVar298 * fVar298 * fVar298 * auVar157._4_4_ * 0.5;
      auVar50._0_4_ = fVar292 * fVar292 * fVar292 * auVar157._0_4_ * 0.5;
      auVar50._8_4_ = fVar304 * fVar304 * fVar304 * auVar157._8_4_ * 0.5;
      auVar50._12_4_ = fVar275 * fVar275 * fVar275 * auVar157._12_4_ * 0.5;
      auVar50._16_4_ = fVar277 * fVar277 * fVar277 * auVar157._16_4_ * 0.5;
      auVar50._20_4_ = fVar278 * fVar278 * fVar278 * auVar157._20_4_ * 0.5;
      auVar50._24_4_ = fVar280 * fVar280 * fVar280 * auVar157._24_4_ * 0.5;
      auVar50._28_4_ = auVar157._28_4_;
      auVar28 = vsubps_avx(auVar49,auVar50);
      fVar292 = auVar28._0_4_;
      fVar275 = auVar28._4_4_;
      fVar280 = auVar28._8_4_;
      fVar379 = auVar28._12_4_;
      fVar337 = auVar28._16_4_;
      fVar340 = auVar28._20_4_;
      fVar342 = auVar28._24_4_;
      fVar298 = auVar30._0_4_;
      fVar277 = auVar30._4_4_;
      fVar378 = auVar30._8_4_;
      fVar326 = auVar30._12_4_;
      fVar338 = auVar30._16_4_;
      fVar297 = auVar30._20_4_;
      fVar343 = auVar30._24_4_;
      auVar158._0_4_ = fVar298 * fVar298 + fVar171 * fVar171;
      auVar158._4_4_ = fVar277 * fVar277 + fVar173 * fVar173;
      auVar158._8_4_ = fVar378 * fVar378 + fVar174 * fVar174;
      auVar158._12_4_ = fVar326 * fVar326 + fVar178 * fVar178;
      auVar158._16_4_ = fVar338 * fVar338 + fVar268 * fVar268;
      auVar158._20_4_ = fVar297 * fVar297 + fVar240 * fVar240;
      auVar158._24_4_ = fVar343 * fVar343 + fVar242 * fVar242;
      auVar158._28_4_ = auVar161._28_4_ + auVar28._28_4_;
      auVar161 = vrsqrtps_avx(auVar158);
      fVar304 = auVar161._0_4_;
      fVar278 = auVar161._4_4_;
      auVar51._4_4_ = fVar278 * 1.5;
      auVar51._0_4_ = fVar304 * 1.5;
      fVar237 = auVar161._8_4_;
      auVar51._8_4_ = fVar237 * 1.5;
      fVar294 = auVar161._12_4_;
      auVar51._12_4_ = fVar294 * 1.5;
      fVar239 = auVar161._16_4_;
      auVar51._16_4_ = fVar239 * 1.5;
      fVar241 = auVar161._20_4_;
      auVar51._20_4_ = fVar241 * 1.5;
      fVar243 = auVar161._24_4_;
      auVar51._24_4_ = fVar243 * 1.5;
      auVar51._28_4_ = fVar200;
      auVar52._4_4_ = fVar278 * fVar278 * fVar278 * auVar158._4_4_ * 0.5;
      auVar52._0_4_ = fVar304 * fVar304 * fVar304 * auVar158._0_4_ * 0.5;
      auVar52._8_4_ = fVar237 * fVar237 * fVar237 * auVar158._8_4_ * 0.5;
      auVar52._12_4_ = fVar294 * fVar294 * fVar294 * auVar158._12_4_ * 0.5;
      auVar52._16_4_ = fVar239 * fVar239 * fVar239 * auVar158._16_4_ * 0.5;
      auVar52._20_4_ = fVar241 * fVar241 * fVar241 * auVar158._20_4_ * 0.5;
      auVar52._24_4_ = fVar243 * fVar243 * fVar243 * auVar158._24_4_ * 0.5;
      auVar52._28_4_ = auVar158._28_4_;
      auVar161 = vsubps_avx(auVar51,auVar52);
      fVar304 = auVar161._0_4_;
      fVar278 = auVar161._4_4_;
      fVar237 = auVar161._8_4_;
      fVar294 = auVar161._12_4_;
      fVar239 = auVar161._16_4_;
      fVar241 = auVar161._20_4_;
      fVar243 = auVar161._24_4_;
      fVar260 = (float)local_980._0_4_ * fVar260 * fVar292;
      fVar377 = (float)local_980._4_4_ * fVar377 * fVar275;
      auVar53._4_4_ = fVar377;
      auVar53._0_4_ = fVar260;
      fVar279 = fStack_978 * fVar279 * fVar280;
      auVar53._8_4_ = fVar279;
      fVar380 = fStack_974 * fVar380 * fVar379;
      auVar53._12_4_ = fVar380;
      fVar319 = fStack_970 * fVar319 * fVar337;
      auVar53._16_4_ = fVar319;
      fVar321 = fStack_96c * fVar321 * fVar340;
      auVar53._20_4_ = fVar321;
      fVar323 = fStack_968 * fVar323 * fVar342;
      auVar53._24_4_ = fVar323;
      auVar53._28_4_ = fVar325;
      local_720._4_4_ = auVar331._4_4_ + fVar377;
      local_720._0_4_ = auVar331._0_4_ + fVar260;
      fStack_718 = auVar331._8_4_ + fVar279;
      fStack_714 = auVar331._12_4_ + fVar380;
      fStack_710 = auVar331._16_4_ + fVar319;
      fStack_70c = auVar331._20_4_ + fVar321;
      fStack_708 = auVar331._24_4_ + fVar323;
      fStack_704 = auVar331._28_4_ + fVar325;
      fVar260 = (float)local_980._0_4_ * fVar292 * -fVar300;
      fVar377 = (float)local_980._4_4_ * fVar275 * -fVar170;
      auVar54._4_4_ = fVar377;
      auVar54._0_4_ = fVar260;
      fVar279 = fStack_978 * fVar280 * -fVar172;
      auVar54._8_4_ = fVar279;
      fVar380 = fStack_974 * fVar379 * -fVar175;
      auVar54._12_4_ = fVar380;
      fVar319 = fStack_970 * fVar337 * -fVar176;
      auVar54._16_4_ = fVar319;
      fVar321 = fStack_96c * fVar340 * -fVar177;
      auVar54._20_4_ = fVar321;
      fVar323 = fStack_968 * fVar342 * -fVar150;
      auVar54._24_4_ = fVar323;
      auVar54._28_4_ = fVar200;
      local_660._4_4_ = fVar377 + auVar386._4_4_;
      local_660._0_4_ = fVar260 + auVar386._0_4_;
      fStack_658 = fVar279 + auVar386._8_4_;
      fStack_654 = fVar380 + auVar386._12_4_;
      fStack_650 = fVar319 + auVar386._16_4_;
      fStack_64c = fVar321 + auVar386._20_4_;
      fStack_648 = fVar323 + auVar386._24_4_;
      fStack_644 = fVar200 + auVar386._28_4_;
      fVar260 = fVar292 * 0.0 * (float)local_980._0_4_;
      fVar292 = fVar275 * 0.0 * (float)local_980._4_4_;
      auVar55._4_4_ = fVar292;
      auVar55._0_4_ = fVar260;
      fVar377 = fVar280 * 0.0 * fStack_978;
      auVar55._8_4_ = fVar377;
      fVar275 = fVar379 * 0.0 * fStack_974;
      auVar55._12_4_ = fVar275;
      fVar279 = fVar337 * 0.0 * fStack_970;
      auVar55._16_4_ = fVar279;
      fVar280 = fVar340 * 0.0 * fStack_96c;
      auVar55._20_4_ = fVar280;
      fVar380 = fVar342 * 0.0 * fStack_968;
      auVar55._24_4_ = fVar380;
      auVar55._28_4_ = fVar267;
      auVar285._0_4_ = fVar260 + (float)local_700._0_4_;
      auVar285._4_4_ = fVar292 + (float)local_700._4_4_;
      auVar285._8_4_ = fVar377 + (float)uStack_6f8;
      auVar285._12_4_ = fVar275 + uStack_6f8._4_4_;
      auVar285._16_4_ = fVar279 + (float)uStack_6f0;
      auVar285._20_4_ = fVar280 + uStack_6f0._4_4_;
      auVar285._24_4_ = fVar380 + (float)uStack_6e8;
      auVar285._28_4_ = fVar267 + uStack_6e8._4_4_;
      fVar260 = local_860._0_4_ * fVar298 * fVar304;
      fVar292 = local_860._4_4_ * fVar277 * fVar278;
      auVar56._4_4_ = fVar292;
      auVar56._0_4_ = fVar260;
      fVar298 = local_860._8_4_ * fVar378 * fVar237;
      auVar56._8_4_ = fVar298;
      fVar377 = local_860._12_4_ * fVar326 * fVar294;
      auVar56._12_4_ = fVar377;
      fVar275 = local_860._16_4_ * fVar338 * fVar239;
      auVar56._16_4_ = fVar275;
      fVar277 = local_860._20_4_ * fVar297 * fVar241;
      auVar56._20_4_ = fVar277;
      fVar279 = local_860._24_4_ * fVar343 * fVar243;
      auVar56._24_4_ = fVar279;
      auVar56._28_4_ = auVar30._28_4_;
      auVar32 = vsubps_avx(auVar331,auVar53);
      auVar349._0_4_ = auVar255._0_4_ + fVar260;
      auVar349._4_4_ = auVar255._4_4_ + fVar292;
      auVar349._8_4_ = auVar255._8_4_ + fVar298;
      auVar349._12_4_ = auVar255._12_4_ + fVar377;
      auVar349._16_4_ = auVar255._16_4_ + fVar275;
      auVar349._20_4_ = auVar255._20_4_ + fVar277;
      auVar349._24_4_ = auVar255._24_4_ + fVar279;
      auVar349._28_4_ = auVar255._28_4_ + auVar30._28_4_;
      fVar260 = local_860._0_4_ * fVar304 * -fVar171;
      fVar292 = local_860._4_4_ * fVar278 * -fVar173;
      auVar57._4_4_ = fVar292;
      auVar57._0_4_ = fVar260;
      fVar298 = local_860._8_4_ * fVar237 * -fVar174;
      auVar57._8_4_ = fVar298;
      fVar377 = local_860._12_4_ * fVar294 * -fVar178;
      auVar57._12_4_ = fVar377;
      fVar275 = local_860._16_4_ * fVar239 * -fVar268;
      auVar57._16_4_ = fVar275;
      fVar277 = local_860._20_4_ * fVar241 * -fVar240;
      auVar57._20_4_ = fVar277;
      fVar279 = local_860._24_4_ * fVar243 * -fVar242;
      auVar57._24_4_ = fVar279;
      auVar57._28_4_ = fVar305;
      auVar33 = vsubps_avx(auVar386,auVar54);
      auVar367._0_4_ = (float)local_6e0._0_4_ + fVar260;
      auVar367._4_4_ = (float)local_6e0._4_4_ + fVar292;
      auVar367._8_4_ = fStack_6d8 + fVar298;
      auVar367._12_4_ = fStack_6d4 + fVar377;
      auVar367._16_4_ = auVar228._16_4_ + fVar275;
      auVar367._20_4_ = auVar228._20_4_ + fVar277;
      auVar367._24_4_ = auVar228._24_4_ + fVar279;
      auVar367._28_4_ = auVar228._28_4_ + fVar305;
      fVar260 = local_860._0_4_ * fVar304 * 0.0;
      fVar292 = local_860._4_4_ * fVar278 * 0.0;
      auVar58._4_4_ = fVar292;
      auVar58._0_4_ = fVar260;
      fVar298 = local_860._8_4_ * fVar237 * 0.0;
      auVar58._8_4_ = fVar298;
      fVar304 = local_860._12_4_ * fVar294 * 0.0;
      auVar58._12_4_ = fVar304;
      fVar377 = local_860._16_4_ * fVar239 * 0.0;
      auVar58._16_4_ = fVar377;
      fVar275 = local_860._20_4_ * fVar241 * 0.0;
      auVar58._20_4_ = fVar275;
      fVar277 = local_860._24_4_ * fVar243 * 0.0;
      auVar58._24_4_ = fVar277;
      auVar58._28_4_ = 0x3f000000;
      auVar43 = vsubps_avx(_local_700,auVar55);
      auVar404._0_4_ = fVar260 + (float)local_560._0_4_;
      auVar404._4_4_ = fVar292 + (float)local_560._4_4_;
      auVar404._8_4_ = fVar298 + fStack_558;
      auVar404._12_4_ = fVar304 + fStack_554;
      auVar404._16_4_ = fVar377 + fStack_550;
      auVar404._20_4_ = fVar275 + fStack_54c;
      auVar404._24_4_ = fVar277 + fStack_548;
      auVar404._28_4_ = fStack_544 + 0.5;
      auVar161 = vsubps_avx(auVar255,auVar56);
      auVar28 = vsubps_avx(auVar228,auVar57);
      auVar155 = vsubps_avx(_local_560,auVar58);
      auVar333 = vsubps_avx(auVar367,auVar33);
      auVar29 = vsubps_avx(auVar404,auVar43);
      auVar59._4_4_ = auVar43._4_4_ * auVar333._4_4_;
      auVar59._0_4_ = auVar43._0_4_ * auVar333._0_4_;
      auVar59._8_4_ = auVar43._8_4_ * auVar333._8_4_;
      auVar59._12_4_ = auVar43._12_4_ * auVar333._12_4_;
      auVar59._16_4_ = auVar43._16_4_ * auVar333._16_4_;
      auVar59._20_4_ = auVar43._20_4_ * auVar333._20_4_;
      auVar59._24_4_ = auVar43._24_4_ * auVar333._24_4_;
      auVar59._28_4_ = auVar228._28_4_;
      auVar60._4_4_ = auVar33._4_4_ * auVar29._4_4_;
      auVar60._0_4_ = auVar33._0_4_ * auVar29._0_4_;
      auVar60._8_4_ = auVar33._8_4_ * auVar29._8_4_;
      auVar60._12_4_ = auVar33._12_4_ * auVar29._12_4_;
      auVar60._16_4_ = auVar33._16_4_ * auVar29._16_4_;
      auVar60._20_4_ = auVar33._20_4_ * auVar29._20_4_;
      auVar60._24_4_ = auVar33._24_4_ * auVar29._24_4_;
      auVar60._28_4_ = fStack_544;
      auVar30 = vsubps_avx(auVar60,auVar59);
      auVar61._4_4_ = auVar32._4_4_ * auVar29._4_4_;
      auVar61._0_4_ = auVar32._0_4_ * auVar29._0_4_;
      auVar61._8_4_ = auVar32._8_4_ * auVar29._8_4_;
      auVar61._12_4_ = auVar32._12_4_ * auVar29._12_4_;
      auVar61._16_4_ = auVar32._16_4_ * auVar29._16_4_;
      auVar61._20_4_ = auVar32._20_4_ * auVar29._20_4_;
      auVar61._24_4_ = auVar32._24_4_ * auVar29._24_4_;
      auVar61._28_4_ = auVar29._28_4_;
      auVar31 = vsubps_avx(auVar349,auVar32);
      auVar62._4_4_ = auVar43._4_4_ * auVar31._4_4_;
      auVar62._0_4_ = auVar43._0_4_ * auVar31._0_4_;
      auVar62._8_4_ = auVar43._8_4_ * auVar31._8_4_;
      auVar62._12_4_ = auVar43._12_4_ * auVar31._12_4_;
      auVar62._16_4_ = auVar43._16_4_ * auVar31._16_4_;
      auVar62._20_4_ = auVar43._20_4_ * auVar31._20_4_;
      auVar62._24_4_ = auVar43._24_4_ * auVar31._24_4_;
      auVar62._28_4_ = auVar255._28_4_;
      auVar44 = vsubps_avx(auVar62,auVar61);
      auVar63._4_4_ = auVar31._4_4_ * auVar33._4_4_;
      auVar63._0_4_ = auVar31._0_4_ * auVar33._0_4_;
      auVar63._8_4_ = auVar31._8_4_ * auVar33._8_4_;
      auVar63._12_4_ = auVar31._12_4_ * auVar33._12_4_;
      auVar63._16_4_ = auVar31._16_4_ * auVar33._16_4_;
      auVar63._20_4_ = auVar31._20_4_ * auVar33._20_4_;
      auVar63._24_4_ = auVar31._24_4_ * auVar33._24_4_;
      auVar63._28_4_ = auVar29._28_4_;
      auVar64._4_4_ = auVar32._4_4_ * auVar333._4_4_;
      auVar64._0_4_ = auVar32._0_4_ * auVar333._0_4_;
      auVar64._8_4_ = auVar32._8_4_ * auVar333._8_4_;
      auVar64._12_4_ = auVar32._12_4_ * auVar333._12_4_;
      auVar64._16_4_ = auVar32._16_4_ * auVar333._16_4_;
      auVar64._20_4_ = auVar32._20_4_ * auVar333._20_4_;
      auVar64._24_4_ = auVar32._24_4_ * auVar333._24_4_;
      auVar64._28_4_ = auVar333._28_4_;
      auVar333 = vsubps_avx(auVar64,auVar63);
      auVar159._0_4_ = auVar30._0_4_ * 0.0 + auVar333._0_4_ + auVar44._0_4_ * 0.0;
      auVar159._4_4_ = auVar30._4_4_ * 0.0 + auVar333._4_4_ + auVar44._4_4_ * 0.0;
      auVar159._8_4_ = auVar30._8_4_ * 0.0 + auVar333._8_4_ + auVar44._8_4_ * 0.0;
      auVar159._12_4_ = auVar30._12_4_ * 0.0 + auVar333._12_4_ + auVar44._12_4_ * 0.0;
      auVar159._16_4_ = auVar30._16_4_ * 0.0 + auVar333._16_4_ + auVar44._16_4_ * 0.0;
      auVar159._20_4_ = auVar30._20_4_ * 0.0 + auVar333._20_4_ + auVar44._20_4_ * 0.0;
      auVar159._24_4_ = auVar30._24_4_ * 0.0 + auVar333._24_4_ + auVar44._24_4_ * 0.0;
      auVar159._28_4_ = auVar333._28_4_ + auVar333._28_4_ + auVar44._28_4_;
      auVar44 = vcmpps_avx(auVar159,ZEXT432(0) << 0x20,2);
      auVar161 = vblendvps_avx(auVar161,_local_720,auVar44);
      auVar28 = vblendvps_avx(auVar28,_local_660,auVar44);
      auVar333 = vblendvps_avx(auVar155,auVar285,auVar44);
      auVar289 = ZEXT3264(auVar333);
      auVar29 = vblendvps_avx(auVar32,auVar349,auVar44);
      auVar30 = vblendvps_avx(auVar33,auVar367,auVar44);
      auVar31 = vblendvps_avx(auVar43,auVar404,auVar44);
      auVar32 = vblendvps_avx(auVar349,auVar32,auVar44);
      auVar33 = vblendvps_avx(auVar367,auVar33,auVar44);
      auVar205 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
      auVar43 = vblendvps_avx(auVar404,auVar43,auVar44);
      auVar32 = vsubps_avx(auVar32,auVar161);
      auVar313 = vsubps_avx(auVar33,auVar28);
      auVar43 = vsubps_avx(auVar43,auVar333);
      auVar156 = vsubps_avx(auVar28,auVar30);
      fVar260 = auVar313._0_4_;
      fVar150 = auVar333._0_4_;
      fVar275 = auVar313._4_4_;
      fVar171 = auVar333._4_4_;
      auVar65._4_4_ = fVar171 * fVar275;
      auVar65._0_4_ = fVar150 * fVar260;
      fVar378 = auVar313._8_4_;
      fVar173 = auVar333._8_4_;
      auVar65._8_4_ = fVar173 * fVar378;
      fVar294 = auVar313._12_4_;
      fVar174 = auVar333._12_4_;
      auVar65._12_4_ = fVar174 * fVar294;
      fVar321 = auVar313._16_4_;
      fVar178 = auVar333._16_4_;
      auVar65._16_4_ = fVar178 * fVar321;
      fVar342 = auVar313._20_4_;
      fVar268 = auVar333._20_4_;
      auVar65._20_4_ = fVar268 * fVar342;
      fVar170 = auVar313._24_4_;
      fVar240 = auVar333._24_4_;
      auVar65._24_4_ = fVar240 * fVar170;
      auVar65._28_4_ = auVar33._28_4_;
      fVar292 = auVar28._0_4_;
      fVar306 = auVar43._0_4_;
      fVar277 = auVar28._4_4_;
      fVar179 = auVar43._4_4_;
      auVar66._4_4_ = fVar179 * fVar277;
      auVar66._0_4_ = fVar306 * fVar292;
      fVar237 = auVar28._8_4_;
      fVar198 = auVar43._8_4_;
      auVar66._8_4_ = fVar198 * fVar237;
      fVar319 = auVar28._12_4_;
      fVar282 = auVar43._12_4_;
      auVar66._12_4_ = fVar282 * fVar319;
      fVar340 = auVar28._16_4_;
      fVar291 = auVar43._16_4_;
      auVar66._16_4_ = fVar291 * fVar340;
      fVar343 = auVar28._20_4_;
      fVar293 = auVar43._20_4_;
      auVar66._20_4_ = fVar293 * fVar343;
      fVar172 = auVar28._24_4_;
      fVar296 = auVar43._24_4_;
      uVar8 = auVar155._28_4_;
      auVar66._24_4_ = fVar296 * fVar172;
      auVar66._28_4_ = uVar8;
      auVar28 = vsubps_avx(auVar66,auVar65);
      fVar298 = auVar161._0_4_;
      fVar278 = auVar161._4_4_;
      auVar67._4_4_ = fVar179 * fVar278;
      auVar67._0_4_ = fVar306 * fVar298;
      fVar380 = auVar161._8_4_;
      auVar67._8_4_ = fVar198 * fVar380;
      fVar337 = auVar161._12_4_;
      auVar67._12_4_ = fVar282 * fVar337;
      fVar297 = auVar161._16_4_;
      auVar67._16_4_ = fVar291 * fVar297;
      fVar243 = auVar161._20_4_;
      auVar67._20_4_ = fVar293 * fVar243;
      fVar175 = auVar161._24_4_;
      auVar67._24_4_ = fVar296 * fVar175;
      auVar67._28_4_ = uVar8;
      fVar304 = auVar32._0_4_;
      fVar279 = auVar32._4_4_;
      auVar68._4_4_ = fVar171 * fVar279;
      auVar68._0_4_ = fVar150 * fVar304;
      fVar379 = auVar32._8_4_;
      auVar68._8_4_ = fVar173 * fVar379;
      fVar338 = auVar32._12_4_;
      auVar68._12_4_ = fVar174 * fVar338;
      fVar241 = auVar32._16_4_;
      auVar68._16_4_ = fVar178 * fVar241;
      fVar200 = auVar32._20_4_;
      auVar68._20_4_ = fVar268 * fVar200;
      fVar176 = auVar32._24_4_;
      auVar68._24_4_ = fVar240 * fVar176;
      auVar68._28_4_ = auVar404._28_4_;
      auVar33 = vsubps_avx(auVar68,auVar67);
      auVar69._4_4_ = fVar277 * fVar279;
      auVar69._0_4_ = fVar292 * fVar304;
      auVar69._8_4_ = fVar237 * fVar379;
      auVar69._12_4_ = fVar319 * fVar338;
      auVar69._16_4_ = fVar340 * fVar241;
      auVar69._20_4_ = fVar343 * fVar200;
      auVar69._24_4_ = fVar172 * fVar176;
      auVar69._28_4_ = uVar8;
      auVar408._0_4_ = fVar298 * fVar260;
      auVar408._4_4_ = fVar278 * fVar275;
      auVar408._8_4_ = fVar380 * fVar378;
      auVar408._12_4_ = fVar337 * fVar294;
      auVar408._16_4_ = fVar297 * fVar321;
      auVar408._20_4_ = fVar243 * fVar342;
      auVar408._24_4_ = fVar175 * fVar170;
      auVar408._28_4_ = 0;
      auVar155 = vsubps_avx(auVar408,auVar69);
      auVar185 = vsubps_avx(auVar333,auVar31);
      fVar377 = auVar155._28_4_ + auVar33._28_4_;
      auVar188._0_4_ = auVar155._0_4_ + auVar33._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
      auVar188._4_4_ = auVar155._4_4_ + auVar33._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
      auVar188._8_4_ = auVar155._8_4_ + auVar33._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
      auVar188._12_4_ = auVar155._12_4_ + auVar33._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
      auVar188._16_4_ = auVar155._16_4_ + auVar33._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
      auVar188._20_4_ = auVar155._20_4_ + auVar33._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
      auVar188._24_4_ = auVar155._24_4_ + auVar33._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
      auVar188._28_4_ = fVar377 + auVar28._28_4_;
      fVar242 = auVar156._0_4_;
      fVar325 = auVar156._4_4_;
      auVar70._4_4_ = fVar325 * auVar31._4_4_;
      auVar70._0_4_ = fVar242 * auVar31._0_4_;
      fVar303 = auVar156._8_4_;
      auVar70._8_4_ = fVar303 * auVar31._8_4_;
      fVar339 = auVar156._12_4_;
      auVar70._12_4_ = fVar339 * auVar31._12_4_;
      fVar341 = auVar156._16_4_;
      auVar70._16_4_ = fVar341 * auVar31._16_4_;
      fVar263 = auVar156._20_4_;
      auVar70._20_4_ = fVar263 * auVar31._20_4_;
      fVar265 = auVar156._24_4_;
      auVar70._24_4_ = fVar265 * auVar31._24_4_;
      auVar70._28_4_ = fVar377;
      fVar377 = auVar185._0_4_;
      fVar280 = auVar185._4_4_;
      auVar71._4_4_ = auVar30._4_4_ * fVar280;
      auVar71._0_4_ = auVar30._0_4_ * fVar377;
      fVar326 = auVar185._8_4_;
      auVar71._8_4_ = auVar30._8_4_ * fVar326;
      fVar239 = auVar185._12_4_;
      auVar71._12_4_ = auVar30._12_4_ * fVar239;
      fVar323 = auVar185._16_4_;
      auVar71._16_4_ = auVar30._16_4_ * fVar323;
      fVar300 = auVar185._20_4_;
      auVar71._20_4_ = auVar30._20_4_ * fVar300;
      fVar177 = auVar185._24_4_;
      auVar71._24_4_ = auVar30._24_4_ * fVar177;
      auVar71._28_4_ = auVar155._28_4_;
      auVar33 = vsubps_avx(auVar71,auVar70);
      auVar161 = vsubps_avx(auVar161,auVar29);
      fVar299 = auVar161._0_4_;
      fVar302 = auVar161._4_4_;
      auVar72._4_4_ = fVar302 * auVar31._4_4_;
      auVar72._0_4_ = fVar299 * auVar31._0_4_;
      fVar305 = auVar161._8_4_;
      auVar72._8_4_ = fVar305 * auVar31._8_4_;
      fVar307 = auVar161._12_4_;
      auVar72._12_4_ = fVar307 * auVar31._12_4_;
      fVar318 = auVar161._16_4_;
      auVar72._16_4_ = fVar318 * auVar31._16_4_;
      fVar320 = auVar161._20_4_;
      auVar72._20_4_ = fVar320 * auVar31._20_4_;
      fVar322 = auVar161._24_4_;
      auVar72._24_4_ = fVar322 * auVar31._24_4_;
      auVar72._28_4_ = auVar31._28_4_;
      auVar73._4_4_ = auVar29._4_4_ * fVar280;
      auVar73._0_4_ = auVar29._0_4_ * fVar377;
      auVar73._8_4_ = auVar29._8_4_ * fVar326;
      auVar73._12_4_ = auVar29._12_4_ * fVar239;
      auVar73._16_4_ = auVar29._16_4_ * fVar323;
      auVar73._20_4_ = auVar29._20_4_ * fVar300;
      auVar73._24_4_ = auVar29._24_4_ * fVar177;
      auVar73._28_4_ = auVar28._28_4_;
      auVar161 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = auVar30._4_4_ * fVar302;
      auVar74._0_4_ = auVar30._0_4_ * fVar299;
      auVar74._8_4_ = auVar30._8_4_ * fVar305;
      auVar74._12_4_ = auVar30._12_4_ * fVar307;
      auVar74._16_4_ = auVar30._16_4_ * fVar318;
      auVar74._20_4_ = auVar30._20_4_ * fVar320;
      auVar74._24_4_ = auVar30._24_4_ * fVar322;
      auVar74._28_4_ = auVar31._28_4_;
      auVar75._4_4_ = auVar29._4_4_ * fVar325;
      auVar75._0_4_ = auVar29._0_4_ * fVar242;
      auVar75._8_4_ = auVar29._8_4_ * fVar303;
      auVar75._12_4_ = auVar29._12_4_ * fVar339;
      auVar75._16_4_ = auVar29._16_4_ * fVar341;
      auVar75._20_4_ = auVar29._20_4_ * fVar263;
      auVar75._24_4_ = auVar29._24_4_ * fVar265;
      auVar75._28_4_ = auVar29._28_4_;
      auVar28 = vsubps_avx(auVar75,auVar74);
      auVar257._0_4_ = auVar33._0_4_ * 0.0 + auVar28._0_4_ + auVar161._0_4_ * 0.0;
      auVar257._4_4_ = auVar33._4_4_ * 0.0 + auVar28._4_4_ + auVar161._4_4_ * 0.0;
      auVar257._8_4_ = auVar33._8_4_ * 0.0 + auVar28._8_4_ + auVar161._8_4_ * 0.0;
      auVar257._12_4_ = auVar33._12_4_ * 0.0 + auVar28._12_4_ + auVar161._12_4_ * 0.0;
      auVar257._16_4_ = auVar33._16_4_ * 0.0 + auVar28._16_4_ + auVar161._16_4_ * 0.0;
      auVar257._20_4_ = auVar33._20_4_ * 0.0 + auVar28._20_4_ + auVar161._20_4_ * 0.0;
      auVar257._24_4_ = auVar33._24_4_ * 0.0 + auVar28._24_4_ + auVar161._24_4_ * 0.0;
      auVar257._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar161._28_4_;
      auVar161 = vmaxps_avx(auVar188,auVar257);
      auVar161 = vcmpps_avx(auVar161,ZEXT832(0) << 0x20,2);
      auVar224 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
      auVar205 = vpand_avx(auVar224,auVar205);
      auVar224 = vpmovsxwd_avx(auVar205);
      auVar209 = vpunpckhwd_avx(auVar205,auVar205);
      auVar230._16_16_ = auVar209;
      auVar230._0_16_ = auVar224;
      if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar230 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar230 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar230 >> 0x7f,0) == '\0') &&
            (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar209 >> 0x3f,0) == '\0') &&
          (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar209[0xf]
         ) {
LAB_00b19786:
        auVar197 = ZEXT3264(CONCAT824(uStack_5c8,
                                      CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
        auVar161 = vcmpps_avx(auVar313,auVar313,0xf);
        auVar274 = ZEXT3264(auVar161);
        auVar336 = ZEXT3264(auVar330);
      }
      else {
        auVar76._4_4_ = fVar280 * fVar275;
        auVar76._0_4_ = fVar377 * fVar260;
        auVar76._8_4_ = fVar326 * fVar378;
        auVar76._12_4_ = fVar239 * fVar294;
        auVar76._16_4_ = fVar323 * fVar321;
        auVar76._20_4_ = fVar300 * fVar342;
        auVar76._24_4_ = fVar177 * fVar170;
        auVar76._28_4_ = auVar209._12_4_;
        auVar387._0_4_ = fVar242 * fVar306;
        auVar387._4_4_ = fVar325 * fVar179;
        auVar387._8_4_ = fVar303 * fVar198;
        auVar387._12_4_ = fVar339 * fVar282;
        auVar387._16_4_ = fVar341 * fVar291;
        auVar387._20_4_ = fVar263 * fVar293;
        auVar387._24_4_ = fVar265 * fVar296;
        auVar387._28_4_ = 0;
        auVar161 = vsubps_avx(auVar387,auVar76);
        auVar77._4_4_ = fVar302 * fVar179;
        auVar77._0_4_ = fVar299 * fVar306;
        auVar77._8_4_ = fVar305 * fVar198;
        auVar77._12_4_ = fVar307 * fVar282;
        auVar77._16_4_ = fVar318 * fVar291;
        auVar77._20_4_ = fVar320 * fVar293;
        auVar77._24_4_ = fVar322 * fVar296;
        auVar77._28_4_ = auVar43._28_4_;
        auVar78._4_4_ = fVar280 * fVar279;
        auVar78._0_4_ = fVar377 * fVar304;
        auVar78._8_4_ = fVar326 * fVar379;
        auVar78._12_4_ = fVar239 * fVar338;
        auVar78._16_4_ = fVar323 * fVar241;
        auVar78._20_4_ = fVar300 * fVar200;
        auVar78._24_4_ = fVar177 * fVar176;
        auVar78._28_4_ = auVar185._28_4_;
        auVar28 = vsubps_avx(auVar78,auVar77);
        auVar79._4_4_ = fVar325 * fVar279;
        auVar79._0_4_ = fVar242 * fVar304;
        auVar79._8_4_ = fVar303 * fVar379;
        auVar79._12_4_ = fVar339 * fVar338;
        auVar79._16_4_ = fVar341 * fVar241;
        auVar79._20_4_ = fVar263 * fVar200;
        auVar79._24_4_ = fVar265 * fVar176;
        auVar79._28_4_ = auVar188._28_4_;
        auVar80._4_4_ = fVar302 * fVar275;
        auVar80._0_4_ = fVar299 * fVar260;
        auVar80._8_4_ = fVar305 * fVar378;
        auVar80._12_4_ = fVar307 * fVar294;
        auVar80._16_4_ = fVar318 * fVar321;
        auVar80._20_4_ = fVar320 * fVar342;
        fVar260 = auVar313._28_4_;
        auVar80._24_4_ = fVar322 * fVar170;
        auVar80._28_4_ = fVar260;
        auVar30 = vsubps_avx(auVar80,auVar79);
        auVar313._0_4_ = auVar161._0_4_ * 0.0 + auVar30._0_4_ + auVar28._0_4_ * 0.0;
        auVar313._4_4_ = auVar161._4_4_ * 0.0 + auVar30._4_4_ + auVar28._4_4_ * 0.0;
        auVar313._8_4_ = auVar161._8_4_ * 0.0 + auVar30._8_4_ + auVar28._8_4_ * 0.0;
        auVar313._12_4_ = auVar161._12_4_ * 0.0 + auVar30._12_4_ + auVar28._12_4_ * 0.0;
        auVar313._16_4_ = auVar161._16_4_ * 0.0 + auVar30._16_4_ + auVar28._16_4_ * 0.0;
        auVar313._20_4_ = auVar161._20_4_ * 0.0 + auVar30._20_4_ + auVar28._20_4_ * 0.0;
        auVar313._24_4_ = auVar161._24_4_ * 0.0 + auVar30._24_4_ + auVar28._24_4_ * 0.0;
        auVar313._28_4_ = fVar260 + auVar30._28_4_ + auVar188._28_4_;
        auVar29 = vrcpps_avx(auVar313);
        fVar260 = auVar29._0_4_;
        fVar304 = auVar29._4_4_;
        auVar81._4_4_ = auVar313._4_4_ * fVar304;
        auVar81._0_4_ = auVar313._0_4_ * fVar260;
        fVar377 = auVar29._8_4_;
        auVar81._8_4_ = auVar313._8_4_ * fVar377;
        fVar275 = auVar29._12_4_;
        auVar81._12_4_ = auVar313._12_4_ * fVar275;
        fVar279 = auVar29._16_4_;
        auVar81._16_4_ = auVar313._16_4_ * fVar279;
        fVar280 = auVar29._20_4_;
        auVar81._20_4_ = auVar313._20_4_ * fVar280;
        fVar378 = auVar29._24_4_;
        auVar81._24_4_ = auVar313._24_4_ * fVar378;
        auVar81._28_4_ = auVar185._28_4_;
        auVar388._8_4_ = 0x3f800000;
        auVar388._0_8_ = 0x3f8000003f800000;
        auVar388._12_4_ = 0x3f800000;
        auVar388._16_4_ = 0x3f800000;
        auVar388._20_4_ = 0x3f800000;
        auVar388._24_4_ = 0x3f800000;
        auVar388._28_4_ = 0x3f800000;
        auVar31 = vsubps_avx(auVar388,auVar81);
        fVar260 = auVar31._0_4_ * fVar260 + fVar260;
        fVar304 = auVar31._4_4_ * fVar304 + fVar304;
        fVar377 = auVar31._8_4_ * fVar377 + fVar377;
        fVar275 = auVar31._12_4_ * fVar275 + fVar275;
        fVar279 = auVar31._16_4_ * fVar279 + fVar279;
        fVar280 = auVar31._20_4_ * fVar280 + fVar280;
        fVar378 = auVar31._24_4_ * fVar378 + fVar378;
        auVar82._4_4_ =
             (auVar161._4_4_ * fVar278 + auVar28._4_4_ * fVar277 + auVar30._4_4_ * fVar171) *
             fVar304;
        auVar82._0_4_ =
             (auVar161._0_4_ * fVar298 + auVar28._0_4_ * fVar292 + auVar30._0_4_ * fVar150) *
             fVar260;
        auVar82._8_4_ =
             (auVar161._8_4_ * fVar380 + auVar28._8_4_ * fVar237 + auVar30._8_4_ * fVar173) *
             fVar377;
        auVar82._12_4_ =
             (auVar161._12_4_ * fVar337 + auVar28._12_4_ * fVar319 + auVar30._12_4_ * fVar174) *
             fVar275;
        auVar82._16_4_ =
             (auVar161._16_4_ * fVar297 + auVar28._16_4_ * fVar340 + auVar30._16_4_ * fVar178) *
             fVar279;
        auVar82._20_4_ =
             (auVar161._20_4_ * fVar243 + auVar28._20_4_ * fVar343 + auVar30._20_4_ * fVar268) *
             fVar280;
        auVar82._24_4_ =
             (auVar161._24_4_ * fVar175 + auVar28._24_4_ * fVar172 + auVar30._24_4_ * fVar240) *
             fVar378;
        auVar82._28_4_ = auVar32._28_4_ + auVar333._28_4_;
        auVar224 = vpermilps_avx(ZEXT416(uVar141),0);
        auVar160._16_16_ = auVar224;
        auVar160._0_16_ = auVar224;
        auVar161 = vcmpps_avx(auVar160,auVar82,2);
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar231._4_4_ = uVar8;
        auVar231._0_4_ = uVar8;
        auVar231._8_4_ = uVar8;
        auVar231._12_4_ = uVar8;
        auVar231._16_4_ = uVar8;
        auVar231._20_4_ = uVar8;
        auVar231._24_4_ = uVar8;
        auVar231._28_4_ = uVar8;
        auVar28 = vcmpps_avx(auVar82,auVar231,2);
        auVar161 = vandps_avx(auVar28,auVar161);
        auVar224 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
        auVar205 = vpand_avx(auVar205,auVar224);
        auVar224 = vpmovsxwd_avx(auVar205);
        auVar209 = vpshufd_avx(auVar205,0xee);
        auVar209 = vpmovsxwd_avx(auVar209);
        auVar289 = ZEXT1664(auVar209);
        auVar232._16_16_ = auVar209;
        auVar232._0_16_ = auVar224;
        if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar232 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar232 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar232 >> 0x7f,0) == '\0') &&
              (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar209 >> 0x3f,0) == '\0') &&
            (auVar232 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar209[0xf]) goto LAB_00b19786;
        auVar161 = vcmpps_avx(ZEXT832(0) << 0x20,auVar313,4);
        auVar224 = vpackssdw_avx(auVar161._0_16_,auVar161._16_16_);
        auVar205 = vpand_avx(auVar205,auVar224);
        auVar224 = vpmovsxwd_avx(auVar205);
        auVar205 = vpunpckhwd_avx(auVar205,auVar205);
        auVar286._16_16_ = auVar205;
        auVar286._0_16_ = auVar224;
        auVar289 = ZEXT3264(auVar286);
        auVar197 = ZEXT3264(CONCAT824(uStack_5c8,
                                      CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
        auVar161 = vcmpps_avx(auVar313,auVar313,0xf);
        auVar274 = ZEXT3264(auVar161);
        auVar336 = ZEXT3264(auVar330);
        if ((((((((auVar286 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar286 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar286 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar286 >> 0x7f,0) != '\0') ||
              (auVar286 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar205 >> 0x3f,0) != '\0') ||
            (auVar286 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar205[0xf] < '\0') {
          auVar83._4_4_ = auVar188._4_4_ * fVar304;
          auVar83._0_4_ = auVar188._0_4_ * fVar260;
          auVar83._8_4_ = auVar188._8_4_ * fVar377;
          auVar83._12_4_ = auVar188._12_4_ * fVar275;
          auVar83._16_4_ = auVar188._16_4_ * fVar279;
          auVar83._20_4_ = auVar188._20_4_ * fVar280;
          auVar83._24_4_ = auVar188._24_4_ * fVar378;
          auVar83._28_4_ = SUB84(uStack_5c8,4);
          auVar84._4_4_ = auVar257._4_4_ * fVar304;
          auVar84._0_4_ = auVar257._0_4_ * fVar260;
          auVar84._8_4_ = auVar257._8_4_ * fVar377;
          auVar84._12_4_ = auVar257._12_4_ * fVar275;
          auVar84._16_4_ = auVar257._16_4_ * fVar279;
          auVar84._20_4_ = auVar257._20_4_ * fVar280;
          auVar84._24_4_ = auVar257._24_4_ * fVar378;
          auVar84._28_4_ = auVar31._28_4_ + auVar29._28_4_;
          auVar258._8_4_ = 0x3f800000;
          auVar258._0_8_ = 0x3f8000003f800000;
          auVar258._12_4_ = 0x3f800000;
          auVar258._16_4_ = 0x3f800000;
          auVar258._20_4_ = 0x3f800000;
          auVar258._24_4_ = 0x3f800000;
          auVar258._28_4_ = 0x3f800000;
          auVar161 = vsubps_avx(auVar258,auVar83);
          auVar161 = vblendvps_avx(auVar161,auVar83,auVar44);
          auVar336 = ZEXT3264(auVar161);
          auVar161 = vsubps_avx(auVar258,auVar84);
          _local_480 = vblendvps_avx(auVar161,auVar84,auVar44);
          auVar197 = ZEXT3264(auVar286);
          local_460 = auVar82;
        }
      }
      auVar399 = ZEXT3264(local_860);
      auVar352 = ZEXT3264(local_7e0);
      auVar161 = auVar197._0_32_;
      if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar161 >> 0x7f,0) != '\0') ||
            (auVar197 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar161 >> 0xbf,0) != '\0') ||
          (auVar197 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar197[0x1f] < '\0') {
        auVar330 = vsubps_avx(local_860,_local_980);
        local_980._0_4_ = (float)local_980._0_4_ + auVar336._0_4_ * auVar330._0_4_;
        local_980._4_4_ = (float)local_980._4_4_ + auVar336._4_4_ * auVar330._4_4_;
        fStack_978 = fStack_978 + auVar336._8_4_ * auVar330._8_4_;
        fStack_974 = fStack_974 + auVar336._12_4_ * auVar330._12_4_;
        fStack_970 = fStack_970 + auVar336._16_4_ * auVar330._16_4_;
        fStack_96c = fStack_96c + auVar336._20_4_ * auVar330._20_4_;
        fStack_968 = fStack_968 + auVar336._24_4_ * auVar330._24_4_;
        fStack_964 = fStack_964 + auVar330._28_4_;
        fVar260 = *(float *)((long)local_748->ray_space + k * 4 + -0x20);
        auVar85._4_4_ = ((float)local_980._4_4_ + (float)local_980._4_4_) * fVar260;
        auVar85._0_4_ = ((float)local_980._0_4_ + (float)local_980._0_4_) * fVar260;
        auVar85._8_4_ = (fStack_978 + fStack_978) * fVar260;
        auVar85._12_4_ = (fStack_974 + fStack_974) * fVar260;
        auVar85._16_4_ = (fStack_970 + fStack_970) * fVar260;
        auVar85._20_4_ = (fStack_96c + fStack_96c) * fVar260;
        auVar85._24_4_ = (fStack_968 + fStack_968) * fVar260;
        auVar85._28_4_ = fStack_964 + fStack_964;
        auVar330 = vcmpps_avx(local_460,auVar85,6);
        auVar28 = auVar161 & auVar330;
        if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0x7f,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0xbf,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar28[0x1f]) goto LAB_00b182e1;
        local_3e0 = (float)local_480._0_4_ + (float)local_480._0_4_ + -1.0;
        fStack_3dc = (float)local_480._4_4_ + (float)local_480._4_4_ + -1.0;
        fStack_3d8 = (float)uStack_478 + (float)uStack_478 + -1.0;
        fStack_3d4 = uStack_478._4_4_ + uStack_478._4_4_ + -1.0;
        fStack_3d0 = (float)uStack_470 + (float)uStack_470 + -1.0;
        fStack_3cc = uStack_470._4_4_ + uStack_470._4_4_ + -1.0;
        fStack_3c8 = (float)uStack_468 + (float)uStack_468 + -1.0;
        fStack_3c4 = uStack_468._4_4_ + uStack_468._4_4_ + -1.0;
        auVar333 = auVar336._0_32_;
        local_480._4_4_ = fStack_3dc;
        local_480._0_4_ = local_3e0;
        uStack_478._0_4_ = fStack_3d8;
        uStack_478._4_4_ = fStack_3d4;
        uStack_470._0_4_ = fStack_3d0;
        uStack_470._4_4_ = fStack_3cc;
        auVar140 = _local_480;
        uStack_468._0_4_ = fStack_3c8;
        uStack_468._4_4_ = fStack_3c4;
        auVar28 = _local_480;
        local_3c0 = local_460;
        local_3a0 = 0;
        uStack_388 = uStack_928;
        uStack_378 = uStack_8a8;
        local_370 = local_8c0;
        uStack_368 = uStack_8b8;
        uStack_358 = uStack_898;
        _local_480 = auVar28;
        if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          local_620 = vandps_avx(auVar330,auVar161);
          auVar202._0_4_ = 1.0 / auVar223._0_4_;
          auVar202._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar252 = vshufps_avx(auVar202,auVar202,0);
          local_320[0] = auVar252._0_4_ * (auVar336._0_4_ + 0.0);
          local_320[1] = auVar252._4_4_ * (auVar336._4_4_ + 1.0);
          local_320[2] = auVar252._8_4_ * (auVar336._8_4_ + 2.0);
          local_320[3] = auVar252._12_4_ * (auVar336._12_4_ + 3.0);
          fStack_310 = auVar252._0_4_ * (auVar336._16_4_ + 4.0);
          fStack_30c = auVar252._4_4_ * (auVar336._20_4_ + 5.0);
          fStack_308 = auVar252._8_4_ * (auVar336._24_4_ + 6.0);
          fStack_304 = auVar336._28_4_ + 7.0;
          uStack_470 = auVar140._16_8_;
          uStack_468 = auVar28._24_8_;
          local_300 = local_480;
          uStack_2f8 = uStack_478;
          uStack_2f0 = uStack_470;
          uStack_2e8 = uStack_468;
          local_2e0 = local_460;
          auVar189._8_4_ = 0x7f800000;
          auVar189._0_8_ = 0x7f8000007f800000;
          auVar189._12_4_ = 0x7f800000;
          auVar189._16_4_ = 0x7f800000;
          auVar189._20_4_ = 0x7f800000;
          auVar189._24_4_ = 0x7f800000;
          auVar189._28_4_ = 0x7f800000;
          auVar161 = vblendvps_avx(auVar189,local_460,local_620);
          auVar330 = vshufps_avx(auVar161,auVar161,0xb1);
          auVar330 = vminps_avx(auVar161,auVar330);
          auVar28 = vshufpd_avx(auVar330,auVar330,5);
          auVar330 = vminps_avx(auVar330,auVar28);
          auVar28 = vperm2f128_avx(auVar330,auVar330,1);
          auVar330 = vminps_avx(auVar330,auVar28);
          auVar330 = vcmpps_avx(auVar161,auVar330,0);
          auVar28 = local_620 & auVar330;
          auVar161 = local_620;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0x7f,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0xbf,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar28[0x1f] < '\0') {
            auVar161 = vandps_avx(auVar330,local_620);
          }
          uVar142 = vmovmskps_avx(auVar161);
          uVar27 = 0;
          if (uVar142 != 0) {
            for (; (uVar142 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          uVar144 = (ulong)uVar27;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar281 = local_320[uVar144];
            uVar8 = *(undefined4 *)((long)&local_300 + uVar144 * 4);
            fVar290 = 1.0 - fVar281;
            fVar260 = fVar281 * fVar290 + fVar281 * fVar290;
            auVar289 = ZEXT464(0x40400000);
            auVar252 = ZEXT416((uint)(fVar281 * fVar281 * 3.0));
            auVar252 = vshufps_avx(auVar252,auVar252,0);
            auVar205 = ZEXT416((uint)((fVar260 - fVar281 * fVar281) * 3.0));
            auVar205 = vshufps_avx(auVar205,auVar205,0);
            auVar224 = ZEXT416((uint)((fVar290 * fVar290 - fVar260) * 3.0));
            auVar224 = vshufps_avx(auVar224,auVar224,0);
            auVar209 = ZEXT416((uint)(fVar290 * fVar290 * -3.0));
            auVar209 = vshufps_avx(auVar209,auVar209,0);
            auVar203._0_4_ =
                 auVar209._0_4_ * fVar246 +
                 auVar224._0_4_ * fVar381 + auVar252._0_4_ * fVar400 + auVar205._0_4_ * fVar266;
            auVar203._4_4_ =
                 auVar209._4_4_ * fVar261 +
                 auVar224._4_4_ * fVar392 + auVar252._4_4_ * fVar405 + auVar205._4_4_ * fVar301;
            auVar203._8_4_ =
                 auVar209._8_4_ * auVar248._8_4_ +
                 auVar224._8_4_ * auVar382._8_4_ +
                 auVar252._8_4_ * auVar401._8_4_ + auVar205._8_4_ * fVar199;
            auVar203._12_4_ =
                 auVar209._12_4_ * auVar248._12_4_ +
                 auVar224._12_4_ * auVar382._12_4_ +
                 auVar252._12_4_ * auVar401._12_4_ + auVar205._12_4_ * fVar218;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar144 * 4);
            *(float *)(ray + k * 4 + 0x180) = auVar203._0_4_;
            uVar21 = vextractps_avx(auVar203,1);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar21;
            uVar21 = vextractps_avx(auVar203,2);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar21;
            *(float *)(ray + k * 4 + 0x1e0) = fVar281;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar8;
            *(uint *)(ray + k * 4 + 0x220) = uVar143;
            *(uint *)(ray + k * 4 + 0x240) = uVar147;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
          else {
            auVar252 = vpermilps_avx(local_510,0);
            register0x00001210 = auVar252;
            local_6c0 = auVar252;
            auVar252 = vpermilps_avx(ZEXT416(uVar143),0);
            register0x00001210 = auVar252;
            _local_800 = auVar252;
            local_640 = ZEXT1632(*local_758);
            uStack_6d0 = *(undefined8 *)(local_760 + 0x10);
            uStack_6c8 = *(undefined8 *)(local_760 + 0x18);
            uStack_6f0 = *(undefined8 *)(local_760 + 0x10);
            _local_700 = *local_758;
            uStack_6e8 = *(undefined8 *)(local_760 + 0x18);
            auVar197 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            local_400 = auVar333;
            local_39c = uVar20;
            local_390 = auVar248._0_8_;
            local_380 = auVar382._0_8_;
            local_360 = auVar401._0_8_;
            while( true ) {
              local_220 = local_320[uVar144];
              local_200 = *(undefined4 *)((long)&local_300 + uVar144 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar144 * 4);
              fVar260 = 1.0 - local_220;
              fVar281 = local_220 * fVar260 + local_220 * fVar260;
              auVar289 = ZEXT464(0x40400000);
              auVar252 = ZEXT416((uint)(local_220 * local_220 * 3.0));
              auVar252 = vshufps_avx(auVar252,auVar252,0);
              auVar205 = ZEXT416((uint)((fVar281 - local_220 * local_220) * 3.0));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              auVar224 = ZEXT416((uint)((fVar260 * fVar260 - fVar281) * 3.0));
              auVar224 = vshufps_avx(auVar224,auVar224,0);
              local_890.context = context->user;
              auVar209 = ZEXT416((uint)(fVar260 * fVar260 * -3.0));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar210._0_4_ =
                   auVar209._0_4_ * fVar246 +
                   auVar224._0_4_ * fVar381 + auVar252._0_4_ * fVar400 + auVar205._0_4_ * fVar266;
              auVar210._4_4_ =
                   auVar209._4_4_ * fVar261 +
                   auVar224._4_4_ * fVar392 + auVar252._4_4_ * fVar405 + auVar205._4_4_ * fVar301;
              auVar210._8_4_ =
                   auVar209._8_4_ * auVar248._8_4_ +
                   auVar224._8_4_ * auVar382._8_4_ +
                   auVar252._8_4_ * auVar401._8_4_ + auVar205._8_4_ * fVar199;
              auVar210._12_4_ =
                   auVar209._12_4_ * auVar248._12_4_ +
                   auVar224._12_4_ * auVar382._12_4_ +
                   auVar252._12_4_ * auVar401._12_4_ + auVar205._12_4_ * fVar218;
              auStack_270 = vshufps_avx(auVar210,auVar210,0);
              local_280[0] = (RTCHitN)auStack_270[0];
              local_280[1] = (RTCHitN)auStack_270[1];
              local_280[2] = (RTCHitN)auStack_270[2];
              local_280[3] = (RTCHitN)auStack_270[3];
              local_280[4] = (RTCHitN)auStack_270[4];
              local_280[5] = (RTCHitN)auStack_270[5];
              local_280[6] = (RTCHitN)auStack_270[6];
              local_280[7] = (RTCHitN)auStack_270[7];
              local_280[8] = (RTCHitN)auStack_270[8];
              local_280[9] = (RTCHitN)auStack_270[9];
              local_280[10] = (RTCHitN)auStack_270[10];
              local_280[0xb] = (RTCHitN)auStack_270[0xb];
              local_280[0xc] = (RTCHitN)auStack_270[0xc];
              local_280[0xd] = (RTCHitN)auStack_270[0xd];
              local_280[0xe] = (RTCHitN)auStack_270[0xe];
              local_280[0xf] = (RTCHitN)auStack_270[0xf];
              auStack_250 = vshufps_avx(auVar210,auVar210,0x55);
              local_260 = auStack_250;
              auStack_230 = vshufps_avx(auVar210,auVar210,0xaa);
              local_240 = auStack_230;
              fStack_21c = local_220;
              fStack_218 = local_220;
              fStack_214 = local_220;
              fStack_210 = local_220;
              fStack_20c = local_220;
              fStack_208 = local_220;
              fStack_204 = local_220;
              uStack_1fc = local_200;
              uStack_1f8 = local_200;
              uStack_1f4 = local_200;
              uStack_1f0 = local_200;
              uStack_1ec = local_200;
              uStack_1e8 = local_200;
              uStack_1e4 = local_200;
              local_1e0 = local_800;
              uStack_1d8 = uStack_7f8;
              uStack_1d0 = uStack_7f0;
              uStack_1c8 = uStack_7e8;
              local_1c0 = local_6c0._0_8_;
              uStack_1b8 = local_6c0._8_8_;
              uStack_1b0 = uStack_6b0;
              uStack_1a8 = uStack_6a8;
              local_750[1] = auVar274._0_32_;
              *local_750 = auVar274._0_32_;
              local_1a0 = (local_890.context)->instID[0];
              uStack_19c = local_1a0;
              uStack_198 = local_1a0;
              uStack_194 = local_1a0;
              uStack_190 = local_1a0;
              uStack_18c = local_1a0;
              uStack_188 = local_1a0;
              uStack_184 = local_1a0;
              local_180 = (local_890.context)->instPrimID[0];
              uStack_17c = local_180;
              uStack_178 = local_180;
              uStack_174 = local_180;
              uStack_170 = local_180;
              uStack_16c = local_180;
              uStack_168 = local_180;
              uStack_164 = local_180;
              local_7a0 = local_700;
              uStack_798 = uStack_6f8;
              uStack_790 = uStack_6f0;
              uStack_788 = uStack_6e8;
              local_890.valid = (int *)&local_7a0;
              local_890.geometryUserPtr = pGVar22->userPtr;
              local_890.hit = local_280;
              local_890.N = 8;
              auVar184 = local_640._0_16_;
              auVar154 = _local_6e0;
              local_890.ray = (RTCRayN *)ray;
              if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                local_860._0_16_ = auVar197._0_16_;
                auVar289 = ZEXT1664(auVar289._0_16_);
                auVar161 = ZEXT1632(auVar274._0_16_);
                auVar399 = ZEXT1664(auVar399._0_16_);
                (*pGVar22->intersectionFilterN)(&local_890);
                auVar197 = ZEXT1664(local_860._0_16_);
                auVar352 = ZEXT3264(local_7e0);
                auVar336 = ZEXT3264(auVar333);
                auVar161 = vcmpps_avx(auVar161,auVar161,0xf);
                auVar274 = ZEXT3264(auVar161);
                auVar184._8_8_ = uStack_798;
                auVar184._0_8_ = local_7a0;
                auVar154._8_8_ = uStack_788;
                auVar154._0_8_ = uStack_790;
                fVar245 = (float)local_7c0._0_4_;
                fVar262 = (float)local_7c0._4_4_;
                fVar244 = fStack_7b8;
                fVar267 = fStack_7b4;
                fVar219 = fStack_7b0;
                fVar269 = fStack_7ac;
                fVar276 = fStack_7a8;
              }
              auVar252 = vpcmpeqd_avx(auVar184,ZEXT816(0) << 0x40);
              auVar205 = vpcmpeqd_avx(auVar154,ZEXT816(0) << 0x40);
              auVar217._16_16_ = auVar205;
              auVar217._0_16_ = auVar252;
              auVar161 = auVar274._0_32_ & ~auVar217;
              if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar161 >> 0x7f,0) == '\0') &&
                    (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar161 >> 0xbf,0) == '\0') &&
                  (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar161[0x1f]) {
                auVar168._0_4_ = auVar252._0_4_ ^ auVar274._0_4_;
                auVar168._4_4_ = auVar252._4_4_ ^ auVar274._4_4_;
                auVar168._8_4_ = auVar252._8_4_ ^ auVar274._8_4_;
                auVar168._12_4_ = auVar252._12_4_ ^ auVar274._12_4_;
                auVar168._16_4_ = auVar205._0_4_ ^ auVar274._16_4_;
                auVar168._20_4_ = auVar205._4_4_ ^ auVar274._20_4_;
                auVar168._24_4_ = auVar205._8_4_ ^ auVar274._24_4_;
                auVar168._28_4_ = auVar205._12_4_ ^ auVar274._28_4_;
              }
              else {
                p_Var26 = context->args->filter;
                if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  local_860._0_16_ = auVar197._0_16_;
                  auVar289 = ZEXT1664(auVar289._0_16_);
                  auVar161 = ZEXT1632(auVar274._0_16_);
                  auVar399 = ZEXT1664(auVar399._0_16_);
                  (*p_Var26)(&local_890);
                  auVar197 = ZEXT1664(local_860._0_16_);
                  auVar352 = ZEXT3264(local_7e0);
                  auVar336 = ZEXT3264(auVar333);
                  auVar161 = vcmpps_avx(auVar161,auVar161,0xf);
                  auVar274 = ZEXT3264(auVar161);
                  auVar184._8_8_ = uStack_798;
                  auVar184._0_8_ = local_7a0;
                  auVar154._8_8_ = uStack_788;
                  auVar154._0_8_ = uStack_790;
                  fVar245 = (float)local_7c0._0_4_;
                  fVar262 = (float)local_7c0._4_4_;
                  fVar244 = fStack_7b8;
                  fVar267 = fStack_7b4;
                  fVar219 = fStack_7b0;
                  fVar269 = fStack_7ac;
                  fVar276 = fStack_7a8;
                }
                auVar252 = vpcmpeqd_avx(auVar184,ZEXT816(0) << 0x40);
                auVar205 = vpcmpeqd_avx(auVar154,ZEXT816(0) << 0x40);
                auVar195._16_16_ = auVar205;
                auVar195._0_16_ = auVar252;
                auVar168._0_4_ = auVar252._0_4_ ^ auVar274._0_4_;
                auVar168._4_4_ = auVar252._4_4_ ^ auVar274._4_4_;
                auVar168._8_4_ = auVar252._8_4_ ^ auVar274._8_4_;
                auVar168._12_4_ = auVar252._12_4_ ^ auVar274._12_4_;
                auVar168._16_4_ = auVar205._0_4_ ^ auVar274._16_4_;
                auVar168._20_4_ = auVar205._4_4_ ^ auVar274._20_4_;
                auVar168._24_4_ = auVar205._8_4_ ^ auVar274._24_4_;
                auVar168._28_4_ = auVar205._12_4_ ^ auVar274._28_4_;
                auVar161 = auVar274._0_32_ & ~auVar195;
                if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar161 >> 0x7f,0) != '\0') ||
                      (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar161 >> 0xbf,0) != '\0') ||
                    (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar161[0x1f] < '\0') {
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])local_890.hit);
                  *(undefined1 (*) [32])(local_890.ray + 0x180) = auVar161;
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_890.hit + 0x20));
                  *(undefined1 (*) [32])(local_890.ray + 0x1a0) = auVar161;
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_890.hit + 0x40));
                  *(undefined1 (*) [32])(local_890.ray + 0x1c0) = auVar161;
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_890.hit + 0x60));
                  *(undefined1 (*) [32])(local_890.ray + 0x1e0) = auVar161;
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_890.hit + 0x80));
                  *(undefined1 (*) [32])(local_890.ray + 0x200) = auVar161;
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_890.hit + 0xa0));
                  *(undefined1 (*) [32])(local_890.ray + 0x220) = auVar161;
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_890.hit + 0xc0));
                  *(undefined1 (*) [32])(local_890.ray + 0x240) = auVar161;
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_890.hit + 0xe0));
                  *(undefined1 (*) [32])(local_890.ray + 0x260) = auVar161;
                  auVar161 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_890.hit + 0x100));
                  *(undefined1 (*) [32])(local_890.ray + 0x280) = auVar161;
                }
              }
              auVar161 = local_460;
              if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar168 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar168 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar168 >> 0x7f,0) == '\0') &&
                    (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar168 >> 0xbf,0) == '\0') &&
                  (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar168[0x1f]) {
                *(int *)(ray + k * 4 + 0x100) = auVar197._0_4_;
              }
              else {
                auVar197 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_620 + uVar144 * 4) = 0;
              auVar252 = vshufps_avx(auVar197._0_16_,auVar197._0_16_,0);
              auVar169._16_16_ = auVar252;
              auVar169._0_16_ = auVar252;
              auVar28 = vcmpps_avx(auVar161,auVar169,2);
              auVar330 = vandps_avx(auVar28,local_620);
              local_620 = local_620 & auVar28;
              if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_620 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_620 >> 0x7f,0) == '\0') &&
                    (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_620 >> 0xbf,0) == '\0') &&
                  (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_620[0x1f]) break;
              auVar196._8_4_ = 0x7f800000;
              auVar196._0_8_ = 0x7f8000007f800000;
              auVar196._12_4_ = 0x7f800000;
              auVar196._16_4_ = 0x7f800000;
              auVar196._20_4_ = 0x7f800000;
              auVar196._24_4_ = 0x7f800000;
              auVar196._28_4_ = 0x7f800000;
              auVar161 = vblendvps_avx(auVar196,auVar161,auVar330);
              auVar28 = vshufps_avx(auVar161,auVar161,0xb1);
              auVar28 = vminps_avx(auVar161,auVar28);
              auVar29 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar29 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar28 = vcmpps_avx(auVar161,auVar28,0);
              auVar29 = auVar330 & auVar28;
              auVar161 = auVar330;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar161 = vandps_avx(auVar28,auVar330);
              }
              uVar143 = vmovmskps_avx(auVar161);
              uVar147 = 0;
              if (uVar143 != 0) {
                for (; (uVar143 >> uVar147 & 1) == 0; uVar147 = uVar147 + 1) {
                }
              }
              uVar144 = (ulong)uVar147;
              local_620 = auVar330;
            }
          }
        }
        fVar359 = (float)local_740._0_4_;
        fVar369 = (float)local_740._4_4_;
        fVar370 = fStack_738;
        fVar371 = fStack_734;
        fVar281 = fStack_730;
        fVar290 = fStack_72c;
        fVar264 = fStack_728;
        fVar295 = fStack_724;
      }
      auVar252 = local_840._0_16_;
    }
LAB_00b182e1:
    auVar274 = ZEXT3264(auVar227);
    auVar197 = ZEXT3264(local_5c0);
    auVar314 = ZEXT3264(_local_820);
    local_6c0._0_8_ = prim;
    if (8 < (int)uVar20) {
      auVar205 = vpshufd_avx(ZEXT416(uVar20),0);
      local_540 = auVar205._0_4_;
      fStack_53c = auVar205._4_4_;
      fStack_538 = auVar205._8_4_;
      fStack_534 = auVar205._12_4_;
      auVar252 = vshufps_avx(auVar252,auVar252,0);
      local_440._16_16_ = auVar252;
      local_440._0_16_ = auVar252;
      auVar252 = vpermilps_avx(ZEXT416(uVar141),0);
      local_140._16_16_ = auVar252;
      local_140._0_16_ = auVar252;
      auVar152._0_4_ = 1.0 / (float)local_4e0._0_4_;
      auVar152._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar252 = vshufps_avx(auVar152,auVar152,0);
      register0x00001210 = auVar252;
      _local_160 = auVar252;
      auVar252 = vpermilps_avx(local_510,0);
      local_4e0._16_16_ = auVar252;
      local_4e0._0_16_ = auVar252;
      auVar252 = vpermilps_avx(local_500._0_16_,0);
      local_500._16_16_ = auVar252;
      local_500._0_16_ = auVar252;
      auVar161 = auVar336._0_32_;
      for (lVar146 = 8; local_5c0 = auVar197._0_32_, lVar146 < (long)auVar148; lVar146 = lVar146 + 8
          ) {
        pauVar7 = (undefined1 (*) [28])(bezier_basis0 + lVar146 * 4 + lVar149);
        fVar277 = *(float *)*pauVar7;
        fVar279 = *(float *)(*pauVar7 + 4);
        fVar280 = *(float *)(*pauVar7 + 8);
        fVar378 = *(float *)(*pauVar7 + 0xc);
        fVar237 = *(float *)(*pauVar7 + 0x10);
        fVar380 = *(float *)(*pauVar7 + 0x14);
        fVar379 = *(float *)(*pauVar7 + 0x18);
        auVar138 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar149 + 0x21fb768 + lVar146 * 4);
        fVar326 = *(float *)*pauVar7;
        fVar294 = *(float *)(*pauVar7 + 4);
        fVar319 = *(float *)(*pauVar7 + 8);
        fVar337 = *(float *)(*pauVar7 + 0xc);
        fVar338 = *(float *)(*pauVar7 + 0x10);
        fVar239 = *(float *)(*pauVar7 + 0x14);
        fVar321 = *(float *)(*pauVar7 + 0x18);
        auVar137 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar149 + 0x21fbbec + lVar146 * 4);
        fVar340 = *(float *)*pauVar7;
        fVar297 = *(float *)(*pauVar7 + 4);
        fVar241 = *(float *)(*pauVar7 + 8);
        fVar323 = *(float *)(*pauVar7 + 0xc);
        fVar342 = *(float *)(*pauVar7 + 0x10);
        fVar343 = *(float *)(*pauVar7 + 0x14);
        fVar243 = *(float *)(*pauVar7 + 0x18);
        auVar136 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar149 + 0x21fc070 + lVar146 * 4);
        fVar200 = *(float *)*pauVar7;
        fVar300 = *(float *)(*pauVar7 + 4);
        fVar170 = *(float *)(*pauVar7 + 8);
        fVar172 = *(float *)(*pauVar7 + 0xc);
        fVar175 = *(float *)(*pauVar7 + 0x10);
        fVar176 = *(float *)(*pauVar7 + 0x14);
        fVar177 = *(float *)(*pauVar7 + 0x18);
        auVar135 = *pauVar7;
        fVar240 = auVar352._0_4_;
        fVar242 = auVar352._4_4_;
        fVar325 = auVar352._8_4_;
        fVar303 = auVar352._12_4_;
        fVar339 = auVar352._16_4_;
        fVar341 = auVar352._20_4_;
        fVar263 = auVar352._24_4_;
        fVar178 = fStack_4a4 + auVar399._28_4_ + fStack_4a4;
        fVar268 = fStack_4a4 + fStack_4a4 + fVar295;
        local_840._0_4_ =
             fVar277 * (float)local_420._0_4_ +
             fVar240 * fVar326 + (float)local_4c0._0_4_ * fVar200 + fVar308 * fVar340;
        local_840._4_4_ =
             fVar279 * (float)local_420._4_4_ +
             fVar242 * fVar294 + (float)local_4c0._4_4_ * fVar300 + fVar315 * fVar297;
        local_840._8_4_ =
             fVar280 * fStack_418 + fVar325 * fVar319 + fStack_4b8 * fVar170 + fVar316 * fVar241;
        local_840._12_4_ =
             fVar378 * fStack_414 + fVar303 * fVar337 + fStack_4b4 * fVar172 + fVar317 * fVar323;
        local_840._16_4_ =
             fVar237 * fStack_410 + fVar339 * fVar338 + fStack_4b0 * fVar175 + fVar308 * fVar342;
        local_840._20_4_ =
             fVar380 * fStack_40c + fVar341 * fVar239 + fStack_4ac * fVar176 + fVar315 * fVar343;
        local_840._24_4_ =
             fVar379 * fStack_408 + fVar263 * fVar321 + fStack_4a8 * fVar177 + fVar316 * fVar243;
        local_840._28_4_ = fStack_4a4 + fVar295 + fVar178;
        fVar260 = auVar274._0_4_;
        fVar292 = auVar274._4_4_;
        fVar298 = auVar274._8_4_;
        fVar304 = auVar274._12_4_;
        fVar377 = auVar274._16_4_;
        fVar275 = auVar274._20_4_;
        fVar278 = auVar274._24_4_;
        auVar215._0_4_ =
             fVar277 * fVar260 + fVar245 * fVar326 + auVar314._0_4_ * fVar340 + fVar359 * fVar200;
        auVar215._4_4_ =
             fVar279 * fVar292 + fVar262 * fVar294 + auVar314._4_4_ * fVar297 + fVar369 * fVar300;
        auVar215._8_4_ =
             fVar280 * fVar298 + fVar244 * fVar319 + auVar314._8_4_ * fVar241 + fVar370 * fVar170;
        auVar215._12_4_ =
             fVar378 * fVar304 + fVar267 * fVar337 + auVar314._12_4_ * fVar323 + fVar371 * fVar172;
        auVar215._16_4_ =
             fVar237 * fVar377 + fVar219 * fVar338 + auVar314._16_4_ * fVar342 + fVar281 * fVar175;
        auVar215._20_4_ =
             fVar380 * fVar275 + fVar269 * fVar239 + auVar314._20_4_ * fVar343 + fVar290 * fVar176;
        auVar215._24_4_ =
             fVar379 * fVar278 + fVar276 * fVar321 + auVar314._24_4_ * fVar243 + fVar264 * fVar177;
        auVar215._28_4_ = fVar178 + fStack_4a4 + fStack_4a4 + auVar289._28_4_;
        fVar150 = fVar277 * (float)local_2c0._0_4_ +
                  fVar326 * (float)local_2a0._0_4_ +
                  (float)local_a0._0_4_ * fVar340 + (float)local_c0._0_4_ * fVar200;
        fVar171 = fVar279 * (float)local_2c0._4_4_ +
                  fVar294 * (float)local_2a0._4_4_ +
                  (float)local_a0._4_4_ * fVar297 + (float)local_c0._4_4_ * fVar300;
        fVar173 = fVar280 * fStack_2b8 +
                  fVar319 * fStack_298 + fStack_98 * fVar241 + fStack_b8 * fVar170;
        fVar174 = fVar378 * fStack_2b4 +
                  fVar337 * fStack_294 + fStack_94 * fVar323 + fStack_b4 * fVar172;
        fVar175 = fVar237 * fStack_2b0 +
                  fVar338 * fStack_290 + fStack_90 * fVar342 + fStack_b0 * fVar175;
        fVar176 = fVar380 * fStack_2ac +
                  fVar239 * fStack_28c + fStack_8c * fVar343 + fStack_ac * fVar176;
        fVar177 = fVar379 * fStack_2a8 +
                  fVar321 * fStack_288 + fStack_88 * fVar243 + fStack_a8 * fVar177;
        fVar178 = fVar178 + fVar268;
        pfVar1 = (float *)(bezier_basis1 + lVar146 * 4 + lVar149);
        fVar237 = *pfVar1;
        fVar380 = pfVar1[1];
        fVar379 = pfVar1[2];
        fVar326 = pfVar1[3];
        fVar294 = pfVar1[4];
        fVar319 = pfVar1[5];
        fVar337 = pfVar1[6];
        pfVar2 = (float *)(lVar149 + 0x21fdb88 + lVar146 * 4);
        fVar338 = *pfVar2;
        fVar239 = pfVar2[1];
        fVar321 = pfVar2[2];
        fVar340 = pfVar2[3];
        fVar297 = pfVar2[4];
        fVar241 = pfVar2[5];
        fVar323 = pfVar2[6];
        pfVar2 = (float *)(lVar149 + 0x21fe00c + lVar146 * 4);
        fVar342 = *pfVar2;
        fVar343 = pfVar2[1];
        fVar243 = pfVar2[2];
        fVar200 = pfVar2[3];
        fVar300 = pfVar2[4];
        fVar170 = pfVar2[5];
        fVar172 = pfVar2[6];
        pauVar7 = (undefined1 (*) [28])(lVar149 + 0x21fe490 + lVar146 * 4);
        fVar245 = *(float *)*pauVar7;
        fVar262 = *(float *)(*pauVar7 + 4);
        fVar295 = *(float *)(*pauVar7 + 8);
        fVar244 = *(float *)(*pauVar7 + 0xc);
        fVar267 = *(float *)(*pauVar7 + 0x10);
        fVar219 = *(float *)(*pauVar7 + 0x14);
        fVar269 = *(float *)(*pauVar7 + 0x18);
        auVar139 = *pauVar7;
        fVar378 = auVar352._28_4_;
        fVar276 = auVar314._28_4_;
        auVar399 = ZEXT3264(auVar274._0_32_);
        fVar277 = fVar276 + fVar276 + fVar268;
        auVar287._0_4_ =
             (float)local_420._0_4_ * fVar237 +
             fVar240 * fVar338 + fVar308 * fVar342 + fVar245 * (float)local_4c0._0_4_;
        auVar287._4_4_ =
             (float)local_420._4_4_ * fVar380 +
             fVar242 * fVar239 + fVar315 * fVar343 + fVar262 * (float)local_4c0._4_4_;
        auVar287._8_4_ =
             fStack_418 * fVar379 + fVar325 * fVar321 + fVar316 * fVar243 + fVar295 * fStack_4b8;
        auVar287._12_4_ =
             fStack_414 * fVar326 + fVar303 * fVar340 + fVar317 * fVar200 + fVar244 * fStack_4b4;
        auVar287._16_4_ =
             fStack_410 * fVar294 + fVar339 * fVar297 + fVar308 * fVar300 + fVar267 * fStack_4b0;
        auVar287._20_4_ =
             fStack_40c * fVar319 + fVar341 * fVar241 + fVar315 * fVar170 + fVar219 * fStack_4ac;
        auVar287._24_4_ =
             fStack_408 * fVar337 + fVar263 * fVar323 + fVar316 * fVar172 + fVar269 * fStack_4a8;
        auVar287._28_4_ = fVar276 + fVar378 + fVar277;
        auVar272._0_4_ =
             fVar260 * fVar237 +
             fVar338 * (float)local_7c0._0_4_ + fVar342 * auVar314._0_4_ + fVar359 * fVar245;
        auVar272._4_4_ =
             fVar292 * fVar380 +
             fVar239 * (float)local_7c0._4_4_ + fVar343 * auVar314._4_4_ + fVar369 * fVar262;
        auVar272._8_4_ =
             fVar298 * fVar379 + fVar321 * fStack_7b8 + fVar243 * auVar314._8_4_ + fVar370 * fVar295
        ;
        auVar272._12_4_ =
             fVar304 * fVar326 +
             fVar340 * fStack_7b4 + fVar200 * auVar314._12_4_ + fVar371 * fVar244;
        auVar272._16_4_ =
             fVar377 * fVar294 +
             fVar297 * fStack_7b0 + fVar300 * auVar314._16_4_ + fVar281 * fVar267;
        auVar272._20_4_ =
             fVar275 * fVar319 +
             fVar241 * fStack_7ac + fVar170 * auVar314._20_4_ + fVar290 * fVar219;
        auVar272._24_4_ =
             fVar278 * fVar337 +
             fVar323 * fStack_7a8 + fVar172 * auVar314._24_4_ + fVar264 * fVar269;
        auVar272._28_4_ = fVar277 + fVar276 + fVar276 + auVar274._28_4_;
        local_5a0._0_4_ =
             fVar338 * (float)local_2a0._0_4_ +
             (float)local_a0._0_4_ * fVar342 + (float)local_c0._0_4_ * fVar245 +
             fVar237 * (float)local_2c0._0_4_;
        local_5a0._4_4_ =
             fVar239 * (float)local_2a0._4_4_ +
             (float)local_a0._4_4_ * fVar343 + (float)local_c0._4_4_ * fVar262 +
             fVar380 * (float)local_2c0._4_4_;
        fStack_598 = fVar321 * fStack_298 + fStack_98 * fVar243 + fStack_b8 * fVar295 +
                     fVar379 * fStack_2b8;
        fStack_594 = fVar340 * fStack_294 + fStack_94 * fVar200 + fStack_b4 * fVar244 +
                     fVar326 * fStack_2b4;
        fStack_590 = fVar297 * fStack_290 + fStack_90 * fVar300 + fStack_b0 * fVar267 +
                     fVar294 * fStack_2b0;
        fStack_58c = fVar241 * fStack_28c + fStack_8c * fVar170 + fStack_ac * fVar219 +
                     fVar319 * fStack_2ac;
        fStack_588 = fVar323 * fStack_288 + fStack_88 * fVar172 + fStack_a8 * fVar269 +
                     fVar337 * fStack_2a8;
        fStack_584 = fVar276 + fVar276 + fVar378 + fVar277;
        auVar28 = vsubps_avx(auVar287,local_840);
        auVar333 = vsubps_avx(auVar272,auVar215);
        fVar245 = auVar28._0_4_;
        fVar290 = auVar28._4_4_;
        auVar86._4_4_ = auVar215._4_4_ * fVar290;
        auVar86._0_4_ = auVar215._0_4_ * fVar245;
        fVar264 = auVar28._8_4_;
        auVar86._8_4_ = auVar215._8_4_ * fVar264;
        fVar244 = auVar28._12_4_;
        auVar86._12_4_ = auVar215._12_4_ * fVar244;
        fVar219 = auVar28._16_4_;
        auVar86._16_4_ = auVar215._16_4_ * fVar219;
        fVar276 = auVar28._20_4_;
        auVar86._20_4_ = auVar215._20_4_ * fVar276;
        fVar279 = auVar28._24_4_;
        auVar86._24_4_ = auVar215._24_4_ * fVar279;
        auVar86._28_4_ = fVar277;
        fVar281 = auVar333._0_4_;
        fVar262 = auVar333._4_4_;
        auVar87._4_4_ = local_840._4_4_ * fVar262;
        auVar87._0_4_ = (float)local_840._0_4_ * fVar281;
        fVar295 = auVar333._8_4_;
        auVar87._8_4_ = local_840._8_4_ * fVar295;
        fVar267 = auVar333._12_4_;
        auVar87._12_4_ = local_840._12_4_ * fVar267;
        fVar269 = auVar333._16_4_;
        auVar87._16_4_ = local_840._16_4_ * fVar269;
        fVar277 = auVar333._20_4_;
        auVar87._20_4_ = local_840._20_4_ * fVar277;
        fVar280 = auVar333._24_4_;
        auVar87._24_4_ = local_840._24_4_ * fVar280;
        auVar87._28_4_ = auVar272._28_4_;
        auVar29 = vsubps_avx(auVar86,auVar87);
        auVar132._4_4_ = fVar171;
        auVar132._0_4_ = fVar150;
        auVar132._8_4_ = fVar173;
        auVar132._12_4_ = fVar174;
        auVar132._16_4_ = fVar175;
        auVar132._20_4_ = fVar176;
        auVar132._24_4_ = fVar177;
        auVar132._28_4_ = fVar178;
        auVar330 = vmaxps_avx(auVar132,_local_5a0);
        auVar88._4_4_ = auVar330._4_4_ * auVar330._4_4_ * (fVar290 * fVar290 + fVar262 * fVar262);
        auVar88._0_4_ = auVar330._0_4_ * auVar330._0_4_ * (fVar245 * fVar245 + fVar281 * fVar281);
        auVar88._8_4_ = auVar330._8_4_ * auVar330._8_4_ * (fVar264 * fVar264 + fVar295 * fVar295);
        auVar88._12_4_ = auVar330._12_4_ * auVar330._12_4_ * (fVar244 * fVar244 + fVar267 * fVar267)
        ;
        auVar88._16_4_ = auVar330._16_4_ * auVar330._16_4_ * (fVar219 * fVar219 + fVar269 * fVar269)
        ;
        auVar88._20_4_ = auVar330._20_4_ * auVar330._20_4_ * (fVar276 * fVar276 + fVar277 * fVar277)
        ;
        auVar88._24_4_ = auVar330._24_4_ * auVar330._24_4_ * (fVar279 * fVar279 + fVar280 * fVar280)
        ;
        auVar88._28_4_ = auVar287._28_4_ + auVar272._28_4_;
        auVar89._4_4_ = auVar29._4_4_ * auVar29._4_4_;
        auVar89._0_4_ = auVar29._0_4_ * auVar29._0_4_;
        auVar89._8_4_ = auVar29._8_4_ * auVar29._8_4_;
        auVar89._12_4_ = auVar29._12_4_ * auVar29._12_4_;
        auVar89._16_4_ = auVar29._16_4_ * auVar29._16_4_;
        auVar89._20_4_ = auVar29._20_4_ * auVar29._20_4_;
        auVar89._24_4_ = auVar29._24_4_ * auVar29._24_4_;
        auVar89._28_4_ = auVar29._28_4_;
        local_640 = vcmpps_avx(auVar89,auVar88,2);
        local_3a0 = (uint)lVar146;
        auVar205 = vpshufd_avx(ZEXT416(local_3a0),0);
        auVar252 = vpor_avx(auVar205,_DAT_01f4ad30);
        auVar205 = vpor_avx(auVar205,_DAT_01f7afa0);
        auVar133._4_4_ = fStack_53c;
        auVar133._0_4_ = local_540;
        auVar133._8_4_ = fStack_538;
        auVar133._12_4_ = fStack_534;
        auVar252 = vpcmpgtd_avx(auVar133,auVar252);
        auVar289 = ZEXT1664(auVar252);
        auVar205 = vpcmpgtd_avx(auVar133,auVar205);
        register0x00001310 = auVar205;
        _local_560 = auVar252;
        auVar330 = _local_560 & local_640;
        fVar359 = (float)local_740._0_4_;
        fVar369 = (float)local_740._4_4_;
        fVar370 = fStack_738;
        fVar371 = fStack_734;
        fVar281 = fStack_730;
        fVar290 = fStack_72c;
        fVar264 = fStack_728;
        fVar295 = fStack_724;
        fVar245 = (float)local_7c0._0_4_;
        fVar262 = (float)local_7c0._4_4_;
        fVar244 = fStack_7b8;
        fVar267 = fStack_7b4;
        fVar219 = fStack_7b0;
        fVar269 = fStack_7ac;
        fVar276 = fStack_7a8;
        if ((((((((auVar330 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar330 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar330 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar330 >> 0x7f,0) == '\0') &&
              (auVar330 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar330 >> 0xbf,0) == '\0') &&
            (auVar330 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar330[0x1f]) {
          auVar197 = ZEXT3264(local_5c0);
          auVar314 = ZEXT3264(_local_820);
          auVar352 = ZEXT3264(auVar352._0_32_);
          auVar274 = ZEXT3264(auVar274._0_32_);
        }
        else {
          local_660._0_4_ = auVar139._0_4_;
          local_660._4_4_ = auVar139._4_4_;
          fStack_658 = auVar139._8_4_;
          fStack_654 = auVar139._12_4_;
          fStack_650 = auVar139._16_4_;
          fStack_64c = auVar139._20_4_;
          fStack_648 = auVar139._24_4_;
          local_660._0_4_ =
               fVar237 * (float)local_680._0_4_ +
               fVar338 * (float)local_e0._0_4_ +
               fVar342 * (float)local_100._0_4_ + (float)local_120._0_4_ * (float)local_660._0_4_;
          local_660._4_4_ =
               fVar380 * (float)local_680._4_4_ +
               fVar239 * (float)local_e0._4_4_ +
               fVar343 * (float)local_100._4_4_ + (float)local_120._4_4_ * (float)local_660._4_4_;
          fStack_658 = fVar379 * fStack_678 +
                       fVar321 * fStack_d8 + fVar243 * fStack_f8 + fStack_118 * fStack_658;
          fStack_654 = fVar326 * fStack_674 +
                       fVar340 * fStack_d4 + fVar200 * fStack_f4 + fStack_114 * fStack_654;
          fStack_650 = fVar294 * fStack_670 +
                       fVar297 * fStack_d0 + fVar300 * fStack_f0 + fStack_110 * fStack_650;
          fStack_64c = fVar319 * fStack_66c +
                       fVar241 * fStack_cc + fVar170 * fStack_ec + fStack_10c * fStack_64c;
          fStack_648 = fVar337 * fStack_668 +
                       fVar323 * fStack_c8 + fVar172 * fStack_e8 + fStack_108 * fStack_648;
          fStack_644 = pfVar1[7] + fStack_7a4 + local_640._28_4_ + 0.0;
          local_6e0._0_4_ = auVar137._0_4_;
          local_6e0._4_4_ = auVar137._4_4_;
          fStack_6d8 = auVar137._8_4_;
          fStack_6d4 = auVar137._12_4_;
          uStack_6d0._0_4_ = auVar137._16_4_;
          uStack_6d0._4_4_ = auVar137._20_4_;
          uStack_6c8._0_4_ = auVar137._24_4_;
          local_700._0_4_ = auVar136._0_4_;
          local_700._4_4_ = auVar136._4_4_;
          uStack_6f8._0_4_ = auVar136._8_4_;
          uStack_6f8._4_4_ = auVar136._12_4_;
          uStack_6f0._0_4_ = auVar136._16_4_;
          uStack_6f0._4_4_ = auVar136._20_4_;
          uStack_6e8._0_4_ = auVar136._24_4_;
          local_720._0_4_ = auVar135._0_4_;
          local_720._4_4_ = auVar135._4_4_;
          fStack_718 = auVar135._8_4_;
          fStack_714 = auVar135._12_4_;
          fStack_710 = auVar135._16_4_;
          fStack_70c = auVar135._20_4_;
          fStack_708 = auVar135._24_4_;
          fVar282 = (float)local_120._0_4_ * (float)local_720._0_4_;
          fVar291 = (float)local_120._4_4_ * (float)local_720._4_4_;
          fVar293 = fStack_118 * fStack_718;
          fVar296 = fStack_114 * fStack_714;
          fVar299 = fStack_110 * fStack_710;
          fVar302 = fStack_10c * fStack_70c;
          fVar305 = fStack_108 * fStack_708;
          pfVar1 = (float *)(lVar149 + 0x21fcdfc + lVar146 * 4);
          fVar277 = *pfVar1;
          fVar279 = pfVar1[1];
          fVar280 = pfVar1[2];
          fVar237 = pfVar1[3];
          fVar380 = pfVar1[4];
          fVar379 = pfVar1[5];
          fVar326 = pfVar1[6];
          pfVar2 = (float *)(lVar149 + 0x21fd280 + lVar146 * 4);
          fVar294 = *pfVar2;
          fVar319 = pfVar2[1];
          fVar337 = pfVar2[2];
          fVar338 = pfVar2[3];
          fVar239 = pfVar2[4];
          fVar321 = pfVar2[5];
          fVar340 = pfVar2[6];
          pfVar3 = (float *)(lVar149 + 0x21fc978 + lVar146 * 4);
          fVar297 = *pfVar3;
          fVar241 = pfVar3[1];
          fVar323 = pfVar3[2];
          fVar342 = pfVar3[3];
          fVar343 = pfVar3[4];
          fVar243 = pfVar3[5];
          fVar200 = pfVar3[6];
          fVar179 = pfVar1[7] + pfVar2[7];
          fVar198 = pfVar2[7] + fVar378 + 0.0;
          fVar307 = fVar378 + auVar274._28_4_ + fVar378 + 0.0;
          pfVar1 = (float *)(lVar149 + 0x21fc4f4 + lVar146 * 4);
          fVar378 = *pfVar1;
          fVar300 = pfVar1[1];
          fVar170 = pfVar1[2];
          fVar172 = pfVar1[3];
          fVar268 = pfVar1[4];
          fVar265 = pfVar1[5];
          fVar306 = pfVar1[6];
          fStack_704 = fVar179 + fVar198;
          local_720._4_4_ =
               (float)local_420._4_4_ * fVar300 +
               fVar241 * fVar242 + fVar315 * fVar279 + (float)local_4c0._4_4_ * fVar319;
          local_720._0_4_ =
               (float)local_420._0_4_ * fVar378 +
               fVar297 * fVar240 + fVar308 * fVar277 + (float)local_4c0._0_4_ * fVar294;
          fStack_718 = fStack_418 * fVar170 +
                       fVar323 * fVar325 + fVar316 * fVar280 + fStack_4b8 * fVar337;
          fStack_714 = fStack_414 * fVar172 +
                       fVar342 * fVar303 + fVar317 * fVar237 + fStack_4b4 * fVar338;
          fStack_710 = fStack_410 * fVar268 +
                       fVar343 * fVar339 + fVar308 * fVar380 + fStack_4b0 * fVar239;
          fStack_70c = fStack_40c * fVar265 +
                       fVar243 * fVar341 + fVar315 * fVar379 + fStack_4ac * fVar321;
          fStack_708 = fStack_408 * fVar306 +
                       fVar200 * fVar263 + fVar316 * fVar326 + fStack_4a8 * fVar340;
          auVar190._0_4_ =
               fVar260 * fVar378 +
               (float)local_820._0_4_ * fVar277 + (float)local_740._0_4_ * fVar294 +
               fVar297 * (float)local_7c0._0_4_;
          auVar190._4_4_ =
               fVar292 * fVar300 +
               (float)local_820._4_4_ * fVar279 + (float)local_740._4_4_ * fVar319 +
               fVar241 * (float)local_7c0._4_4_;
          auVar190._8_4_ =
               fVar298 * fVar170 +
               fStack_818 * fVar280 + fStack_738 * fVar337 + fVar323 * fStack_7b8;
          auVar190._12_4_ =
               fVar304 * fVar172 +
               fStack_814 * fVar237 + fStack_734 * fVar338 + fVar342 * fStack_7b4;
          auVar190._16_4_ =
               fVar377 * fVar268 +
               fStack_810 * fVar380 + fStack_730 * fVar239 + fVar343 * fStack_7b0;
          auVar190._20_4_ =
               fVar275 * fVar265 +
               fStack_80c * fVar379 + fStack_72c * fVar321 + fVar243 * fStack_7ac;
          auVar190._24_4_ =
               fVar278 * fVar306 +
               fStack_808 * fVar326 + fStack_728 * fVar340 + fVar200 * fStack_7a8;
          auVar190._28_4_ = fVar198 + fVar307;
          auVar397._0_4_ =
               fVar297 * (float)local_e0._0_4_ +
               (float)local_100._0_4_ * fVar277 + (float)local_120._0_4_ * fVar294 +
               fVar378 * (float)local_680._0_4_;
          auVar397._4_4_ =
               fVar241 * (float)local_e0._4_4_ +
               (float)local_100._4_4_ * fVar279 + (float)local_120._4_4_ * fVar319 +
               fVar300 * (float)local_680._4_4_;
          auVar397._8_4_ =
               fVar323 * fStack_d8 + fStack_f8 * fVar280 + fStack_118 * fVar337 +
               fVar170 * fStack_678;
          auVar397._12_4_ =
               fVar342 * fStack_d4 + fStack_f4 * fVar237 + fStack_114 * fVar338 +
               fVar172 * fStack_674;
          auVar397._16_4_ =
               fVar343 * fStack_d0 + fStack_f0 * fVar380 + fStack_110 * fVar239 +
               fVar268 * fStack_670;
          auVar397._20_4_ =
               fVar243 * fStack_cc + fStack_ec * fVar379 + fStack_10c * fVar321 +
               fVar265 * fStack_66c;
          auVar397._24_4_ =
               fVar200 * fStack_c8 + fStack_e8 * fVar326 + fStack_108 * fVar340 +
               fVar306 * fStack_668;
          auVar397._28_4_ = pfVar3[7] + fVar179 + fVar307;
          pfVar1 = (float *)(lVar149 + 0x21ff21c + lVar146 * 4);
          fVar260 = *pfVar1;
          fVar292 = pfVar1[1];
          fVar298 = pfVar1[2];
          fVar304 = pfVar1[3];
          fVar377 = pfVar1[4];
          fVar275 = pfVar1[5];
          fVar277 = pfVar1[6];
          pfVar2 = (float *)(lVar149 + 0x21ff6a0 + lVar146 * 4);
          fVar278 = *pfVar2;
          fVar279 = pfVar2[1];
          fVar280 = pfVar2[2];
          fVar378 = pfVar2[3];
          fVar237 = pfVar2[4];
          fVar380 = pfVar2[5];
          fVar379 = pfVar2[6];
          pfVar3 = (float *)(lVar149 + 0x21fed98 + lVar146 * 4);
          fVar326 = *pfVar3;
          fVar294 = pfVar3[1];
          fVar319 = pfVar3[2];
          fVar337 = pfVar3[3];
          fVar338 = pfVar3[4];
          fVar239 = pfVar3[5];
          fVar321 = pfVar3[6];
          pfVar4 = (float *)(lVar149 + 0x21fe914 + lVar146 * 4);
          fVar340 = *pfVar4;
          fVar297 = pfVar4[1];
          fVar241 = pfVar4[2];
          fVar323 = pfVar4[3];
          fVar342 = pfVar4[4];
          fVar343 = pfVar4[5];
          fVar243 = pfVar4[6];
          auVar350._0_4_ =
               (float)local_420._0_4_ * fVar340 +
               fVar326 * fVar240 + fVar308 * fVar260 + (float)local_4c0._0_4_ * fVar278;
          auVar350._4_4_ =
               (float)local_420._4_4_ * fVar297 +
               fVar294 * fVar242 + fVar315 * fVar292 + (float)local_4c0._4_4_ * fVar279;
          auVar350._8_4_ =
               fStack_418 * fVar241 + fVar319 * fVar325 + fVar316 * fVar298 + fStack_4b8 * fVar280;
          auVar350._12_4_ =
               fStack_414 * fVar323 + fVar337 * fVar303 + fVar317 * fVar304 + fStack_4b4 * fVar378;
          auVar350._16_4_ =
               fStack_410 * fVar342 + fVar338 * fVar339 + fVar308 * fVar377 + fStack_4b0 * fVar237;
          auVar350._20_4_ =
               fStack_40c * fVar343 + fVar239 * fVar341 + fVar315 * fVar275 + fStack_4ac * fVar380;
          auVar350._24_4_ =
               fStack_408 * fVar243 + fVar321 * fVar263 + fVar316 * fVar277 + fStack_4a8 * fVar379;
          auVar350._28_4_ = fStack_404 + fStack_404 + fStack_4a4 + fStack_404;
          auVar389._0_4_ =
               fVar340 * fVar220 +
               fVar326 * (float)local_7c0._0_4_ +
               (float)local_820._0_4_ * fVar260 + (float)local_740._0_4_ * fVar278;
          auVar389._4_4_ =
               fVar297 * fVar235 +
               fVar294 * (float)local_7c0._4_4_ +
               (float)local_820._4_4_ * fVar292 + (float)local_740._4_4_ * fVar279;
          auVar389._8_4_ =
               fVar241 * fVar236 +
               fVar319 * fStack_7b8 + fStack_818 * fVar298 + fStack_738 * fVar280;
          auVar389._12_4_ =
               fVar323 * fVar238 +
               fVar337 * fStack_7b4 + fStack_814 * fVar304 + fStack_734 * fVar378;
          auVar389._16_4_ =
               fVar342 * fVar220 +
               fVar338 * fStack_7b0 + fStack_810 * fVar377 + fStack_730 * fVar237;
          auVar389._20_4_ =
               fVar343 * fVar235 +
               fVar239 * fStack_7ac + fStack_80c * fVar275 + fStack_72c * fVar380;
          auVar389._24_4_ =
               fVar243 * fVar236 +
               fVar321 * fStack_7a8 + fStack_808 * fVar277 + fStack_728 * fVar379;
          auVar389._28_4_ = fStack_404 + fStack_404 + fStack_724 + fStack_404;
          auVar273._8_4_ = 0x7fffffff;
          auVar273._0_8_ = 0x7fffffff7fffffff;
          auVar273._12_4_ = 0x7fffffff;
          auVar273._16_4_ = 0x7fffffff;
          auVar273._20_4_ = 0x7fffffff;
          auVar273._24_4_ = 0x7fffffff;
          auVar273._28_4_ = 0x7fffffff;
          auVar330 = vandps_avx(_local_720,auVar273);
          auVar29 = vandps_avx(auVar190,auVar273);
          auVar29 = vmaxps_avx(auVar330,auVar29);
          auVar330 = vandps_avx(auVar397,auVar273);
          auVar29 = vmaxps_avx(auVar29,auVar330);
          auVar29 = vcmpps_avx(auVar29,local_440,1);
          auVar30 = vblendvps_avx(_local_720,auVar28,auVar29);
          auVar163._0_4_ =
               fVar340 * (float)local_680._0_4_ +
               fVar326 * (float)local_e0._0_4_ +
               (float)local_120._0_4_ * fVar278 + (float)local_100._0_4_ * fVar260;
          auVar163._4_4_ =
               fVar297 * (float)local_680._4_4_ +
               fVar294 * (float)local_e0._4_4_ +
               (float)local_120._4_4_ * fVar279 + (float)local_100._4_4_ * fVar292;
          auVar163._8_4_ =
               fVar241 * fStack_678 +
               fVar319 * fStack_d8 + fStack_118 * fVar280 + fStack_f8 * fVar298;
          auVar163._12_4_ =
               fVar323 * fStack_674 +
               fVar337 * fStack_d4 + fStack_114 * fVar378 + fStack_f4 * fVar304;
          auVar163._16_4_ =
               fVar342 * fStack_670 +
               fVar338 * fStack_d0 + fStack_110 * fVar237 + fStack_f0 * fVar377;
          auVar163._20_4_ =
               fVar343 * fStack_66c +
               fVar239 * fStack_cc + fStack_10c * fVar380 + fStack_ec * fVar275;
          auVar163._24_4_ =
               fVar243 * fStack_668 +
               fVar321 * fStack_c8 + fStack_108 * fVar379 + fStack_e8 * fVar277;
          auVar163._28_4_ = auVar330._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar31 = vblendvps_avx(auVar190,auVar333,auVar29);
          auVar330 = vandps_avx(auVar350,auVar273);
          auVar29 = vandps_avx(auVar389,auVar273);
          auVar32 = vmaxps_avx(auVar330,auVar29);
          auVar330 = vandps_avx(auVar163,auVar273);
          auVar330 = vmaxps_avx(auVar32,auVar330);
          local_800._0_4_ = auVar138._0_4_;
          local_800._4_4_ = auVar138._4_4_;
          uStack_7f8._0_4_ = auVar138._8_4_;
          uStack_7f8._4_4_ = auVar138._12_4_;
          uStack_7f0._0_4_ = auVar138._16_4_;
          uStack_7f0._4_4_ = auVar138._20_4_;
          uStack_7e8._0_4_ = auVar138._24_4_;
          auVar29 = vcmpps_avx(auVar330,local_440,1);
          auVar330 = vblendvps_avx(auVar350,auVar28,auVar29);
          auVar164._0_4_ =
               (float)local_680._0_4_ * (float)local_800._0_4_ +
               (float)local_e0._0_4_ * (float)local_6e0._0_4_ +
               (float)local_100._0_4_ * (float)local_700._0_4_ + fVar282;
          auVar164._4_4_ =
               (float)local_680._4_4_ * (float)local_800._4_4_ +
               (float)local_e0._4_4_ * (float)local_6e0._4_4_ +
               (float)local_100._4_4_ * (float)local_700._4_4_ + fVar291;
          auVar164._8_4_ =
               fStack_678 * (float)uStack_7f8 +
               fStack_d8 * fStack_6d8 + fStack_f8 * (float)uStack_6f8 + fVar293;
          auVar164._12_4_ =
               fStack_674 * uStack_7f8._4_4_ +
               fStack_d4 * fStack_6d4 + fStack_f4 * uStack_6f8._4_4_ + fVar296;
          auVar164._16_4_ =
               fStack_670 * (float)uStack_7f0 +
               fStack_d0 * (float)uStack_6d0 + fStack_f0 * (float)uStack_6f0 + fVar299;
          auVar164._20_4_ =
               fStack_66c * uStack_7f0._4_4_ +
               fStack_cc * uStack_6d0._4_4_ + fStack_ec * uStack_6f0._4_4_ + fVar302;
          auVar164._24_4_ =
               fStack_668 * (float)uStack_7e8 +
               fStack_c8 * (float)uStack_6c8 + fStack_e8 * (float)uStack_6e8 + fVar305;
          auVar164._28_4_ = auVar32._28_4_ + fStack_644 + local_640._28_4_ + 0.0;
          auVar28 = vblendvps_avx(auVar389,auVar333,auVar29);
          fVar325 = auVar30._0_4_;
          fVar303 = auVar30._4_4_;
          fVar339 = auVar30._8_4_;
          fVar341 = auVar30._12_4_;
          fVar263 = auVar30._16_4_;
          fVar265 = auVar30._20_4_;
          fVar306 = auVar30._24_4_;
          fVar179 = auVar30._28_4_;
          fVar326 = auVar330._0_4_;
          fVar319 = auVar330._4_4_;
          fVar338 = auVar330._8_4_;
          fVar321 = auVar330._12_4_;
          fVar297 = auVar330._16_4_;
          fVar323 = auVar330._20_4_;
          fVar343 = auVar330._24_4_;
          fVar260 = auVar31._0_4_;
          fVar298 = auVar31._4_4_;
          fVar377 = auVar31._8_4_;
          fVar277 = auVar31._12_4_;
          fVar279 = auVar31._16_4_;
          fVar378 = auVar31._20_4_;
          fVar380 = auVar31._24_4_;
          auVar368._0_4_ = fVar260 * fVar260 + fVar325 * fVar325;
          auVar368._4_4_ = fVar298 * fVar298 + fVar303 * fVar303;
          auVar368._8_4_ = fVar377 * fVar377 + fVar339 * fVar339;
          auVar368._12_4_ = fVar277 * fVar277 + fVar341 * fVar341;
          auVar368._16_4_ = fVar279 * fVar279 + fVar263 * fVar263;
          auVar368._20_4_ = fVar378 * fVar378 + fVar265 * fVar265;
          auVar368._24_4_ = fVar380 * fVar380 + fVar306 * fVar306;
          auVar368._28_4_ = fStack_404 + fStack_704;
          auVar29 = vrsqrtps_avx(auVar368);
          fVar292 = auVar29._0_4_;
          fVar304 = auVar29._4_4_;
          auVar90._4_4_ = fVar304 * 1.5;
          auVar90._0_4_ = fVar292 * 1.5;
          fVar275 = auVar29._8_4_;
          auVar90._8_4_ = fVar275 * 1.5;
          fVar278 = auVar29._12_4_;
          auVar90._12_4_ = fVar278 * 1.5;
          fVar280 = auVar29._16_4_;
          auVar90._16_4_ = fVar280 * 1.5;
          fVar237 = auVar29._20_4_;
          auVar90._20_4_ = fVar237 * 1.5;
          fVar379 = auVar29._24_4_;
          auVar90._24_4_ = fVar379 * 1.5;
          auVar90._28_4_ = auVar389._28_4_;
          auVar91._4_4_ = fVar304 * fVar304 * fVar304 * auVar368._4_4_ * 0.5;
          auVar91._0_4_ = fVar292 * fVar292 * fVar292 * auVar368._0_4_ * 0.5;
          auVar91._8_4_ = fVar275 * fVar275 * fVar275 * auVar368._8_4_ * 0.5;
          auVar91._12_4_ = fVar278 * fVar278 * fVar278 * auVar368._12_4_ * 0.5;
          auVar91._16_4_ = fVar280 * fVar280 * fVar280 * auVar368._16_4_ * 0.5;
          auVar91._20_4_ = fVar237 * fVar237 * fVar237 * auVar368._20_4_ * 0.5;
          auVar91._24_4_ = fVar379 * fVar379 * fVar379 * auVar368._24_4_ * 0.5;
          auVar91._28_4_ = auVar368._28_4_;
          auVar30 = vsubps_avx(auVar90,auVar91);
          fVar200 = auVar30._0_4_;
          fVar300 = auVar30._4_4_;
          fVar170 = auVar30._8_4_;
          fVar172 = auVar30._12_4_;
          fVar268 = auVar30._16_4_;
          fVar240 = auVar30._20_4_;
          fVar242 = auVar30._24_4_;
          fVar292 = auVar28._0_4_;
          fVar304 = auVar28._4_4_;
          fVar275 = auVar28._8_4_;
          fVar278 = auVar28._12_4_;
          fVar280 = auVar28._16_4_;
          fVar237 = auVar28._20_4_;
          fVar379 = auVar28._24_4_;
          auVar334._0_4_ = fVar292 * fVar292 + fVar326 * fVar326;
          auVar334._4_4_ = fVar304 * fVar304 + fVar319 * fVar319;
          auVar334._8_4_ = fVar275 * fVar275 + fVar338 * fVar338;
          auVar334._12_4_ = fVar278 * fVar278 + fVar321 * fVar321;
          auVar334._16_4_ = fVar280 * fVar280 + fVar297 * fVar297;
          auVar334._20_4_ = fVar237 * fVar237 + fVar323 * fVar323;
          auVar334._24_4_ = fVar379 * fVar379 + fVar343 * fVar343;
          auVar334._28_4_ = auVar29._28_4_ + auVar330._28_4_;
          auVar330 = vrsqrtps_avx(auVar334);
          fVar294 = auVar330._0_4_;
          fVar337 = auVar330._4_4_;
          auVar92._4_4_ = fVar337 * 1.5;
          auVar92._0_4_ = fVar294 * 1.5;
          fVar239 = auVar330._8_4_;
          auVar92._8_4_ = fVar239 * 1.5;
          fVar340 = auVar330._12_4_;
          auVar92._12_4_ = fVar340 * 1.5;
          fVar241 = auVar330._16_4_;
          auVar92._16_4_ = fVar241 * 1.5;
          fVar342 = auVar330._20_4_;
          auVar92._20_4_ = fVar342 * 1.5;
          fVar243 = auVar330._24_4_;
          auVar92._24_4_ = fVar243 * 1.5;
          auVar92._28_4_ = auVar389._28_4_;
          auVar93._4_4_ = fVar337 * fVar337 * fVar337 * auVar334._4_4_ * 0.5;
          auVar93._0_4_ = fVar294 * fVar294 * fVar294 * auVar334._0_4_ * 0.5;
          auVar93._8_4_ = fVar239 * fVar239 * fVar239 * auVar334._8_4_ * 0.5;
          auVar93._12_4_ = fVar340 * fVar340 * fVar340 * auVar334._12_4_ * 0.5;
          auVar93._16_4_ = fVar241 * fVar241 * fVar241 * auVar334._16_4_ * 0.5;
          auVar93._20_4_ = fVar342 * fVar342 * fVar342 * auVar334._20_4_ * 0.5;
          auVar93._24_4_ = fVar243 * fVar243 * fVar243 * auVar334._24_4_ * 0.5;
          auVar93._28_4_ = auVar334._28_4_;
          auVar28 = vsubps_avx(auVar92,auVar93);
          fVar294 = auVar28._0_4_;
          fVar337 = auVar28._4_4_;
          fVar239 = auVar28._8_4_;
          fVar340 = auVar28._12_4_;
          fVar241 = auVar28._16_4_;
          fVar342 = auVar28._20_4_;
          fVar243 = auVar28._24_4_;
          fVar260 = fVar150 * fVar200 * fVar260;
          fVar298 = fVar171 * fVar300 * fVar298;
          auVar94._4_4_ = fVar298;
          auVar94._0_4_ = fVar260;
          fVar377 = fVar173 * fVar170 * fVar377;
          auVar94._8_4_ = fVar377;
          fVar277 = fVar174 * fVar172 * fVar277;
          auVar94._12_4_ = fVar277;
          fVar279 = fVar175 * fVar268 * fVar279;
          auVar94._16_4_ = fVar279;
          fVar378 = fVar176 * fVar240 * fVar378;
          auVar94._20_4_ = fVar378;
          fVar380 = fVar177 * fVar242 * fVar380;
          auVar94._24_4_ = fVar380;
          auVar94._28_4_ = auVar330._28_4_;
          local_800._4_4_ = fVar298 + local_840._4_4_;
          local_800._0_4_ = fVar260 + (float)local_840._0_4_;
          uStack_7f8._0_4_ = fVar377 + local_840._8_4_;
          uStack_7f8._4_4_ = fVar277 + local_840._12_4_;
          uStack_7f0._0_4_ = fVar279 + local_840._16_4_;
          uStack_7f0._4_4_ = fVar378 + local_840._20_4_;
          uStack_7e8._0_4_ = fVar380 + local_840._24_4_;
          uStack_7e8._4_4_ = auVar330._28_4_ + local_840._28_4_;
          fVar260 = fVar150 * fVar200 * -fVar325;
          fVar298 = fVar171 * fVar300 * -fVar303;
          auVar95._4_4_ = fVar298;
          auVar95._0_4_ = fVar260;
          fVar377 = fVar173 * fVar170 * -fVar339;
          auVar95._8_4_ = fVar377;
          fVar277 = fVar174 * fVar172 * -fVar341;
          auVar95._12_4_ = fVar277;
          fVar279 = fVar175 * fVar268 * -fVar263;
          auVar95._16_4_ = fVar279;
          fVar378 = fVar176 * fVar240 * -fVar265;
          auVar95._20_4_ = fVar378;
          fVar380 = fVar177 * fVar242 * -fVar306;
          auVar95._24_4_ = fVar380;
          auVar95._28_4_ = -fVar179;
          local_6e0._4_4_ = auVar215._4_4_ + fVar298;
          local_6e0._0_4_ = auVar215._0_4_ + fVar260;
          fStack_6d8 = auVar215._8_4_ + fVar377;
          fStack_6d4 = auVar215._12_4_ + fVar277;
          uStack_6d0._0_4_ = auVar215._16_4_ + fVar279;
          uStack_6d0._4_4_ = auVar215._20_4_ + fVar378;
          uStack_6c8._0_4_ = auVar215._24_4_ + fVar380;
          uStack_6c8._4_4_ = auVar215._28_4_ + -fVar179;
          fVar260 = fVar200 * 0.0 * fVar150;
          fVar298 = fVar300 * 0.0 * fVar171;
          auVar96._4_4_ = fVar298;
          auVar96._0_4_ = fVar260;
          fVar377 = fVar170 * 0.0 * fVar173;
          auVar96._8_4_ = fVar377;
          fVar277 = fVar172 * 0.0 * fVar174;
          auVar96._12_4_ = fVar277;
          fVar279 = fVar268 * 0.0 * fVar175;
          auVar96._16_4_ = fVar279;
          fVar378 = fVar240 * 0.0 * fVar176;
          auVar96._20_4_ = fVar378;
          fVar380 = fVar242 * 0.0 * fVar177;
          auVar96._24_4_ = fVar380;
          auVar96._28_4_ = fVar179;
          auVar330 = vsubps_avx(local_840,auVar94);
          auVar409._0_4_ = fVar260 + auVar164._0_4_;
          auVar409._4_4_ = fVar298 + auVar164._4_4_;
          auVar409._8_4_ = fVar377 + auVar164._8_4_;
          auVar409._12_4_ = fVar277 + auVar164._12_4_;
          auVar409._16_4_ = fVar279 + auVar164._16_4_;
          auVar409._20_4_ = fVar378 + auVar164._20_4_;
          auVar409._24_4_ = fVar380 + auVar164._24_4_;
          auVar409._28_4_ = fVar179 + auVar164._28_4_;
          fVar260 = (float)local_5a0._0_4_ * fVar294 * fVar292;
          fVar292 = (float)local_5a0._4_4_ * fVar337 * fVar304;
          auVar97._4_4_ = fVar292;
          auVar97._0_4_ = fVar260;
          fVar298 = fStack_598 * fVar239 * fVar275;
          auVar97._8_4_ = fVar298;
          fVar304 = fStack_594 * fVar340 * fVar278;
          auVar97._12_4_ = fVar304;
          fVar377 = fStack_590 * fVar241 * fVar280;
          auVar97._16_4_ = fVar377;
          fVar275 = fStack_58c * fVar342 * fVar237;
          auVar97._20_4_ = fVar275;
          fVar277 = fStack_588 * fVar243 * fVar379;
          auVar97._24_4_ = fVar277;
          auVar97._28_4_ = fVar178;
          auVar185 = vsubps_avx(auVar215,auVar95);
          auVar398._0_4_ = auVar287._0_4_ + fVar260;
          auVar398._4_4_ = auVar287._4_4_ + fVar292;
          auVar398._8_4_ = auVar287._8_4_ + fVar298;
          auVar398._12_4_ = auVar287._12_4_ + fVar304;
          auVar398._16_4_ = auVar287._16_4_ + fVar377;
          auVar398._20_4_ = auVar287._20_4_ + fVar275;
          auVar398._24_4_ = auVar287._24_4_ + fVar277;
          auVar398._28_4_ = auVar287._28_4_ + fVar178;
          fVar260 = fVar294 * -fVar326 * (float)local_5a0._0_4_;
          fVar292 = fVar337 * -fVar319 * (float)local_5a0._4_4_;
          auVar98._4_4_ = fVar292;
          auVar98._0_4_ = fVar260;
          fVar298 = fVar239 * -fVar338 * fStack_598;
          auVar98._8_4_ = fVar298;
          fVar304 = fVar340 * -fVar321 * fStack_594;
          auVar98._12_4_ = fVar304;
          fVar377 = fVar241 * -fVar297 * fStack_590;
          auVar98._16_4_ = fVar377;
          fVar275 = fVar342 * -fVar323 * fStack_58c;
          auVar98._20_4_ = fVar275;
          fVar277 = fVar243 * -fVar343 * fStack_588;
          auVar98._24_4_ = fVar277;
          auVar98._28_4_ = local_840._28_4_;
          auVar186 = vsubps_avx(auVar164,auVar96);
          auVar259._0_4_ = auVar272._0_4_ + fVar260;
          auVar259._4_4_ = auVar272._4_4_ + fVar292;
          auVar259._8_4_ = auVar272._8_4_ + fVar298;
          auVar259._12_4_ = auVar272._12_4_ + fVar304;
          auVar259._16_4_ = auVar272._16_4_ + fVar377;
          auVar259._20_4_ = auVar272._20_4_ + fVar275;
          auVar259._24_4_ = auVar272._24_4_ + fVar277;
          auVar259._28_4_ = auVar272._28_4_ + local_840._28_4_;
          fVar260 = fVar294 * 0.0 * (float)local_5a0._0_4_;
          fVar292 = fVar337 * 0.0 * (float)local_5a0._4_4_;
          auVar99._4_4_ = fVar292;
          auVar99._0_4_ = fVar260;
          fVar298 = fVar239 * 0.0 * fStack_598;
          auVar99._8_4_ = fVar298;
          fVar304 = fVar340 * 0.0 * fStack_594;
          auVar99._12_4_ = fVar304;
          fVar377 = fVar241 * 0.0 * fStack_590;
          auVar99._16_4_ = fVar377;
          fVar275 = fVar342 * 0.0 * fStack_58c;
          auVar99._20_4_ = fVar275;
          fVar277 = fVar243 * 0.0 * fStack_588;
          auVar99._24_4_ = fVar277;
          auVar99._28_4_ = auVar164._28_4_;
          auVar29 = vsubps_avx(auVar287,auVar97);
          auVar351._0_4_ = (float)local_660._0_4_ + fVar260;
          auVar351._4_4_ = (float)local_660._4_4_ + fVar292;
          auVar351._8_4_ = fStack_658 + fVar298;
          auVar351._12_4_ = fStack_654 + fVar304;
          auVar351._16_4_ = fStack_650 + fVar377;
          auVar351._20_4_ = fStack_64c + fVar275;
          auVar351._24_4_ = fStack_648 + fVar277;
          auVar351._28_4_ = fStack_644 + auVar164._28_4_;
          auVar30 = vsubps_avx(auVar272,auVar98);
          auVar31 = vsubps_avx(_local_660,auVar99);
          auVar32 = vsubps_avx(auVar259,auVar185);
          auVar33 = vsubps_avx(auVar351,auVar186);
          auVar100._4_4_ = auVar186._4_4_ * auVar32._4_4_;
          auVar100._0_4_ = auVar186._0_4_ * auVar32._0_4_;
          auVar100._8_4_ = auVar186._8_4_ * auVar32._8_4_;
          auVar100._12_4_ = auVar186._12_4_ * auVar32._12_4_;
          auVar100._16_4_ = auVar186._16_4_ * auVar32._16_4_;
          auVar100._20_4_ = auVar186._20_4_ * auVar32._20_4_;
          auVar100._24_4_ = auVar186._24_4_ * auVar32._24_4_;
          auVar100._28_4_ = auVar389._28_4_;
          auVar101._4_4_ = auVar185._4_4_ * auVar33._4_4_;
          auVar101._0_4_ = auVar185._0_4_ * auVar33._0_4_;
          auVar101._8_4_ = auVar185._8_4_ * auVar33._8_4_;
          auVar101._12_4_ = auVar185._12_4_ * auVar33._12_4_;
          auVar101._16_4_ = auVar185._16_4_ * auVar33._16_4_;
          auVar101._20_4_ = auVar185._20_4_ * auVar33._20_4_;
          auVar101._24_4_ = auVar185._24_4_ * auVar33._24_4_;
          auVar101._28_4_ = fStack_644;
          auVar43 = vsubps_avx(auVar101,auVar100);
          auVar102._4_4_ = auVar330._4_4_ * auVar33._4_4_;
          auVar102._0_4_ = auVar330._0_4_ * auVar33._0_4_;
          auVar102._8_4_ = auVar330._8_4_ * auVar33._8_4_;
          auVar102._12_4_ = auVar330._12_4_ * auVar33._12_4_;
          auVar102._16_4_ = auVar330._16_4_ * auVar33._16_4_;
          auVar102._20_4_ = auVar330._20_4_ * auVar33._20_4_;
          auVar102._24_4_ = auVar330._24_4_ * auVar33._24_4_;
          auVar102._28_4_ = auVar33._28_4_;
          auVar33 = vsubps_avx(auVar398,auVar330);
          auVar103._4_4_ = auVar186._4_4_ * auVar33._4_4_;
          auVar103._0_4_ = auVar186._0_4_ * auVar33._0_4_;
          auVar103._8_4_ = auVar186._8_4_ * auVar33._8_4_;
          auVar103._12_4_ = auVar186._12_4_ * auVar33._12_4_;
          auVar103._16_4_ = auVar186._16_4_ * auVar33._16_4_;
          auVar103._20_4_ = auVar186._20_4_ * auVar33._20_4_;
          auVar103._24_4_ = auVar186._24_4_ * auVar33._24_4_;
          auVar103._28_4_ = auVar28._28_4_;
          auVar44 = vsubps_avx(auVar103,auVar102);
          auVar104._4_4_ = auVar185._4_4_ * auVar33._4_4_;
          auVar104._0_4_ = auVar185._0_4_ * auVar33._0_4_;
          auVar104._8_4_ = auVar185._8_4_ * auVar33._8_4_;
          auVar104._12_4_ = auVar185._12_4_ * auVar33._12_4_;
          auVar104._16_4_ = auVar185._16_4_ * auVar33._16_4_;
          auVar104._20_4_ = auVar185._20_4_ * auVar33._20_4_;
          auVar104._24_4_ = auVar185._24_4_ * auVar33._24_4_;
          auVar104._28_4_ = auVar28._28_4_;
          auVar105._4_4_ = auVar330._4_4_ * auVar32._4_4_;
          auVar105._0_4_ = auVar330._0_4_ * auVar32._0_4_;
          auVar105._8_4_ = auVar330._8_4_ * auVar32._8_4_;
          auVar105._12_4_ = auVar330._12_4_ * auVar32._12_4_;
          auVar105._16_4_ = auVar330._16_4_ * auVar32._16_4_;
          auVar105._20_4_ = auVar330._20_4_ * auVar32._20_4_;
          auVar105._24_4_ = auVar330._24_4_ * auVar32._24_4_;
          auVar105._28_4_ = auVar32._28_4_;
          auVar28 = vsubps_avx(auVar105,auVar104);
          auVar191._0_4_ = auVar43._0_4_ * 0.0 + auVar28._0_4_ + auVar44._0_4_ * 0.0;
          auVar191._4_4_ = auVar43._4_4_ * 0.0 + auVar28._4_4_ + auVar44._4_4_ * 0.0;
          auVar191._8_4_ = auVar43._8_4_ * 0.0 + auVar28._8_4_ + auVar44._8_4_ * 0.0;
          auVar191._12_4_ = auVar43._12_4_ * 0.0 + auVar28._12_4_ + auVar44._12_4_ * 0.0;
          auVar191._16_4_ = auVar43._16_4_ * 0.0 + auVar28._16_4_ + auVar44._16_4_ * 0.0;
          auVar191._20_4_ = auVar43._20_4_ * 0.0 + auVar28._20_4_ + auVar44._20_4_ * 0.0;
          auVar191._24_4_ = auVar43._24_4_ * 0.0 + auVar28._24_4_ + auVar44._24_4_ * 0.0;
          auVar191._28_4_ = auVar43._28_4_ + auVar28._28_4_ + auVar44._28_4_;
          auVar156 = vcmpps_avx(auVar191,ZEXT832(0) << 0x20,2);
          auVar28 = vblendvps_avx(auVar29,_local_800,auVar156);
          auVar29 = vblendvps_avx(auVar30,_local_6e0,auVar156);
          auVar30 = vblendvps_avx(auVar31,auVar409,auVar156);
          auVar31 = vblendvps_avx(auVar330,auVar398,auVar156);
          auVar32 = vblendvps_avx(auVar185,auVar259,auVar156);
          auVar33 = vblendvps_avx(auVar186,auVar351,auVar156);
          auVar43 = vblendvps_avx(auVar398,auVar330,auVar156);
          auVar44 = vblendvps_avx(auVar259,auVar185,auVar156);
          auVar155 = vblendvps_avx(auVar351,auVar186,auVar156);
          auVar330 = vandps_avx(local_640,_local_560);
          auVar43 = vsubps_avx(auVar43,auVar28);
          auVar187 = vsubps_avx(auVar44,auVar29);
          auVar155 = vsubps_avx(auVar155,auVar30);
          auVar211 = vsubps_avx(auVar29,auVar32);
          fVar260 = auVar187._0_4_;
          fVar302 = auVar30._0_4_;
          fVar278 = auVar187._4_4_;
          fVar305 = auVar30._4_4_;
          auVar106._4_4_ = fVar305 * fVar278;
          auVar106._0_4_ = fVar302 * fVar260;
          fVar326 = auVar187._8_4_;
          fVar307 = auVar30._8_4_;
          auVar106._8_4_ = fVar307 * fVar326;
          fVar340 = auVar187._12_4_;
          fVar318 = auVar30._12_4_;
          auVar106._12_4_ = fVar318 * fVar340;
          fVar200 = auVar187._16_4_;
          fVar320 = auVar30._16_4_;
          auVar106._16_4_ = fVar320 * fVar200;
          fVar325 = auVar187._20_4_;
          fVar322 = auVar30._20_4_;
          auVar106._20_4_ = fVar322 * fVar325;
          fVar179 = auVar187._24_4_;
          fVar324 = auVar30._24_4_;
          auVar106._24_4_ = fVar324 * fVar179;
          auVar106._28_4_ = auVar44._28_4_;
          fVar292 = auVar29._0_4_;
          fVar344 = auVar155._0_4_;
          fVar279 = auVar29._4_4_;
          fVar353 = auVar155._4_4_;
          auVar107._4_4_ = fVar353 * fVar279;
          auVar107._0_4_ = fVar344 * fVar292;
          fVar294 = auVar29._8_4_;
          fVar354 = auVar155._8_4_;
          auVar107._8_4_ = fVar354 * fVar294;
          fVar297 = auVar29._12_4_;
          fVar355 = auVar155._12_4_;
          auVar107._12_4_ = fVar355 * fVar297;
          fVar300 = auVar29._16_4_;
          fVar356 = auVar155._16_4_;
          auVar107._16_4_ = fVar356 * fVar300;
          fVar303 = auVar29._20_4_;
          fVar357 = auVar155._20_4_;
          auVar107._20_4_ = fVar357 * fVar303;
          fVar198 = auVar29._24_4_;
          fVar358 = auVar155._24_4_;
          uVar8 = auVar185._28_4_;
          auVar107._24_4_ = fVar358 * fVar198;
          auVar107._28_4_ = uVar8;
          auVar44 = vsubps_avx(auVar107,auVar106);
          fVar298 = auVar28._0_4_;
          fVar280 = auVar28._4_4_;
          auVar108._4_4_ = fVar353 * fVar280;
          auVar108._0_4_ = fVar344 * fVar298;
          fVar319 = auVar28._8_4_;
          auVar108._8_4_ = fVar354 * fVar319;
          fVar241 = auVar28._12_4_;
          auVar108._12_4_ = fVar355 * fVar241;
          fVar170 = auVar28._16_4_;
          auVar108._16_4_ = fVar356 * fVar170;
          fVar339 = auVar28._20_4_;
          auVar108._20_4_ = fVar357 * fVar339;
          fVar282 = auVar28._24_4_;
          auVar108._24_4_ = fVar358 * fVar282;
          auVar108._28_4_ = uVar8;
          fVar304 = auVar43._0_4_;
          fVar378 = auVar43._4_4_;
          auVar109._4_4_ = fVar305 * fVar378;
          auVar109._0_4_ = fVar302 * fVar304;
          fVar337 = auVar43._8_4_;
          auVar109._8_4_ = fVar307 * fVar337;
          fVar323 = auVar43._12_4_;
          auVar109._12_4_ = fVar318 * fVar323;
          fVar172 = auVar43._16_4_;
          auVar109._16_4_ = fVar320 * fVar172;
          fVar341 = auVar43._20_4_;
          auVar109._20_4_ = fVar322 * fVar341;
          fVar291 = auVar43._24_4_;
          auVar109._24_4_ = fVar324 * fVar291;
          auVar109._28_4_ = auVar398._28_4_;
          auVar185 = vsubps_avx(auVar109,auVar108);
          auVar110._4_4_ = fVar279 * fVar378;
          auVar110._0_4_ = fVar292 * fVar304;
          auVar110._8_4_ = fVar294 * fVar337;
          auVar110._12_4_ = fVar297 * fVar323;
          auVar110._16_4_ = fVar300 * fVar172;
          auVar110._20_4_ = fVar303 * fVar341;
          auVar110._24_4_ = fVar198 * fVar291;
          auVar110._28_4_ = uVar8;
          auVar111._4_4_ = fVar280 * fVar278;
          auVar111._0_4_ = fVar298 * fVar260;
          auVar111._8_4_ = fVar319 * fVar326;
          auVar111._12_4_ = fVar241 * fVar340;
          auVar111._16_4_ = fVar170 * fVar200;
          auVar111._20_4_ = fVar339 * fVar325;
          auVar111._24_4_ = fVar282 * fVar179;
          auVar111._28_4_ = auVar186._28_4_;
          auVar186 = vsubps_avx(auVar111,auVar110);
          auVar30 = vsubps_avx(auVar30,auVar33);
          fVar275 = auVar186._28_4_ + auVar185._28_4_;
          local_840._0_4_ = auVar186._0_4_ + auVar185._0_4_ * 0.0 + auVar44._0_4_ * 0.0;
          local_840._4_4_ = auVar186._4_4_ + auVar185._4_4_ * 0.0 + auVar44._4_4_ * 0.0;
          local_840._8_4_ = auVar186._8_4_ + auVar185._8_4_ * 0.0 + auVar44._8_4_ * 0.0;
          local_840._12_4_ = auVar186._12_4_ + auVar185._12_4_ * 0.0 + auVar44._12_4_ * 0.0;
          local_840._16_4_ = auVar186._16_4_ + auVar185._16_4_ * 0.0 + auVar44._16_4_ * 0.0;
          local_840._20_4_ = auVar186._20_4_ + auVar185._20_4_ * 0.0 + auVar44._20_4_ * 0.0;
          local_840._24_4_ = auVar186._24_4_ + auVar185._24_4_ * 0.0 + auVar44._24_4_ * 0.0;
          local_840._28_4_ = fVar275 + auVar44._28_4_;
          fVar377 = auVar211._0_4_;
          fVar237 = auVar211._4_4_;
          auVar112._4_4_ = auVar33._4_4_ * fVar237;
          auVar112._0_4_ = auVar33._0_4_ * fVar377;
          fVar338 = auVar211._8_4_;
          auVar112._8_4_ = auVar33._8_4_ * fVar338;
          fVar342 = auVar211._12_4_;
          auVar112._12_4_ = auVar33._12_4_ * fVar342;
          fVar268 = auVar211._16_4_;
          auVar112._16_4_ = auVar33._16_4_ * fVar268;
          fVar263 = auVar211._20_4_;
          auVar112._20_4_ = auVar33._20_4_ * fVar263;
          fVar293 = auVar211._24_4_;
          auVar112._24_4_ = auVar33._24_4_ * fVar293;
          auVar112._28_4_ = fVar275;
          fVar275 = auVar30._0_4_;
          fVar380 = auVar30._4_4_;
          auVar113._4_4_ = auVar32._4_4_ * fVar380;
          auVar113._0_4_ = auVar32._0_4_ * fVar275;
          fVar239 = auVar30._8_4_;
          auVar113._8_4_ = auVar32._8_4_ * fVar239;
          fVar343 = auVar30._12_4_;
          auVar113._12_4_ = auVar32._12_4_ * fVar343;
          fVar240 = auVar30._16_4_;
          auVar113._16_4_ = auVar32._16_4_ * fVar240;
          fVar265 = auVar30._20_4_;
          auVar113._20_4_ = auVar32._20_4_ * fVar265;
          fVar296 = auVar30._24_4_;
          auVar113._24_4_ = auVar32._24_4_ * fVar296;
          auVar113._28_4_ = auVar186._28_4_;
          auVar185 = vsubps_avx(auVar113,auVar112);
          auVar28 = vsubps_avx(auVar28,auVar31);
          auVar399 = ZEXT3264(auVar28);
          fVar277 = auVar28._0_4_;
          fVar379 = auVar28._4_4_;
          auVar114._4_4_ = auVar33._4_4_ * fVar379;
          auVar114._0_4_ = auVar33._0_4_ * fVar277;
          fVar321 = auVar28._8_4_;
          auVar114._8_4_ = auVar33._8_4_ * fVar321;
          fVar243 = auVar28._12_4_;
          auVar114._12_4_ = auVar33._12_4_ * fVar243;
          fVar242 = auVar28._16_4_;
          auVar114._16_4_ = auVar33._16_4_ * fVar242;
          fVar306 = auVar28._20_4_;
          auVar114._20_4_ = auVar33._20_4_ * fVar306;
          fVar299 = auVar28._24_4_;
          auVar114._24_4_ = auVar33._24_4_ * fVar299;
          auVar114._28_4_ = auVar33._28_4_;
          auVar115._4_4_ = fVar380 * auVar31._4_4_;
          auVar115._0_4_ = fVar275 * auVar31._0_4_;
          auVar115._8_4_ = fVar239 * auVar31._8_4_;
          auVar115._12_4_ = fVar343 * auVar31._12_4_;
          auVar115._16_4_ = fVar240 * auVar31._16_4_;
          auVar115._20_4_ = fVar265 * auVar31._20_4_;
          auVar115._24_4_ = fVar296 * auVar31._24_4_;
          auVar115._28_4_ = auVar44._28_4_;
          auVar28 = vsubps_avx(auVar114,auVar115);
          auVar116._4_4_ = auVar32._4_4_ * fVar379;
          auVar116._0_4_ = auVar32._0_4_ * fVar277;
          auVar116._8_4_ = auVar32._8_4_ * fVar321;
          auVar116._12_4_ = auVar32._12_4_ * fVar243;
          auVar116._16_4_ = auVar32._16_4_ * fVar242;
          auVar116._20_4_ = auVar32._20_4_ * fVar306;
          auVar116._24_4_ = auVar32._24_4_ * fVar299;
          auVar116._28_4_ = auVar32._28_4_;
          auVar117._4_4_ = fVar237 * auVar31._4_4_;
          auVar117._0_4_ = fVar377 * auVar31._0_4_;
          auVar117._8_4_ = fVar338 * auVar31._8_4_;
          auVar117._12_4_ = fVar342 * auVar31._12_4_;
          auVar117._16_4_ = fVar268 * auVar31._16_4_;
          auVar117._20_4_ = fVar263 * auVar31._20_4_;
          auVar117._24_4_ = fVar293 * auVar31._24_4_;
          auVar117._28_4_ = auVar31._28_4_;
          auVar31 = vsubps_avx(auVar117,auVar116);
          auVar165._0_4_ = auVar185._0_4_ * 0.0 + auVar31._0_4_ + auVar28._0_4_ * 0.0;
          auVar165._4_4_ = auVar185._4_4_ * 0.0 + auVar31._4_4_ + auVar28._4_4_ * 0.0;
          auVar165._8_4_ = auVar185._8_4_ * 0.0 + auVar31._8_4_ + auVar28._8_4_ * 0.0;
          auVar165._12_4_ = auVar185._12_4_ * 0.0 + auVar31._12_4_ + auVar28._12_4_ * 0.0;
          auVar165._16_4_ = auVar185._16_4_ * 0.0 + auVar31._16_4_ + auVar28._16_4_ * 0.0;
          auVar165._20_4_ = auVar185._20_4_ * 0.0 + auVar31._20_4_ + auVar28._20_4_ * 0.0;
          auVar165._24_4_ = auVar185._24_4_ * 0.0 + auVar31._24_4_ + auVar28._24_4_ * 0.0;
          auVar165._28_4_ = auVar28._28_4_ + auVar31._28_4_ + auVar28._28_4_;
          auVar28 = vmaxps_avx(local_840,auVar165);
          auVar28 = vcmpps_avx(auVar28,ZEXT432(0) << 0x20,2);
          auVar31 = auVar330 & auVar28;
          auVar125 = auVar29;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar31 >> 0x7f,0) == '\0') &&
                (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar31 >> 0xbf,0) == '\0') &&
              (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar31[0x1f]) {
LAB_00b192b0:
            auVar289 = ZEXT3264(auVar125);
            auVar234._8_8_ = uStack_5d8;
            auVar234._0_8_ = local_5e0;
            auVar234._16_8_ = uStack_5d0;
            auVar234._24_8_ = uStack_5c8;
            auVar391._4_4_ = fVar171;
            auVar391._0_4_ = fVar150;
            auVar391._8_4_ = fVar173;
            auVar391._12_4_ = fVar174;
            auVar391._16_4_ = fVar175;
            auVar391._20_4_ = fVar176;
            auVar391._24_4_ = fVar177;
            auVar391._28_4_ = fVar178;
          }
          else {
            auVar31 = vandps_avx(auVar28,auVar330);
            auVar118._4_4_ = fVar380 * fVar278;
            auVar118._0_4_ = fVar275 * fVar260;
            auVar118._8_4_ = fVar239 * fVar326;
            auVar118._12_4_ = fVar343 * fVar340;
            auVar118._16_4_ = fVar240 * fVar200;
            auVar118._20_4_ = fVar265 * fVar325;
            auVar118._24_4_ = fVar296 * fVar179;
            auVar118._28_4_ = auVar330._28_4_;
            auVar119._4_4_ = fVar237 * fVar353;
            auVar119._0_4_ = fVar377 * fVar344;
            auVar119._8_4_ = fVar338 * fVar354;
            auVar119._12_4_ = fVar342 * fVar355;
            auVar119._16_4_ = fVar268 * fVar356;
            auVar119._20_4_ = fVar263 * fVar357;
            auVar119._24_4_ = fVar293 * fVar358;
            auVar119._28_4_ = auVar28._28_4_;
            auVar28 = vsubps_avx(auVar119,auVar118);
            auVar120._4_4_ = fVar379 * fVar353;
            auVar120._0_4_ = fVar277 * fVar344;
            auVar120._8_4_ = fVar321 * fVar354;
            auVar120._12_4_ = fVar243 * fVar355;
            auVar120._16_4_ = fVar242 * fVar356;
            auVar120._20_4_ = fVar306 * fVar357;
            auVar120._24_4_ = fVar299 * fVar358;
            auVar120._28_4_ = auVar155._28_4_;
            auVar121._4_4_ = fVar380 * fVar378;
            auVar121._0_4_ = fVar275 * fVar304;
            auVar121._8_4_ = fVar239 * fVar337;
            auVar121._12_4_ = fVar343 * fVar323;
            auVar121._16_4_ = fVar240 * fVar172;
            auVar121._20_4_ = fVar265 * fVar341;
            auVar121._24_4_ = fVar296 * fVar291;
            auVar121._28_4_ = auVar30._28_4_;
            auVar32 = vsubps_avx(auVar121,auVar120);
            auVar122._4_4_ = fVar237 * fVar378;
            auVar122._0_4_ = fVar377 * fVar304;
            auVar122._8_4_ = fVar338 * fVar337;
            auVar122._12_4_ = fVar342 * fVar323;
            auVar122._16_4_ = fVar268 * fVar172;
            auVar122._20_4_ = fVar263 * fVar341;
            auVar122._24_4_ = fVar293 * fVar291;
            auVar122._28_4_ = auVar43._28_4_;
            auVar123._4_4_ = fVar379 * fVar278;
            auVar123._0_4_ = fVar277 * fVar260;
            auVar123._8_4_ = fVar321 * fVar326;
            auVar123._12_4_ = fVar243 * fVar340;
            auVar123._16_4_ = fVar242 * fVar200;
            auVar123._20_4_ = fVar306 * fVar325;
            auVar123._24_4_ = fVar299 * fVar179;
            auVar123._28_4_ = auVar187._28_4_;
            auVar33 = vsubps_avx(auVar123,auVar122);
            auVar335._0_4_ = auVar28._0_4_ * 0.0 + auVar33._0_4_ + auVar32._0_4_ * 0.0;
            auVar335._4_4_ = auVar28._4_4_ * 0.0 + auVar33._4_4_ + auVar32._4_4_ * 0.0;
            auVar335._8_4_ = auVar28._8_4_ * 0.0 + auVar33._8_4_ + auVar32._8_4_ * 0.0;
            auVar335._12_4_ = auVar28._12_4_ * 0.0 + auVar33._12_4_ + auVar32._12_4_ * 0.0;
            auVar335._16_4_ = auVar28._16_4_ * 0.0 + auVar33._16_4_ + auVar32._16_4_ * 0.0;
            auVar335._20_4_ = auVar28._20_4_ * 0.0 + auVar33._20_4_ + auVar32._20_4_ * 0.0;
            auVar335._24_4_ = auVar28._24_4_ * 0.0 + auVar33._24_4_ + auVar32._24_4_ * 0.0;
            auVar335._28_4_ = auVar211._28_4_ + auVar33._28_4_ + auVar43._28_4_;
            auVar330 = vrcpps_avx(auVar335);
            fVar260 = auVar330._0_4_;
            fVar304 = auVar330._4_4_;
            auVar124._4_4_ = auVar335._4_4_ * fVar304;
            auVar124._0_4_ = auVar335._0_4_ * fVar260;
            fVar377 = auVar330._8_4_;
            auVar124._8_4_ = auVar335._8_4_ * fVar377;
            fVar275 = auVar330._12_4_;
            auVar124._12_4_ = auVar335._12_4_ * fVar275;
            fVar277 = auVar330._16_4_;
            auVar124._16_4_ = auVar335._16_4_ * fVar277;
            fVar278 = auVar330._20_4_;
            auVar124._20_4_ = auVar335._20_4_ * fVar278;
            fVar378 = auVar330._24_4_;
            auVar124._24_4_ = auVar335._24_4_ * fVar378;
            auVar124._28_4_ = auVar30._28_4_;
            auVar390._8_4_ = 0x3f800000;
            auVar390._0_8_ = 0x3f8000003f800000;
            auVar390._12_4_ = 0x3f800000;
            auVar390._16_4_ = 0x3f800000;
            auVar390._20_4_ = 0x3f800000;
            auVar390._24_4_ = 0x3f800000;
            auVar390._28_4_ = 0x3f800000;
            auVar330 = vsubps_avx(auVar390,auVar124);
            fVar260 = auVar330._0_4_ * fVar260 + fVar260;
            fVar304 = auVar330._4_4_ * fVar304 + fVar304;
            fVar377 = auVar330._8_4_ * fVar377 + fVar377;
            fVar275 = auVar330._12_4_ * fVar275 + fVar275;
            fVar277 = auVar330._16_4_ * fVar277 + fVar277;
            fVar278 = auVar330._20_4_ * fVar278 + fVar278;
            fVar378 = auVar330._24_4_ * fVar378 + fVar378;
            fVar292 = auVar32._0_4_ * fVar292;
            fVar279 = auVar32._4_4_ * fVar279;
            auVar125._4_4_ = fVar279;
            auVar125._0_4_ = fVar292;
            fVar294 = auVar32._8_4_ * fVar294;
            auVar125._8_4_ = fVar294;
            fVar297 = auVar32._12_4_ * fVar297;
            auVar125._12_4_ = fVar297;
            fVar300 = auVar32._16_4_ * fVar300;
            auVar125._16_4_ = fVar300;
            fVar303 = auVar32._20_4_ * fVar303;
            auVar125._20_4_ = fVar303;
            fVar198 = auVar32._24_4_ * fVar198;
            auVar125._24_4_ = fVar198;
            auVar125._28_4_ = auVar29._28_4_;
            auVar126._4_4_ = (fVar280 * auVar28._4_4_ + fVar279 + fVar305 * auVar33._4_4_) * fVar304
            ;
            auVar126._0_4_ = (fVar298 * auVar28._0_4_ + fVar292 + fVar302 * auVar33._0_4_) * fVar260
            ;
            auVar126._8_4_ = (fVar319 * auVar28._8_4_ + fVar294 + fVar307 * auVar33._8_4_) * fVar377
            ;
            auVar126._12_4_ =
                 (fVar241 * auVar28._12_4_ + fVar297 + fVar318 * auVar33._12_4_) * fVar275;
            auVar126._16_4_ =
                 (fVar170 * auVar28._16_4_ + fVar300 + fVar320 * auVar33._16_4_) * fVar277;
            auVar126._20_4_ =
                 (fVar339 * auVar28._20_4_ + fVar303 + fVar322 * auVar33._20_4_) * fVar278;
            auVar126._24_4_ =
                 (fVar282 * auVar28._24_4_ + fVar198 + fVar324 * auVar33._24_4_) * fVar378;
            auVar126._28_4_ = auVar29._28_4_ + auVar33._28_4_;
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar233._4_4_ = uVar8;
            auVar233._0_4_ = uVar8;
            auVar233._8_4_ = uVar8;
            auVar233._12_4_ = uVar8;
            auVar233._16_4_ = uVar8;
            auVar233._20_4_ = uVar8;
            auVar233._24_4_ = uVar8;
            auVar233._28_4_ = uVar8;
            auVar28 = vcmpps_avx(local_140,auVar126,2);
            auVar330 = vcmpps_avx(auVar126,auVar233,2);
            auVar330 = vandps_avx(auVar28,auVar330);
            auVar29 = auVar31 & auVar330;
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar29 >> 0x7f,0) == '\0') &&
                  (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0xbf,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar29[0x1f]) goto LAB_00b192b0;
            auVar330 = vandps_avx(auVar31,auVar330);
            auVar289 = ZEXT3264(auVar330);
            auVar29 = vcmpps_avx(auVar335,ZEXT432(0) << 0x20,4);
            auVar30 = auVar330 & auVar29;
            auVar234._8_8_ = uStack_5d8;
            auVar234._0_8_ = local_5e0;
            auVar234._16_8_ = uStack_5d0;
            auVar234._24_8_ = uStack_5c8;
            auVar391._4_4_ = fVar171;
            auVar391._0_4_ = fVar150;
            auVar391._8_4_ = fVar173;
            auVar391._12_4_ = fVar174;
            auVar391._16_4_ = fVar175;
            auVar391._20_4_ = fVar176;
            auVar391._24_4_ = fVar177;
            auVar391._28_4_ = fVar178;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0x7f,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0xbf,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar30[0x1f] < '\0') {
              auVar234 = vandps_avx(auVar29,auVar330);
              auVar127._4_4_ = fVar304 * local_840._4_4_;
              auVar127._0_4_ = fVar260 * (float)local_840._0_4_;
              auVar127._8_4_ = fVar377 * local_840._8_4_;
              auVar127._12_4_ = fVar275 * local_840._12_4_;
              auVar127._16_4_ = fVar277 * local_840._16_4_;
              auVar127._20_4_ = fVar278 * local_840._20_4_;
              auVar127._24_4_ = fVar378 * local_840._24_4_;
              auVar127._28_4_ = auVar28._28_4_;
              auVar128._4_4_ = auVar165._4_4_ * fVar304;
              auVar128._0_4_ = auVar165._0_4_ * fVar260;
              auVar128._8_4_ = auVar165._8_4_ * fVar377;
              auVar128._12_4_ = auVar165._12_4_ * fVar275;
              auVar128._16_4_ = auVar165._16_4_ * fVar277;
              auVar128._20_4_ = auVar165._20_4_ * fVar278;
              auVar128._24_4_ = auVar165._24_4_ * fVar378;
              auVar128._28_4_ = auVar165._28_4_;
              auVar288._8_4_ = 0x3f800000;
              auVar288._0_8_ = 0x3f8000003f800000;
              auVar288._12_4_ = 0x3f800000;
              auVar288._16_4_ = 0x3f800000;
              auVar288._20_4_ = 0x3f800000;
              auVar288._24_4_ = 0x3f800000;
              auVar288._28_4_ = 0x3f800000;
              auVar289 = ZEXT3264(auVar288);
              auVar330 = vsubps_avx(auVar288,auVar127);
              local_5c0 = vblendvps_avx(auVar330,auVar127,auVar156);
              auVar330 = vsubps_avx(auVar288,auVar128);
              _local_4a0 = vblendvps_avx(auVar330,auVar128,auVar156);
              local_580 = auVar126;
            }
          }
          auVar352 = ZEXT3264(local_7e0);
          if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar234 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar234 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar234 >> 0x7f,0) != '\0') ||
                (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar234 >> 0xbf,0) != '\0') ||
              (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar234[0x1f] < '\0') {
            auVar330 = vsubps_avx(_local_5a0,auVar391);
            fVar292 = auVar391._0_4_ + auVar330._0_4_ * local_5c0._0_4_;
            fVar298 = auVar391._4_4_ + auVar330._4_4_ * local_5c0._4_4_;
            fVar304 = auVar391._8_4_ + auVar330._8_4_ * local_5c0._8_4_;
            fVar377 = auVar391._12_4_ + auVar330._12_4_ * local_5c0._12_4_;
            fVar275 = auVar391._16_4_ + auVar330._16_4_ * local_5c0._16_4_;
            fVar277 = auVar391._20_4_ + auVar330._20_4_ * local_5c0._20_4_;
            fVar278 = auVar391._24_4_ + auVar330._24_4_ * local_5c0._24_4_;
            fVar279 = auVar391._28_4_ + auVar330._28_4_;
            fVar260 = *(float *)((long)local_748->ray_space + k * 4 + -0x20);
            auVar129._4_4_ = (fVar298 + fVar298) * fVar260;
            auVar129._0_4_ = (fVar292 + fVar292) * fVar260;
            auVar129._8_4_ = (fVar304 + fVar304) * fVar260;
            auVar129._12_4_ = (fVar377 + fVar377) * fVar260;
            auVar129._16_4_ = (fVar275 + fVar275) * fVar260;
            auVar129._20_4_ = (fVar277 + fVar277) * fVar260;
            auVar129._24_4_ = (fVar278 + fVar278) * fVar260;
            auVar129._28_4_ = fVar279 + fVar279;
            auVar330 = vcmpps_avx(local_580,auVar129,6);
            auVar28 = auVar234 & auVar330;
            auVar314 = ZEXT3264(_local_820);
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              local_3e0 = (float)local_4a0._0_4_ + (float)local_4a0._0_4_ + -1.0;
              fStack_3dc = (float)local_4a0._4_4_ + (float)local_4a0._4_4_ + -1.0;
              fStack_3d8 = (float)uStack_498 + (float)uStack_498 + -1.0;
              fStack_3d4 = uStack_498._4_4_ + uStack_498._4_4_ + -1.0;
              fStack_3d0 = (float)uStack_490 + (float)uStack_490 + -1.0;
              fStack_3cc = uStack_490._4_4_ + uStack_490._4_4_ + -1.0;
              fStack_3c8 = (float)uStack_488 + (float)uStack_488 + -1.0;
              fStack_3c4 = uStack_488._4_4_ + uStack_488._4_4_ + -1.0;
              local_400 = local_5c0;
              local_4a0._4_4_ = fStack_3dc;
              local_4a0._0_4_ = local_3e0;
              uStack_498._0_4_ = fStack_3d8;
              uStack_498._4_4_ = fStack_3d4;
              uStack_490._0_4_ = fStack_3d0;
              uStack_490._4_4_ = fStack_3cc;
              auVar140 = _local_4a0;
              uStack_488._0_4_ = fStack_3c8;
              uStack_488._4_4_ = fStack_3c4;
              auVar28 = _local_4a0;
              local_3c0 = local_580;
              uStack_388 = uStack_928;
              uStack_378 = uStack_8a8;
              local_370 = local_8c0;
              uStack_368 = uStack_8b8;
              uStack_358 = uStack_898;
              pGVar22 = (context->scene->geometries).items[local_770].ptr;
              _local_4a0 = auVar28;
              if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_620 = vandps_avx(auVar330,auVar234);
                auVar204._0_4_ = (float)(int)local_3a0;
                auVar204._4_12_ = auVar185._4_12_;
                auVar252 = vshufps_avx(auVar204,auVar204,0);
                local_320[0] = (auVar252._0_4_ + local_5c0._0_4_ + 0.0) * (float)local_160._0_4_;
                local_320[1] = (auVar252._4_4_ + local_5c0._4_4_ + 1.0) * (float)local_160._4_4_;
                local_320[2] = (auVar252._8_4_ + local_5c0._8_4_ + 2.0) * fStack_158;
                local_320[3] = (auVar252._12_4_ + local_5c0._12_4_ + 3.0) * fStack_154;
                fStack_310 = (auVar252._0_4_ + local_5c0._16_4_ + 4.0) * fStack_150;
                fStack_30c = (auVar252._4_4_ + local_5c0._20_4_ + 5.0) * fStack_14c;
                fStack_308 = (auVar252._8_4_ + local_5c0._24_4_ + 6.0) * fStack_148;
                fStack_304 = auVar252._12_4_ + local_5c0._28_4_ + 7.0;
                uStack_490 = auVar140._16_8_;
                uStack_488 = auVar28._24_8_;
                local_300 = local_4a0;
                uStack_2f8 = uStack_498;
                uStack_2f0 = uStack_490;
                uStack_2e8 = uStack_488;
                local_2e0 = local_580;
                auVar192._8_4_ = 0x7f800000;
                auVar192._0_8_ = 0x7f8000007f800000;
                auVar192._12_4_ = 0x7f800000;
                auVar192._16_4_ = 0x7f800000;
                auVar192._20_4_ = 0x7f800000;
                auVar192._24_4_ = 0x7f800000;
                auVar192._28_4_ = 0x7f800000;
                auVar330 = vblendvps_avx(auVar192,local_580,local_620);
                auVar28 = vshufps_avx(auVar330,auVar330,0xb1);
                auVar28 = vminps_avx(auVar330,auVar28);
                auVar29 = vshufpd_avx(auVar28,auVar28,5);
                auVar28 = vminps_avx(auVar28,auVar29);
                auVar29 = vperm2f128_avx(auVar28,auVar28,1);
                auVar28 = vminps_avx(auVar28,auVar29);
                auVar28 = vcmpps_avx(auVar330,auVar28,0);
                auVar29 = local_620 & auVar28;
                auVar330 = local_620;
                if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar29 >> 0x7f,0) != '\0') ||
                      (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0xbf,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar29[0x1f] < '\0') {
                  auVar330 = vandps_avx(auVar28,local_620);
                }
                uVar147 = vmovmskps_avx(auVar330);
                uVar141 = 0;
                if (uVar147 != 0) {
                  for (; (uVar147 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
                  }
                }
                uVar144 = (ulong)uVar141;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar281 = local_320[uVar144];
                  uVar8 = *(undefined4 *)((long)&local_300 + uVar144 * 4);
                  fVar290 = 1.0 - fVar281;
                  fVar260 = fVar281 * fVar290 + fVar281 * fVar290;
                  auVar289 = ZEXT464(0x40400000);
                  auVar252 = ZEXT416((uint)(fVar281 * fVar281 * 3.0));
                  auVar252 = vshufps_avx(auVar252,auVar252,0);
                  auVar205 = ZEXT416((uint)((fVar260 - fVar281 * fVar281) * 3.0));
                  auVar205 = vshufps_avx(auVar205,auVar205,0);
                  auVar224 = ZEXT416((uint)((fVar290 * fVar290 - fVar260) * 3.0));
                  auVar224 = vshufps_avx(auVar224,auVar224,0);
                  auVar209 = ZEXT416((uint)(fVar290 * fVar290 * -3.0));
                  auVar209 = vshufps_avx(auVar209,auVar209,0);
                  auVar206._0_4_ =
                       auVar209._0_4_ * fVar246 +
                       auVar224._0_4_ * fVar381 +
                       auVar252._0_4_ * fVar400 + auVar205._0_4_ * fVar266;
                  auVar206._4_4_ =
                       auVar209._4_4_ * fVar261 +
                       auVar224._4_4_ * fVar392 +
                       auVar252._4_4_ * fVar405 + auVar205._4_4_ * fVar301;
                  auVar206._8_4_ =
                       auVar209._8_4_ * auVar248._8_4_ +
                       auVar224._8_4_ * auVar382._8_4_ +
                       auVar252._8_4_ * auVar401._8_4_ + auVar205._8_4_ * fVar199;
                  auVar206._12_4_ =
                       auVar209._12_4_ * auVar248._12_4_ +
                       auVar224._12_4_ * auVar382._12_4_ +
                       auVar252._12_4_ * auVar401._12_4_ + auVar205._12_4_ * fVar218;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar144 * 4);
                  *(float *)(ray + k * 4 + 0x180) = auVar206._0_4_;
                  uVar21 = vextractps_avx(auVar206,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar21;
                  uVar21 = vextractps_avx(auVar206,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar21;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar281;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar8;
                  *(int *)(ray + k * 4 + 0x220) = (int)local_690;
                  *(int *)(ray + k * 4 + 0x240) = (int)local_770;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_800 = auVar148;
                  stack0xfffffffffffff948 = auVar272._8_24_;
                  auVar252 = *local_758;
                  local_840._16_8_ = *(undefined8 *)(local_760 + 0x10);
                  local_840._24_8_ = *(undefined8 *)(local_760 + 0x18);
                  local_860._16_8_ = *(undefined8 *)(local_760 + 0x10);
                  local_860._0_16_ = *local_758;
                  local_860._24_8_ = *(undefined8 *)(local_760 + 0x18);
                  auVar197 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  auVar330 = vcmpps_avx(_local_820,_local_820,0xf);
                  auVar336 = ZEXT3264(auVar330);
                  _local_700 = auVar333;
                  local_39c = uVar20;
                  local_390 = auVar248._0_8_;
                  local_380 = auVar382._0_8_;
                  local_360 = auVar401._0_8_;
                  while( true ) {
                    local_220 = local_320[uVar144];
                    local_200 = *(undefined4 *)((long)&local_300 + uVar144 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar144 * 4);
                    fVar281 = 1.0 - local_220;
                    fVar245 = local_220 * fVar281 + local_220 * fVar281;
                    auVar289 = ZEXT464(0x40400000);
                    auVar205 = ZEXT416((uint)(local_220 * local_220 * 3.0));
                    auVar205 = vshufps_avx(auVar205,auVar205,0);
                    auVar224 = ZEXT416((uint)((fVar245 - local_220 * local_220) * 3.0));
                    auVar224 = vshufps_avx(auVar224,auVar224,0);
                    auVar209 = ZEXT416((uint)((fVar281 * fVar281 - fVar245) * 3.0));
                    auVar209 = vshufps_avx(auVar209,auVar209,0);
                    local_890.context = context->user;
                    auVar207 = ZEXT416((uint)(fVar281 * fVar281 * -3.0));
                    auVar207 = vshufps_avx(auVar207,auVar207,0);
                    auVar208._0_4_ =
                         auVar207._0_4_ * fVar246 +
                         auVar209._0_4_ * fVar381 +
                         auVar205._0_4_ * fVar400 + auVar224._0_4_ * fVar266;
                    auVar208._4_4_ =
                         auVar207._4_4_ * fVar261 +
                         auVar209._4_4_ * fVar392 +
                         auVar205._4_4_ * fVar405 + auVar224._4_4_ * fVar301;
                    auVar208._8_4_ =
                         auVar207._8_4_ * auVar248._8_4_ +
                         auVar209._8_4_ * auVar382._8_4_ +
                         auVar205._8_4_ * auVar401._8_4_ + auVar224._8_4_ * fVar199;
                    auVar208._12_4_ =
                         auVar207._12_4_ * auVar248._12_4_ +
                         auVar209._12_4_ * auVar382._12_4_ +
                         auVar205._12_4_ * auVar401._12_4_ + auVar224._12_4_ * fVar218;
                    auStack_270 = vshufps_avx(auVar208,auVar208,0);
                    local_280[0] = (RTCHitN)auStack_270[0];
                    local_280[1] = (RTCHitN)auStack_270[1];
                    local_280[2] = (RTCHitN)auStack_270[2];
                    local_280[3] = (RTCHitN)auStack_270[3];
                    local_280[4] = (RTCHitN)auStack_270[4];
                    local_280[5] = (RTCHitN)auStack_270[5];
                    local_280[6] = (RTCHitN)auStack_270[6];
                    local_280[7] = (RTCHitN)auStack_270[7];
                    local_280[8] = (RTCHitN)auStack_270[8];
                    local_280[9] = (RTCHitN)auStack_270[9];
                    local_280[10] = (RTCHitN)auStack_270[10];
                    local_280[0xb] = (RTCHitN)auStack_270[0xb];
                    local_280[0xc] = (RTCHitN)auStack_270[0xc];
                    local_280[0xd] = (RTCHitN)auStack_270[0xd];
                    local_280[0xe] = (RTCHitN)auStack_270[0xe];
                    local_280[0xf] = (RTCHitN)auStack_270[0xf];
                    auStack_250 = vshufps_avx(auVar208,auVar208,0x55);
                    local_260 = auStack_250;
                    auStack_230 = vshufps_avx(auVar208,auVar208,0xaa);
                    local_240 = auStack_230;
                    fStack_21c = local_220;
                    fStack_218 = local_220;
                    fStack_214 = local_220;
                    fStack_210 = local_220;
                    fStack_20c = local_220;
                    fStack_208 = local_220;
                    fStack_204 = local_220;
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = local_500._0_8_;
                    uStack_1d8 = local_500._8_8_;
                    uStack_1d0 = local_500._16_8_;
                    uStack_1c8 = local_500._24_8_;
                    local_1c0 = local_4e0._0_8_;
                    uStack_1b8 = local_4e0._8_8_;
                    uStack_1b0 = local_4e0._16_8_;
                    uStack_1a8 = local_4e0._24_8_;
                    local_750[1] = auVar336._0_32_;
                    *local_750 = auVar336._0_32_;
                    local_1a0 = (local_890.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_890.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_7a0 = local_860._0_8_;
                    uStack_798 = local_860._8_8_;
                    uStack_790 = local_860._16_8_;
                    uStack_788 = local_860._24_8_;
                    local_890.valid = (int *)&local_7a0;
                    local_890.geometryUserPtr = pGVar22->userPtr;
                    local_890.hit = local_280;
                    local_890.N = 8;
                    auVar153 = local_840._0_16_;
                    auVar183 = auVar252;
                    local_890.ray = (RTCRayN *)ray;
                    if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar289 = ZEXT1664(auVar289._0_16_);
                      auVar330 = ZEXT1632(auVar336._0_16_);
                      auVar399 = ZEXT1664(auVar399._0_16_);
                      (*pGVar22->intersectionFilterN)(&local_890);
                      auVar197 = ZEXT1664(auVar197._0_16_);
                      auVar330 = vcmpps_avx(auVar330,auVar330,0xf);
                      auVar336 = ZEXT3264(auVar330);
                      auVar183._8_8_ = uStack_798;
                      auVar183._0_8_ = local_7a0;
                      auVar153._8_8_ = uStack_788;
                      auVar153._0_8_ = uStack_790;
                    }
                    auVar205 = vpcmpeqd_avx(auVar183,ZEXT816(0) << 0x40);
                    auVar224 = vpcmpeqd_avx(auVar153,ZEXT816(0) << 0x40);
                    auVar216._16_16_ = auVar224;
                    auVar216._0_16_ = auVar205;
                    auVar330 = auVar336._0_32_ & ~auVar216;
                    if ((((((((auVar330 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar330 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar330 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar330 >> 0x7f,0) == '\0') &&
                          (auVar330 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar330 >> 0xbf,0) == '\0') &&
                        (auVar330 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar330[0x1f]) {
                      auVar166._0_4_ = auVar205._0_4_ ^ auVar336._0_4_;
                      auVar166._4_4_ = auVar205._4_4_ ^ auVar336._4_4_;
                      auVar166._8_4_ = auVar205._8_4_ ^ auVar336._8_4_;
                      auVar166._12_4_ = auVar205._12_4_ ^ auVar336._12_4_;
                      auVar166._16_4_ = auVar224._0_4_ ^ auVar336._16_4_;
                      auVar166._20_4_ = auVar224._4_4_ ^ auVar336._20_4_;
                      auVar166._24_4_ = auVar224._8_4_ ^ auVar336._24_4_;
                      auVar166._28_4_ = auVar224._12_4_ ^ auVar336._28_4_;
                    }
                    else {
                      p_Var26 = context->args->filter;
                      if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar289 = ZEXT1664(auVar289._0_16_);
                        auVar330 = ZEXT1632(auVar336._0_16_);
                        auVar399 = ZEXT1664(auVar399._0_16_);
                        (*p_Var26)(&local_890);
                        auVar197 = ZEXT1664(auVar197._0_16_);
                        auVar330 = vcmpps_avx(auVar330,auVar330,0xf);
                        auVar336 = ZEXT3264(auVar330);
                        auVar183._8_8_ = uStack_798;
                        auVar183._0_8_ = local_7a0;
                        auVar153._8_8_ = uStack_788;
                        auVar153._0_8_ = uStack_790;
                      }
                      auVar205 = vpcmpeqd_avx(auVar183,ZEXT816(0) << 0x40);
                      auVar224 = vpcmpeqd_avx(auVar153,ZEXT816(0) << 0x40);
                      auVar193._16_16_ = auVar224;
                      auVar193._0_16_ = auVar205;
                      auVar166._0_4_ = auVar205._0_4_ ^ auVar336._0_4_;
                      auVar166._4_4_ = auVar205._4_4_ ^ auVar336._4_4_;
                      auVar166._8_4_ = auVar205._8_4_ ^ auVar336._8_4_;
                      auVar166._12_4_ = auVar205._12_4_ ^ auVar336._12_4_;
                      auVar166._16_4_ = auVar224._0_4_ ^ auVar336._16_4_;
                      auVar166._20_4_ = auVar224._4_4_ ^ auVar336._20_4_;
                      auVar166._24_4_ = auVar224._8_4_ ^ auVar336._24_4_;
                      auVar166._28_4_ = auVar224._12_4_ ^ auVar336._28_4_;
                      auVar330 = auVar336._0_32_ & ~auVar193;
                      if ((((((((auVar330 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar330 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar330 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar330 >> 0x7f,0) != '\0') ||
                            (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar330 >> 0xbf,0) != '\0') ||
                          (auVar330 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar330[0x1f] < '\0') {
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])local_890.hit);
                        *(undefined1 (*) [32])(local_890.ray + 0x180) = auVar330;
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                            (local_890.hit + 0x20));
                        *(undefined1 (*) [32])(local_890.ray + 0x1a0) = auVar330;
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                            (local_890.hit + 0x40));
                        *(undefined1 (*) [32])(local_890.ray + 0x1c0) = auVar330;
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                            (local_890.hit + 0x60));
                        *(undefined1 (*) [32])(local_890.ray + 0x1e0) = auVar330;
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                            (local_890.hit + 0x80));
                        *(undefined1 (*) [32])(local_890.ray + 0x200) = auVar330;
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                            (local_890.hit + 0xa0));
                        *(undefined1 (*) [32])(local_890.ray + 0x220) = auVar330;
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                            (local_890.hit + 0xc0));
                        *(undefined1 (*) [32])(local_890.ray + 0x240) = auVar330;
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                            (local_890.hit + 0xe0));
                        *(undefined1 (*) [32])(local_890.ray + 0x260) = auVar330;
                        auVar330 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                            (local_890.hit + 0x100));
                        *(undefined1 (*) [32])(local_890.ray + 0x280) = auVar330;
                      }
                    }
                    auVar330 = local_580;
                    if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar166 >> 0x7f,0) == '\0') &&
                          (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar166 >> 0xbf,0) == '\0') &&
                        (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar166[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar197._0_4_;
                    }
                    else {
                      auVar197 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_620 + uVar144 * 4) = 0;
                    auVar205 = vshufps_avx(auVar197._0_16_,auVar197._0_16_,0);
                    auVar167._16_16_ = auVar205;
                    auVar167._0_16_ = auVar205;
                    auVar333 = vcmpps_avx(auVar330,auVar167,2);
                    auVar28 = vandps_avx(auVar333,local_620);
                    local_620 = local_620 & auVar333;
                    if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_620 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_620 >> 0x7f,0) == '\0') &&
                          (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_620 >> 0xbf,0) == '\0') &&
                        (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_620[0x1f]) break;
                    auVar194._8_4_ = 0x7f800000;
                    auVar194._0_8_ = 0x7f8000007f800000;
                    auVar194._12_4_ = 0x7f800000;
                    auVar194._16_4_ = 0x7f800000;
                    auVar194._20_4_ = 0x7f800000;
                    auVar194._24_4_ = 0x7f800000;
                    auVar194._28_4_ = 0x7f800000;
                    auVar330 = vblendvps_avx(auVar194,auVar330,auVar28);
                    auVar333 = vshufps_avx(auVar330,auVar330,0xb1);
                    auVar333 = vminps_avx(auVar330,auVar333);
                    auVar29 = vshufpd_avx(auVar333,auVar333,5);
                    auVar333 = vminps_avx(auVar333,auVar29);
                    auVar29 = vperm2f128_avx(auVar333,auVar333,1);
                    auVar333 = vminps_avx(auVar333,auVar29);
                    auVar333 = vcmpps_avx(auVar330,auVar333,0);
                    auVar29 = auVar28 & auVar333;
                    auVar330 = auVar28;
                    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar29 >> 0x7f,0) != '\0') ||
                          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar29 >> 0xbf,0) != '\0') ||
                        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar29[0x1f] < '\0') {
                      auVar330 = vandps_avx(auVar333,auVar28);
                    }
                    uVar147 = vmovmskps_avx(auVar330);
                    uVar141 = 0;
                    if (uVar147 != 0) {
                      for (; (uVar147 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
                      }
                    }
                    uVar144 = (ulong)uVar141;
                    local_620 = auVar28;
                  }
                  auVar314 = ZEXT3264(_local_820);
                  auVar352 = ZEXT3264(local_7e0);
                  auVar148 = local_800;
                  fVar245 = (float)local_7c0._0_4_;
                  fVar262 = (float)local_7c0._4_4_;
                  fVar244 = fStack_7b8;
                  fVar267 = fStack_7b4;
                  fVar219 = fStack_7b0;
                  fVar269 = fStack_7ac;
                  fVar276 = fStack_7a8;
                }
              }
              auVar274 = ZEXT3264(auVar227);
              auVar197 = ZEXT3264(local_5c0);
              fVar359 = (float)local_740._0_4_;
              fVar369 = (float)local_740._4_4_;
              fVar370 = fStack_738;
              fVar371 = fStack_734;
              fVar281 = fStack_730;
              fVar290 = fStack_72c;
              fVar264 = fStack_728;
              fVar295 = fStack_724;
              goto LAB_00b18fc8;
            }
          }
          auVar314 = ZEXT3264(_local_820);
          auVar197 = ZEXT3264(local_5c0);
          auVar274 = ZEXT3264(auVar227);
        }
LAB_00b18fc8:
        auVar336 = ZEXT3264(auVar161);
      }
    }
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar162._4_4_ = uVar8;
    auVar162._0_4_ = uVar8;
    auVar162._8_4_ = uVar8;
    auVar162._12_4_ = uVar8;
    auVar162._16_4_ = uVar8;
    auVar162._20_4_ = uVar8;
    auVar162._24_4_ = uVar8;
    auVar162._28_4_ = uVar8;
    auVar161 = vcmpps_avx(local_80,auVar162,2);
    uVar147 = vmovmskps_avx(auVar161);
    uVar147 = (uint)local_5e8 & (uint)local_5e8 + 0xff & uVar147;
    prim = (Primitive *)local_6c0._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }